

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx::CurveNiIntersector1<8>::
     occluded_t<embree::avx::RibbonCurve1Intersector1<embree::CatmullRomCurveT,8>,embree::avx::Occluded1EpilogMU<8,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  undefined1 (*pauVar1) [12];
  undefined1 (*pauVar2) [32];
  undefined1 (*pauVar3) [28];
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  Primitive PVar17;
  Geometry *pGVar18;
  RTCFilterFunctionN p_Var19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [16];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [16];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [28];
  undefined1 auVar120 [28];
  undefined1 auVar121 [28];
  undefined1 auVar122 [28];
  uint uVar123;
  ulong uVar124;
  RTCIntersectArguments *pRVar125;
  ulong uVar126;
  long lVar127;
  Geometry *geometry;
  long lVar128;
  ulong uVar129;
  undefined4 uVar130;
  undefined8 unaff_R12;
  long lVar131;
  ulong uVar132;
  float fVar133;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  float fVar153;
  float fVar154;
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  float fVar152;
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  float fVar155;
  float fVar170;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  float fVar172;
  float fVar173;
  undefined1 auVar160 [32];
  float fVar174;
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  float fVar169;
  float fVar171;
  undefined1 auVar168 [64];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  float fVar175;
  float fVar176;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  float fVar189;
  float fVar191;
  float fVar195;
  float fVar197;
  float fVar198;
  undefined1 auVar182 [32];
  float fVar193;
  undefined1 auVar183 [32];
  undefined1 auVar196 [16];
  undefined1 auVar184 [32];
  float fVar190;
  float fVar192;
  float fVar194;
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  float fVar210;
  undefined1 auVar208 [32];
  undefined1 auVar209 [64];
  undefined1 auVar213 [16];
  float fVar211;
  float fVar212;
  float fVar220;
  float fVar222;
  float fVar226;
  float fVar228;
  float fVar229;
  undefined1 auVar214 [32];
  float fVar224;
  undefined1 auVar215 [32];
  float fVar221;
  float fVar223;
  float fVar225;
  float fVar227;
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  float fVar230;
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  float fVar231;
  float fVar240;
  float fVar241;
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  float fVar243;
  float fVar244;
  float fVar245;
  undefined1 auVar235 [32];
  float fVar242;
  undefined1 auVar236 [32];
  float fVar246;
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  float fVar247;
  float fVar248;
  float fVar249;
  float fVar261;
  undefined1 auVar250 [16];
  float fVar255;
  float fVar258;
  float fVar264;
  float fVar266;
  float fVar268;
  undefined1 auVar251 [32];
  float fVar256;
  float fVar259;
  float fVar262;
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  float fVar257;
  float fVar260;
  float fVar263;
  float fVar265;
  float fVar267;
  float fVar269;
  undefined1 auVar254 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [64];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  float fVar285;
  float fVar286;
  float fVar287;
  float fVar288;
  float fVar289;
  float fVar290;
  float fVar291;
  undefined1 auVar284 [64];
  undefined1 auVar292 [16];
  float fVar301;
  float fVar302;
  float fVar303;
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  float fVar304;
  undefined1 auVar296 [32];
  float fVar300;
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [64];
  float fVar305;
  float fVar312;
  float fVar313;
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar311 [64];
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  undefined1 auVar316 [64];
  float fVar317;
  float fVar323;
  float fVar324;
  float fVar325;
  float in_register_0000151c;
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  float fVar326;
  undefined1 auVar327 [16];
  undefined1 auVar328 [32];
  float fVar332;
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  undefined1 auVar331 [64];
  undefined1 auVar335 [16];
  float fVar333;
  float fVar334;
  float fVar338;
  float fVar340;
  float in_register_0000159c;
  undefined1 auVar336 [32];
  float fVar339;
  float fVar341;
  float fVar342;
  float fVar343;
  undefined1 auVar337 [32];
  float fVar344;
  float fVar347;
  float fVar348;
  float fVar349;
  float in_register_000015dc;
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  undefined1 auVar350 [16];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_8> bhit;
  int local_7b4;
  long local_7b0;
  Primitive *local_7a8;
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [8];
  undefined8 uStack_778;
  undefined1 local_770 [8];
  undefined8 uStack_768;
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  ulong local_730;
  Precalculations *local_728;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  undefined1 local_6c0 [32];
  RTCFilterFunctionNArguments local_690;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [8];
  undefined8 uStack_5d8;
  float local_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined8 local_5c0;
  undefined4 local_5b8;
  float local_5b4;
  uint local_5b0;
  undefined4 local_5ac;
  undefined4 local_5a8;
  uint local_5a4;
  uint local_5a0;
  ulong local_588;
  undefined1 local_580 [32];
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  undefined1 local_520 [32];
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  float local_480;
  float fStack_47c;
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined1 local_3a0 [8];
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined1 local_380 [8];
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [32];
  uint local_260;
  uint local_25c;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined1 local_200 [32];
  float local_1e0 [4];
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  float local_140;
  float fStack_13c;
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  undefined1 local_80 [32];
  undefined1 auVar159 [24];
  
  local_728 = pre;
  PVar17 = prim[1];
  uVar124 = (ulong)(byte)PVar17;
  auVar350 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                        *(undefined1 (*) [16])(prim + uVar124 * 0x19 + 6));
  fVar175 = *(float *)(prim + uVar124 * 0x19 + 0x12);
  auVar156._0_4_ = fVar175 * auVar350._0_4_;
  auVar156._4_4_ = fVar175 * auVar350._4_4_;
  auVar156._8_4_ = fVar175 * auVar350._8_4_;
  auVar156._12_4_ = fVar175 * auVar350._12_4_;
  auVar232._0_4_ = fVar175 * (ray->dir).field_0.m128[0];
  auVar232._4_4_ = fVar175 * (ray->dir).field_0.m128[1];
  auVar232._8_4_ = fVar175 * (ray->dir).field_0.m128[2];
  auVar232._12_4_ = fVar175 * (ray->dir).field_0.m128[3];
  auVar350 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 * 4 + 6)));
  auVar201 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 * 4 + 10)));
  auVar136._16_16_ = auVar201;
  auVar136._0_16_ = auVar350;
  auVar350 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 * 5 + 6)));
  auVar136 = vcvtdq2ps_avx(auVar136);
  auVar201 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 * 5 + 10)));
  auVar182._16_16_ = auVar201;
  auVar182._0_16_ = auVar350;
  auVar280 = vcvtdq2ps_avx(auVar182);
  auVar350 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 * 6 + 6)));
  auVar201 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 * 6 + 10)));
  auVar204._16_16_ = auVar201;
  auVar204._0_16_ = auVar350;
  auVar350 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 * 0xb + 6)));
  auVar201 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 * 0xb + 10)));
  auVar294 = vcvtdq2ps_avx(auVar204);
  auVar205._16_16_ = auVar201;
  auVar205._0_16_ = auVar350;
  auVar21 = vcvtdq2ps_avx(auVar205);
  auVar350 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 * 0xc + 6)));
  auVar201 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 * 0xc + 10)));
  auVar251._16_16_ = auVar201;
  auVar251._0_16_ = auVar350;
  auVar350 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 * 0xd + 6)));
  auVar22 = vcvtdq2ps_avx(auVar251);
  auVar201 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 * 0xd + 10)));
  auVar270._16_16_ = auVar201;
  auVar270._0_16_ = auVar350;
  auVar23 = vcvtdq2ps_avx(auVar270);
  auVar350 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 * 0x12 + 6)));
  auVar201 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 * 0x12 + 10)));
  auVar271._16_16_ = auVar201;
  auVar271._0_16_ = auVar350;
  auVar350 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 * 0x13 + 6)));
  auVar201 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 * 0x13 + 10)));
  auVar24 = vcvtdq2ps_avx(auVar271);
  auVar293._16_16_ = auVar201;
  auVar293._0_16_ = auVar350;
  auVar25 = vcvtdq2ps_avx(auVar293);
  auVar350 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 * 0x14 + 6)));
  auVar201 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 * 0x14 + 10)));
  auVar306._16_16_ = auVar201;
  auVar306._0_16_ = auVar350;
  auVar26 = vcvtdq2ps_avx(auVar306);
  auVar350 = vshufps_avx(auVar232,auVar232,0);
  auVar201 = vshufps_avx(auVar232,auVar232,0x55);
  auVar196 = vshufps_avx(auVar232,auVar232,0xaa);
  fVar175 = auVar196._0_4_;
  fVar189 = auVar196._4_4_;
  fVar191 = auVar196._8_4_;
  fVar193 = auVar196._12_4_;
  fVar195 = auVar201._0_4_;
  fVar197 = auVar201._4_4_;
  fVar198 = auVar201._8_4_;
  fVar231 = auVar201._12_4_;
  fVar240 = auVar350._0_4_;
  fVar241 = auVar350._4_4_;
  fVar242 = auVar350._8_4_;
  fVar243 = auVar350._12_4_;
  auVar318._0_4_ = fVar240 * auVar136._0_4_ + fVar195 * auVar280._0_4_ + fVar175 * auVar294._0_4_;
  auVar318._4_4_ = fVar241 * auVar136._4_4_ + fVar197 * auVar280._4_4_ + fVar189 * auVar294._4_4_;
  auVar318._8_4_ = fVar242 * auVar136._8_4_ + fVar198 * auVar280._8_4_ + fVar191 * auVar294._8_4_;
  auVar318._12_4_ =
       fVar243 * auVar136._12_4_ + fVar231 * auVar280._12_4_ + fVar193 * auVar294._12_4_;
  auVar318._16_4_ =
       fVar240 * auVar136._16_4_ + fVar195 * auVar280._16_4_ + fVar175 * auVar294._16_4_;
  auVar318._20_4_ =
       fVar241 * auVar136._20_4_ + fVar197 * auVar280._20_4_ + fVar189 * auVar294._20_4_;
  auVar318._24_4_ =
       fVar242 * auVar136._24_4_ + fVar198 * auVar280._24_4_ + fVar191 * auVar294._24_4_;
  auVar318._28_4_ = fVar231 + in_register_000015dc + in_register_0000151c;
  auVar314._0_4_ = fVar240 * auVar21._0_4_ + fVar195 * auVar22._0_4_ + auVar23._0_4_ * fVar175;
  auVar314._4_4_ = fVar241 * auVar21._4_4_ + fVar197 * auVar22._4_4_ + auVar23._4_4_ * fVar189;
  auVar314._8_4_ = fVar242 * auVar21._8_4_ + fVar198 * auVar22._8_4_ + auVar23._8_4_ * fVar191;
  auVar314._12_4_ = fVar243 * auVar21._12_4_ + fVar231 * auVar22._12_4_ + auVar23._12_4_ * fVar193;
  auVar314._16_4_ = fVar240 * auVar21._16_4_ + fVar195 * auVar22._16_4_ + auVar23._16_4_ * fVar175;
  auVar314._20_4_ = fVar241 * auVar21._20_4_ + fVar197 * auVar22._20_4_ + auVar23._20_4_ * fVar189;
  auVar314._24_4_ = fVar242 * auVar21._24_4_ + fVar198 * auVar22._24_4_ + auVar23._24_4_ * fVar191;
  auVar314._28_4_ = fVar231 + in_register_000015dc + in_register_0000159c;
  auVar235._0_4_ = fVar240 * auVar24._0_4_ + fVar195 * auVar25._0_4_ + auVar26._0_4_ * fVar175;
  auVar235._4_4_ = fVar241 * auVar24._4_4_ + fVar197 * auVar25._4_4_ + auVar26._4_4_ * fVar189;
  auVar235._8_4_ = fVar242 * auVar24._8_4_ + fVar198 * auVar25._8_4_ + auVar26._8_4_ * fVar191;
  auVar235._12_4_ = fVar243 * auVar24._12_4_ + fVar231 * auVar25._12_4_ + auVar26._12_4_ * fVar193;
  auVar235._16_4_ = fVar240 * auVar24._16_4_ + fVar195 * auVar25._16_4_ + auVar26._16_4_ * fVar175;
  auVar235._20_4_ = fVar241 * auVar24._20_4_ + fVar197 * auVar25._20_4_ + auVar26._20_4_ * fVar189;
  auVar235._24_4_ = fVar242 * auVar24._24_4_ + fVar198 * auVar25._24_4_ + auVar26._24_4_ * fVar191;
  auVar235._28_4_ = fVar243 + fVar231 + fVar193;
  auVar350 = vshufps_avx(auVar156,auVar156,0);
  auVar201 = vshufps_avx(auVar156,auVar156,0x55);
  auVar196 = vshufps_avx(auVar156,auVar156,0xaa);
  fVar189 = auVar196._0_4_;
  fVar191 = auVar196._4_4_;
  fVar193 = auVar196._8_4_;
  fVar195 = auVar196._12_4_;
  fVar241 = auVar201._0_4_;
  fVar242 = auVar201._4_4_;
  fVar243 = auVar201._8_4_;
  fVar244 = auVar201._12_4_;
  fVar197 = auVar350._0_4_;
  fVar198 = auVar350._4_4_;
  fVar231 = auVar350._8_4_;
  fVar240 = auVar350._12_4_;
  fVar175 = auVar136._28_4_;
  auVar160._0_4_ = fVar197 * auVar136._0_4_ + fVar241 * auVar280._0_4_ + fVar189 * auVar294._0_4_;
  auVar160._4_4_ = fVar198 * auVar136._4_4_ + fVar242 * auVar280._4_4_ + fVar191 * auVar294._4_4_;
  auVar160._8_4_ = fVar231 * auVar136._8_4_ + fVar243 * auVar280._8_4_ + fVar193 * auVar294._8_4_;
  auVar160._12_4_ =
       fVar240 * auVar136._12_4_ + fVar244 * auVar280._12_4_ + fVar195 * auVar294._12_4_;
  auVar160._16_4_ =
       fVar197 * auVar136._16_4_ + fVar241 * auVar280._16_4_ + fVar189 * auVar294._16_4_;
  auVar160._20_4_ =
       fVar198 * auVar136._20_4_ + fVar242 * auVar280._20_4_ + fVar191 * auVar294._20_4_;
  auVar160._24_4_ =
       fVar231 * auVar136._24_4_ + fVar243 * auVar280._24_4_ + fVar193 * auVar294._24_4_;
  auVar160._28_4_ = fVar175 + auVar280._28_4_ + auVar294._28_4_;
  auVar214._0_4_ = fVar197 * auVar21._0_4_ + auVar23._0_4_ * fVar189 + fVar241 * auVar22._0_4_;
  auVar214._4_4_ = fVar198 * auVar21._4_4_ + auVar23._4_4_ * fVar191 + fVar242 * auVar22._4_4_;
  auVar214._8_4_ = fVar231 * auVar21._8_4_ + auVar23._8_4_ * fVar193 + fVar243 * auVar22._8_4_;
  auVar214._12_4_ = fVar240 * auVar21._12_4_ + auVar23._12_4_ * fVar195 + fVar244 * auVar22._12_4_;
  auVar214._16_4_ = fVar197 * auVar21._16_4_ + auVar23._16_4_ * fVar189 + fVar241 * auVar22._16_4_;
  auVar214._20_4_ = fVar198 * auVar21._20_4_ + auVar23._20_4_ * fVar191 + fVar242 * auVar22._20_4_;
  auVar214._24_4_ = fVar231 * auVar21._24_4_ + auVar23._24_4_ * fVar193 + fVar243 * auVar22._24_4_;
  auVar214._28_4_ = fVar175 + auVar23._28_4_ + auVar294._28_4_;
  auVar206._0_4_ = fVar197 * auVar24._0_4_ + fVar241 * auVar25._0_4_ + auVar26._0_4_ * fVar189;
  auVar206._4_4_ = fVar198 * auVar24._4_4_ + fVar242 * auVar25._4_4_ + auVar26._4_4_ * fVar191;
  auVar206._8_4_ = fVar231 * auVar24._8_4_ + fVar243 * auVar25._8_4_ + auVar26._8_4_ * fVar193;
  auVar206._12_4_ = fVar240 * auVar24._12_4_ + fVar244 * auVar25._12_4_ + auVar26._12_4_ * fVar195;
  auVar206._16_4_ = fVar197 * auVar24._16_4_ + fVar241 * auVar25._16_4_ + auVar26._16_4_ * fVar189;
  auVar206._20_4_ = fVar198 * auVar24._20_4_ + fVar242 * auVar25._20_4_ + auVar26._20_4_ * fVar191;
  auVar206._24_4_ = fVar231 * auVar24._24_4_ + fVar243 * auVar25._24_4_ + auVar26._24_4_ * fVar193;
  auVar206._28_4_ = fVar175 + auVar22._28_4_ + fVar195;
  auVar272._8_4_ = 0x7fffffff;
  auVar272._0_8_ = 0x7fffffff7fffffff;
  auVar272._12_4_ = 0x7fffffff;
  auVar272._16_4_ = 0x7fffffff;
  auVar272._20_4_ = 0x7fffffff;
  auVar272._24_4_ = 0x7fffffff;
  auVar272._28_4_ = 0x7fffffff;
  auVar137._8_4_ = 0x219392ef;
  auVar137._0_8_ = 0x219392ef219392ef;
  auVar137._12_4_ = 0x219392ef;
  auVar137._16_4_ = 0x219392ef;
  auVar137._20_4_ = 0x219392ef;
  auVar137._24_4_ = 0x219392ef;
  auVar137._28_4_ = 0x219392ef;
  auVar136 = vandps_avx(auVar318,auVar272);
  auVar136 = vcmpps_avx(auVar136,auVar137,1);
  auVar280 = vblendvps_avx(auVar318,auVar137,auVar136);
  auVar136 = vandps_avx(auVar314,auVar272);
  auVar136 = vcmpps_avx(auVar136,auVar137,1);
  auVar294 = vblendvps_avx(auVar314,auVar137,auVar136);
  auVar136 = vandps_avx(auVar235,auVar272);
  auVar136 = vcmpps_avx(auVar136,auVar137,1);
  auVar136 = vblendvps_avx(auVar235,auVar137,auVar136);
  auVar21 = vrcpps_avx(auVar280);
  fVar175 = auVar21._0_4_;
  fVar189 = auVar21._4_4_;
  auVar22._4_4_ = auVar280._4_4_ * fVar189;
  auVar22._0_4_ = auVar280._0_4_ * fVar175;
  fVar191 = auVar21._8_4_;
  auVar22._8_4_ = auVar280._8_4_ * fVar191;
  fVar193 = auVar21._12_4_;
  auVar22._12_4_ = auVar280._12_4_ * fVar193;
  fVar195 = auVar21._16_4_;
  auVar22._16_4_ = auVar280._16_4_ * fVar195;
  fVar197 = auVar21._20_4_;
  auVar22._20_4_ = auVar280._20_4_ * fVar197;
  fVar198 = auVar21._24_4_;
  auVar22._24_4_ = auVar280._24_4_ * fVar198;
  auVar22._28_4_ = auVar280._28_4_;
  auVar273._8_4_ = 0x3f800000;
  auVar273._0_8_ = 0x3f8000003f800000;
  auVar273._12_4_ = 0x3f800000;
  auVar273._16_4_ = 0x3f800000;
  auVar273._20_4_ = 0x3f800000;
  auVar273._24_4_ = 0x3f800000;
  auVar273._28_4_ = 0x3f800000;
  auVar280 = vsubps_avx(auVar273,auVar22);
  fVar175 = fVar175 + fVar175 * auVar280._0_4_;
  fVar189 = fVar189 + fVar189 * auVar280._4_4_;
  fVar191 = fVar191 + fVar191 * auVar280._8_4_;
  fVar193 = fVar193 + fVar193 * auVar280._12_4_;
  fVar195 = fVar195 + fVar195 * auVar280._16_4_;
  fVar197 = fVar197 + fVar197 * auVar280._20_4_;
  fVar198 = fVar198 + fVar198 * auVar280._24_4_;
  auVar280 = vrcpps_avx(auVar294);
  fVar231 = auVar280._0_4_;
  fVar240 = auVar280._4_4_;
  auVar21._4_4_ = fVar240 * auVar294._4_4_;
  auVar21._0_4_ = fVar231 * auVar294._0_4_;
  fVar241 = auVar280._8_4_;
  auVar21._8_4_ = fVar241 * auVar294._8_4_;
  fVar242 = auVar280._12_4_;
  auVar21._12_4_ = fVar242 * auVar294._12_4_;
  fVar243 = auVar280._16_4_;
  auVar21._16_4_ = fVar243 * auVar294._16_4_;
  fVar244 = auVar280._20_4_;
  auVar21._20_4_ = fVar244 * auVar294._20_4_;
  fVar245 = auVar280._24_4_;
  auVar21._24_4_ = fVar245 * auVar294._24_4_;
  auVar21._28_4_ = auVar294._28_4_;
  auVar280 = vsubps_avx(auVar273,auVar21);
  fVar231 = fVar231 + fVar231 * auVar280._0_4_;
  fVar240 = fVar240 + fVar240 * auVar280._4_4_;
  fVar241 = fVar241 + fVar241 * auVar280._8_4_;
  fVar242 = fVar242 + fVar242 * auVar280._12_4_;
  fVar243 = fVar243 + fVar243 * auVar280._16_4_;
  fVar244 = fVar244 + fVar244 * auVar280._20_4_;
  fVar245 = fVar245 + fVar245 * auVar280._24_4_;
  auVar280 = vrcpps_avx(auVar136);
  fVar247 = auVar280._0_4_;
  fVar255 = auVar280._4_4_;
  auVar294._4_4_ = fVar255 * auVar136._4_4_;
  auVar294._0_4_ = fVar247 * auVar136._0_4_;
  fVar258 = auVar280._8_4_;
  auVar294._8_4_ = fVar258 * auVar136._8_4_;
  fVar261 = auVar280._12_4_;
  auVar294._12_4_ = fVar261 * auVar136._12_4_;
  fVar264 = auVar280._16_4_;
  auVar294._16_4_ = fVar264 * auVar136._16_4_;
  fVar266 = auVar280._20_4_;
  auVar294._20_4_ = fVar266 * auVar136._20_4_;
  fVar268 = auVar280._24_4_;
  auVar294._24_4_ = fVar268 * auVar136._24_4_;
  auVar294._28_4_ = auVar136._28_4_;
  auVar136 = vsubps_avx(auVar273,auVar294);
  fVar247 = fVar247 + fVar247 * auVar136._0_4_;
  fVar255 = fVar255 + fVar255 * auVar136._4_4_;
  fVar258 = fVar258 + fVar258 * auVar136._8_4_;
  fVar261 = fVar261 + fVar261 * auVar136._12_4_;
  fVar264 = fVar264 + fVar264 * auVar136._16_4_;
  fVar266 = fVar266 + fVar266 * auVar136._20_4_;
  fVar268 = fVar268 + fVar268 * auVar136._24_4_;
  auVar350._8_8_ = 0;
  auVar350._0_8_ = *(ulong *)(prim + uVar124 * 7 + 6);
  auVar350 = vpmovsxwd_avx(auVar350);
  auVar201._8_8_ = 0;
  auVar201._0_8_ = *(ulong *)(prim + uVar124 * 7 + 0xe);
  auVar201 = vpmovsxwd_avx(auVar201);
  auVar138._16_16_ = auVar201;
  auVar138._0_16_ = auVar350;
  auVar136 = vcvtdq2ps_avx(auVar138);
  auVar136 = vsubps_avx(auVar136,auVar160);
  auVar196._8_8_ = 0;
  auVar196._0_8_ = *(ulong *)(prim + uVar124 * 9 + 6);
  auVar350 = vpmovsxwd_avx(auVar196);
  auVar202._8_8_ = 0;
  auVar202._0_8_ = *(ulong *)(prim + uVar124 * 9 + 0xe);
  auVar201 = vpmovsxwd_avx(auVar202);
  auVar134._0_4_ = fVar175 * auVar136._0_4_;
  auVar134._4_4_ = fVar189 * auVar136._4_4_;
  auVar134._8_4_ = fVar191 * auVar136._8_4_;
  auVar134._12_4_ = fVar193 * auVar136._12_4_;
  auVar23._16_4_ = fVar195 * auVar136._16_4_;
  auVar23._0_16_ = auVar134;
  auVar23._20_4_ = fVar197 * auVar136._20_4_;
  auVar23._24_4_ = fVar198 * auVar136._24_4_;
  auVar23._28_4_ = auVar136._28_4_;
  auVar274._16_16_ = auVar201;
  auVar274._0_16_ = auVar350;
  auVar136 = vcvtdq2ps_avx(auVar274);
  auVar136 = vsubps_avx(auVar136,auVar160);
  auVar157._0_4_ = fVar175 * auVar136._0_4_;
  auVar157._4_4_ = fVar189 * auVar136._4_4_;
  auVar157._8_4_ = fVar191 * auVar136._8_4_;
  auVar157._12_4_ = fVar193 * auVar136._12_4_;
  auVar24._16_4_ = fVar195 * auVar136._16_4_;
  auVar24._0_16_ = auVar157;
  auVar24._20_4_ = fVar197 * auVar136._20_4_;
  auVar24._24_4_ = fVar198 * auVar136._24_4_;
  auVar24._28_4_ = auVar136._28_4_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar124 * 0xe + 6);
  auVar350 = vpmovsxwd_avx(auVar9);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar124 * 0xe + 0xe);
  auVar201 = vpmovsxwd_avx(auVar10);
  auVar183._16_16_ = auVar201;
  auVar183._0_16_ = auVar350;
  auVar136 = vcvtdq2ps_avx(auVar183);
  auVar136 = vsubps_avx(auVar136,auVar214);
  auVar177._0_4_ = fVar231 * auVar136._0_4_;
  auVar177._4_4_ = fVar240 * auVar136._4_4_;
  auVar177._8_4_ = fVar241 * auVar136._8_4_;
  auVar177._12_4_ = fVar242 * auVar136._12_4_;
  auVar280._16_4_ = fVar243 * auVar136._16_4_;
  auVar280._0_16_ = auVar177;
  auVar280._20_4_ = fVar244 * auVar136._20_4_;
  auVar280._24_4_ = fVar245 * auVar136._24_4_;
  auVar280._28_4_ = auVar136._28_4_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar17 * 0x10 + 6);
  auVar350 = vpmovsxwd_avx(auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar17 * 0x10 + 0xe);
  auVar201 = vpmovsxwd_avx(auVar12);
  auVar275._16_16_ = auVar201;
  auVar275._0_16_ = auVar350;
  auVar136 = vcvtdq2ps_avx(auVar275);
  auVar136 = vsubps_avx(auVar136,auVar214);
  auVar213._0_4_ = fVar231 * auVar136._0_4_;
  auVar213._4_4_ = fVar240 * auVar136._4_4_;
  auVar213._8_4_ = fVar241 * auVar136._8_4_;
  auVar213._12_4_ = fVar242 * auVar136._12_4_;
  auVar25._16_4_ = fVar243 * auVar136._16_4_;
  auVar25._0_16_ = auVar213;
  auVar25._20_4_ = fVar244 * auVar136._20_4_;
  auVar25._24_4_ = fVar245 * auVar136._24_4_;
  auVar25._28_4_ = auVar136._28_4_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar124 * 0x15 + 6);
  auVar350 = vpmovsxwd_avx(auVar13);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar124 * 0x15 + 0xe);
  auVar201 = vpmovsxwd_avx(auVar14);
  auVar236._16_16_ = auVar201;
  auVar236._0_16_ = auVar350;
  auVar136 = vcvtdq2ps_avx(auVar236);
  auVar136 = vsubps_avx(auVar136,auVar206);
  auVar233._0_4_ = fVar247 * auVar136._0_4_;
  auVar233._4_4_ = fVar255 * auVar136._4_4_;
  auVar233._8_4_ = fVar258 * auVar136._8_4_;
  auVar233._12_4_ = fVar261 * auVar136._12_4_;
  auVar26._16_4_ = fVar264 * auVar136._16_4_;
  auVar26._0_16_ = auVar233;
  auVar26._20_4_ = fVar266 * auVar136._20_4_;
  auVar26._24_4_ = fVar268 * auVar136._24_4_;
  auVar26._28_4_ = auVar136._28_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar124 * 0x17 + 6);
  auVar350 = vpmovsxwd_avx(auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar124 * 0x17 + 0xe);
  auVar201 = vpmovsxwd_avx(auVar16);
  auVar276._16_16_ = auVar201;
  auVar276._0_16_ = auVar350;
  auVar136 = vcvtdq2ps_avx(auVar276);
  auVar136 = vsubps_avx(auVar136,auVar206);
  auVar199._0_4_ = fVar247 * auVar136._0_4_;
  auVar199._4_4_ = fVar255 * auVar136._4_4_;
  auVar199._8_4_ = fVar258 * auVar136._8_4_;
  auVar199._12_4_ = fVar261 * auVar136._12_4_;
  auVar20._16_4_ = fVar264 * auVar136._16_4_;
  auVar20._0_16_ = auVar199;
  auVar20._20_4_ = fVar266 * auVar136._20_4_;
  auVar20._24_4_ = fVar268 * auVar136._24_4_;
  auVar20._28_4_ = auVar136._28_4_;
  auVar350 = vpminsd_avx(auVar23._16_16_,auVar24._16_16_);
  auVar201 = vpminsd_avx(auVar134,auVar157);
  auVar307._16_16_ = auVar350;
  auVar307._0_16_ = auVar201;
  auVar202 = auVar25._16_16_;
  auVar284 = ZEXT1664(auVar202);
  auVar196 = auVar280._16_16_;
  auVar299 = ZEXT1664(auVar196);
  auVar350 = vpminsd_avx(auVar196,auVar202);
  auVar201 = vpminsd_avx(auVar177,auVar213);
  auVar315._16_16_ = auVar350;
  auVar315._0_16_ = auVar201;
  auVar136 = vmaxps_avx(auVar307,auVar315);
  auVar350 = vpminsd_avx(auVar26._16_16_,auVar20._16_16_);
  auVar201 = vpminsd_avx(auVar233,auVar199);
  auVar328._16_16_ = auVar350;
  auVar328._0_16_ = auVar201;
  uVar130 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar336._4_4_ = uVar130;
  auVar336._0_4_ = uVar130;
  auVar336._8_4_ = uVar130;
  auVar336._12_4_ = uVar130;
  auVar336._16_4_ = uVar130;
  auVar336._20_4_ = uVar130;
  auVar336._24_4_ = uVar130;
  auVar336._28_4_ = uVar130;
  auVar280 = vmaxps_avx(auVar328,auVar336);
  auVar136 = vmaxps_avx(auVar136,auVar280);
  local_80._4_4_ = auVar136._4_4_ * 0.99999964;
  local_80._0_4_ = auVar136._0_4_ * 0.99999964;
  local_80._8_4_ = auVar136._8_4_ * 0.99999964;
  local_80._12_4_ = auVar136._12_4_ * 0.99999964;
  local_80._16_4_ = auVar136._16_4_ * 0.99999964;
  local_80._20_4_ = auVar136._20_4_ * 0.99999964;
  local_80._24_4_ = auVar136._24_4_ * 0.99999964;
  local_80._28_4_ = 0x3f7ffffa;
  auVar350 = vpmaxsd_avx(auVar23._16_16_,auVar24._16_16_);
  auVar201 = vpmaxsd_avx(auVar134,auVar157);
  auVar139._16_16_ = auVar350;
  auVar139._0_16_ = auVar201;
  auVar350 = vpmaxsd_avx(auVar196,auVar202);
  auVar201 = vpmaxsd_avx(auVar177,auVar213);
  auVar161._16_16_ = auVar350;
  auVar161._0_16_ = auVar201;
  auVar136 = vminps_avx(auVar139,auVar161);
  auVar350 = vpmaxsd_avx(auVar26._16_16_,auVar20._16_16_);
  auVar201 = vpmaxsd_avx(auVar233,auVar199);
  auVar162._16_16_ = auVar350;
  auVar162._0_16_ = auVar201;
  fVar175 = ray->tfar;
  auVar184._4_4_ = fVar175;
  auVar184._0_4_ = fVar175;
  auVar184._8_4_ = fVar175;
  auVar184._12_4_ = fVar175;
  auVar184._16_4_ = fVar175;
  auVar184._20_4_ = fVar175;
  auVar184._24_4_ = fVar175;
  auVar184._28_4_ = fVar175;
  auVar280 = vminps_avx(auVar162,auVar184);
  auVar136 = vminps_avx(auVar136,auVar280);
  auVar27._4_4_ = auVar136._4_4_ * 1.0000004;
  auVar27._0_4_ = auVar136._0_4_ * 1.0000004;
  auVar27._8_4_ = auVar136._8_4_ * 1.0000004;
  auVar27._12_4_ = auVar136._12_4_ * 1.0000004;
  auVar27._16_4_ = auVar136._16_4_ * 1.0000004;
  auVar27._20_4_ = auVar136._20_4_ * 1.0000004;
  auVar27._24_4_ = auVar136._24_4_ * 1.0000004;
  auVar27._28_4_ = auVar136._28_4_;
  auVar136 = vcmpps_avx(local_80,auVar27,2);
  auVar350 = vpshufd_avx(ZEXT116((byte)PVar17),0);
  auVar163._16_16_ = auVar350;
  auVar163._0_16_ = auVar350;
  auVar280 = vcvtdq2ps_avx(auVar163);
  auVar280 = vcmpps_avx(_DAT_01f7b060,auVar280,1);
  auVar136 = vandps_avx(auVar136,auVar280);
  uVar130 = vmovmskps_avx(auVar136);
  local_4a0 = mm_lookupmask_ps._16_8_;
  uStack_498 = mm_lookupmask_ps._24_8_;
  uStack_490 = mm_lookupmask_ps._16_8_;
  uStack_488 = mm_lookupmask_ps._24_8_;
  uVar124 = CONCAT44((int)((ulong)unaff_R12 >> 0x20),uVar130);
  local_7a8 = prim;
  while (auVar136 = local_6c0, uVar124 != 0) {
    auVar294 = auVar299._0_32_;
    auVar280 = auVar284._0_32_;
    lVar131 = 0;
    if (uVar124 != 0) {
      for (; (uVar124 >> lVar131 & 1) == 0; lVar131 = lVar131 + 1) {
      }
    }
    uVar132 = uVar124 - 1 & uVar124;
    local_730 = (ulong)*(uint *)(local_7a8 + 2);
    pGVar18 = (context->scene->geometries).items[*(uint *)(local_7a8 + 2)].ptr;
    local_588 = (ulong)*(uint *)(local_7a8 + lVar131 * 4 + 6);
    uVar129 = (ulong)*(uint *)(*(long *)&pGVar18->field_0x58 +
                              pGVar18[1].super_RefCount.refCounter.
                              super___atomic_base<unsigned_long>._M_i *
                              (ulong)*(uint *)(local_7a8 + lVar131 * 4 + 6));
    p_Var19 = pGVar18[1].intersectionFilterN;
    uVar126 = *(ulong *)&pGVar18[1].time_range.upper;
    _local_780 = *(undefined1 (*) [16])(uVar126 + (long)p_Var19 * uVar129);
    _local_5e0 = *(undefined1 (*) [16])(uVar126 + (uVar129 + 1) * (long)p_Var19);
    _local_770 = *(undefined1 (*) [16])(uVar126 + (uVar129 + 2) * (long)p_Var19);
    lVar131 = 0;
    if (uVar132 != 0) {
      for (; (uVar132 >> lVar131 & 1) == 0; lVar131 = lVar131 + 1) {
      }
    }
    pauVar1 = (undefined1 (*) [12])(uVar126 + (uVar129 + 3) * (long)p_Var19);
    local_220 = *(undefined8 *)*pauVar1;
    uStack_218 = *(undefined8 *)(*pauVar1 + 8);
    local_5d0 = (float)local_220;
    fStack_5cc = (float)((ulong)local_220 >> 0x20);
    fStack_5c8 = (float)uStack_218;
    fStack_5c4 = (float)((ulong)uStack_218 >> 0x20);
    if (((uVar132 != 0) && (uVar129 = uVar132 - 1 & uVar132, uVar129 != 0)) &&
       (lVar131 = 0, uVar129 != 0)) {
      for (; (uVar129 >> lVar131 & 1) == 0; lVar131 = lVar131 + 1) {
      }
    }
    uVar123 = (uint)pGVar18[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    aVar8 = (ray->org).field_0;
    auVar196 = vsubps_avx(_local_780,(undefined1  [16])aVar8);
    auVar12 = _local_780;
    auVar350 = vshufps_avx(auVar196,auVar196,0);
    auVar201 = vshufps_avx(auVar196,auVar196,0x55);
    auVar196 = vshufps_avx(auVar196,auVar196,0xaa);
    fVar175 = (local_728->ray_space).vx.field_0.m128[0];
    fVar189 = (local_728->ray_space).vx.field_0.m128[1];
    fVar191 = (local_728->ray_space).vx.field_0.m128[2];
    fVar193 = (local_728->ray_space).vx.field_0.m128[3];
    fVar195 = (local_728->ray_space).vy.field_0.m128[0];
    fVar197 = (local_728->ray_space).vy.field_0.m128[1];
    fVar198 = (local_728->ray_space).vy.field_0.m128[2];
    fVar231 = (local_728->ray_space).vy.field_0.m128[3];
    fVar240 = (local_728->ray_space).vz.field_0.m128[0];
    fVar241 = (local_728->ray_space).vz.field_0.m128[1];
    fVar242 = (local_728->ray_space).vz.field_0.m128[2];
    fVar243 = (local_728->ray_space).vz.field_0.m128[3];
    auVar327._0_4_ = auVar350._0_4_ * fVar175 + auVar196._0_4_ * fVar240 + auVar201._0_4_ * fVar195;
    auVar327._4_4_ = auVar350._4_4_ * fVar189 + auVar196._4_4_ * fVar241 + auVar201._4_4_ * fVar197;
    auVar327._8_4_ = auVar350._8_4_ * fVar191 + auVar196._8_4_ * fVar242 + auVar201._8_4_ * fVar198;
    auVar327._12_4_ =
         auVar350._12_4_ * fVar193 + auVar196._12_4_ * fVar243 + auVar201._12_4_ * fVar231;
    auVar350 = vblendps_avx(auVar327,_local_780,8);
    auVar202 = vsubps_avx(_local_5e0,(undefined1  [16])aVar8);
    auVar201 = vshufps_avx(auVar202,auVar202,0);
    auVar196 = vshufps_avx(auVar202,auVar202,0x55);
    auVar202 = vshufps_avx(auVar202,auVar202,0xaa);
    auVar335._0_4_ = auVar201._0_4_ * fVar175 + auVar202._0_4_ * fVar240 + auVar196._0_4_ * fVar195;
    auVar335._4_4_ = auVar201._4_4_ * fVar189 + auVar202._4_4_ * fVar241 + auVar196._4_4_ * fVar197;
    auVar335._8_4_ = auVar201._8_4_ * fVar191 + auVar202._8_4_ * fVar242 + auVar196._8_4_ * fVar198;
    auVar335._12_4_ =
         auVar201._12_4_ * fVar193 + auVar202._12_4_ * fVar243 + auVar196._12_4_ * fVar231;
    auVar201 = vblendps_avx(auVar335,_local_5e0,8);
    auVar9 = vsubps_avx(_local_770,(undefined1  [16])aVar8);
    auVar196 = vshufps_avx(auVar9,auVar9,0);
    auVar202 = vshufps_avx(auVar9,auVar9,0x55);
    auVar9 = vshufps_avx(auVar9,auVar9,0xaa);
    auVar292._0_4_ = auVar196._0_4_ * fVar175 + auVar202._0_4_ * fVar195 + auVar9._0_4_ * fVar240;
    auVar292._4_4_ = auVar196._4_4_ * fVar189 + auVar202._4_4_ * fVar197 + auVar9._4_4_ * fVar241;
    auVar292._8_4_ = auVar196._8_4_ * fVar191 + auVar202._8_4_ * fVar198 + auVar9._8_4_ * fVar242;
    auVar292._12_4_ =
         auVar196._12_4_ * fVar193 + auVar202._12_4_ * fVar231 + auVar9._12_4_ * fVar243;
    auVar10 = vshufps_avx(_local_770,_local_770,0xff);
    auVar13 = _local_770;
    auVar196 = vblendps_avx(auVar292,_local_770,8);
    auVar111._12_4_ = fStack_5c4;
    auVar111._0_12_ = *pauVar1;
    auVar11 = vsubps_avx(auVar111,(undefined1  [16])aVar8);
    auVar202 = vshufps_avx(auVar11,auVar11,0);
    auVar9 = vshufps_avx(auVar11,auVar11,0x55);
    auVar11 = vshufps_avx(auVar11,auVar11,0xaa);
    auVar178._0_4_ = auVar202._0_4_ * fVar175 + auVar11._0_4_ * fVar240 + auVar9._0_4_ * fVar195;
    auVar178._4_4_ = auVar202._4_4_ * fVar189 + auVar11._4_4_ * fVar241 + auVar9._4_4_ * fVar197;
    auVar178._8_4_ = auVar202._8_4_ * fVar191 + auVar11._8_4_ * fVar242 + auVar9._8_4_ * fVar198;
    auVar178._12_4_ = auVar202._12_4_ * fVar193 + auVar11._12_4_ * fVar243 + auVar9._12_4_ * fVar231
    ;
    auVar202 = vblendps_avx(auVar178,auVar111,8);
    auVar250._8_4_ = 0x7fffffff;
    auVar250._0_8_ = 0x7fffffff7fffffff;
    auVar250._12_4_ = 0x7fffffff;
    auVar350 = vandps_avx(auVar350,auVar250);
    auVar201 = vandps_avx(auVar201,auVar250);
    auVar9 = vmaxps_avx(auVar350,auVar201);
    auVar350 = vandps_avx(auVar196,auVar250);
    auVar201 = vandps_avx(auVar202,auVar250);
    auVar350 = vmaxps_avx(auVar350,auVar201);
    auVar350 = vmaxps_avx(auVar9,auVar350);
    auVar201 = vmovshdup_avx(auVar350);
    auVar201 = vmaxss_avx(auVar201,auVar350);
    auVar350 = vshufpd_avx(auVar350,auVar350,1);
    auVar350 = vmaxss_avx(auVar350,auVar201);
    local_6c0._0_4_ = auVar350._0_4_;
    local_7b0 = (long)(int)uVar123;
    lVar131 = local_7b0 * 0x44;
    fVar247 = *(float *)(catmullrom_basis0 + lVar131 + 0x908);
    fVar255 = *(float *)(catmullrom_basis0 + lVar131 + 0x90c);
    fVar258 = *(float *)(catmullrom_basis0 + lVar131 + 0x910);
    fVar261 = *(float *)(catmullrom_basis0 + lVar131 + 0x914);
    fVar264 = *(float *)(catmullrom_basis0 + lVar131 + 0x918);
    fVar266 = *(float *)(catmullrom_basis0 + lVar131 + 0x91c);
    fVar268 = *(float *)(catmullrom_basis0 + lVar131 + 0x920);
    auVar201 = vshufps_avx(auVar292,auVar292,0);
    local_640._16_16_ = auVar201;
    local_640._0_16_ = auVar201;
    auVar196 = vshufps_avx(auVar292,auVar292,0x55);
    local_520._16_16_ = auVar196;
    local_520._0_16_ = auVar196;
    fVar175 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar131 + 0xd8c);
    fVar189 = *(float *)(catmullrom_basis0 + lVar131 + 0xd90);
    fVar191 = *(float *)(catmullrom_basis0 + lVar131 + 0xd94);
    fVar193 = *(float *)(catmullrom_basis0 + lVar131 + 0xd98);
    fVar195 = *(float *)(catmullrom_basis0 + lVar131 + 0xd9c);
    fVar197 = *(float *)(catmullrom_basis0 + lVar131 + 0xda0);
    fVar198 = *(float *)(catmullrom_basis0 + lVar131 + 0xda4);
    auVar119 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar131 + 0xd8c);
    auVar202 = vshufps_avx(auVar178,auVar178,0);
    register0x00001510 = auVar202;
    _local_3e0 = auVar202;
    auVar9 = vshufps_avx(auVar178,auVar178,0x55);
    register0x00001290 = auVar9;
    _local_760 = auVar9;
    fVar317 = auVar202._0_4_;
    fVar323 = auVar202._4_4_;
    fVar324 = auVar202._8_4_;
    fVar325 = auVar202._12_4_;
    fVar176 = auVar9._0_4_;
    fVar190 = auVar9._4_4_;
    fVar192 = auVar9._8_4_;
    fVar194 = auVar9._12_4_;
    fVar211 = auVar201._0_4_;
    fVar220 = auVar201._4_4_;
    fVar222 = auVar201._8_4_;
    fVar224 = auVar201._12_4_;
    fVar249 = auVar196._0_4_;
    fVar257 = auVar196._4_4_;
    fVar260 = auVar196._8_4_;
    fVar263 = auVar196._12_4_;
    auVar201 = vshufps_avx(auVar111,auVar111,0xff);
    local_7a0._0_4_ = auVar10._0_4_;
    local_140 = (float)local_7a0._0_4_;
    local_7a0._4_4_ = auVar10._4_4_;
    fStack_13c = (float)local_7a0._4_4_;
    fStack_798 = auVar10._8_4_;
    fStack_138 = fStack_798;
    fStack_794 = auVar10._12_4_;
    fStack_134 = fStack_794;
    register0x00001410 = auVar201;
    _local_a0 = auVar201;
    fVar265 = auVar201._0_4_;
    fVar267 = auVar201._4_4_;
    fVar269 = auVar201._8_4_;
    fVar287 = auVar201._12_4_;
    auVar201 = vshufps_avx(auVar335,auVar335,0);
    register0x00001390 = auVar201;
    _local_120 = auVar201;
    fVar285 = *(float *)(catmullrom_basis0 + lVar131 + 0x484);
    fVar286 = *(float *)(catmullrom_basis0 + lVar131 + 0x488);
    fVar227 = *(float *)(catmullrom_basis0 + lVar131 + 0x48c);
    fVar172 = *(float *)(catmullrom_basis0 + lVar131 + 0x490);
    fStack_470 = *(float *)(catmullrom_basis0 + lVar131 + 0x494);
    fStack_46c = *(float *)(catmullrom_basis0 + lVar131 + 0x498);
    fStack_468 = *(float *)(catmullrom_basis0 + lVar131 + 0x49c);
    fVar248 = auVar201._0_4_;
    fVar256 = auVar201._4_4_;
    fVar259 = auVar201._8_4_;
    fVar262 = auVar201._12_4_;
    auVar201 = vshufps_avx(auVar335,auVar335,0x55);
    local_580._16_16_ = auVar201;
    local_580._0_16_ = auVar201;
    fVar333 = auVar201._0_4_;
    fVar338 = auVar201._4_4_;
    fVar340 = auVar201._8_4_;
    fVar342 = auVar201._12_4_;
    auVar10 = _local_5e0;
    auVar201 = vshufps_avx(_local_5e0,_local_5e0,0xff);
    register0x000015d0 = auVar201;
    _local_c0 = auVar201;
    fStack_464 = *(float *)(catmullrom_basis0 + lVar131 + 0x4a0);
    fVar332 = auVar201._0_4_;
    fVar334 = auVar201._4_4_;
    fVar339 = auVar201._8_4_;
    fVar341 = auVar201._12_4_;
    auVar201 = vshufps_avx(auVar327,auVar327,0);
    register0x00001550 = auVar201;
    _local_6e0 = auVar201;
    auVar331 = ZEXT3264(_local_6e0);
    pauVar2 = (undefined1 (*) [32])(catmullrom_basis0 + lVar131);
    fVar231 = *(float *)*pauVar2;
    fVar240 = *(float *)(catmullrom_basis0 + lVar131 + 4);
    fVar241 = *(float *)(catmullrom_basis0 + lVar131 + 8);
    fVar242 = *(float *)(catmullrom_basis0 + lVar131 + 0xc);
    fVar243 = *(float *)(catmullrom_basis0 + lVar131 + 0x10);
    fVar244 = *(float *)(catmullrom_basis0 + lVar131 + 0x14);
    fVar245 = *(float *)(catmullrom_basis0 + lVar131 + 0x18);
    auVar120 = *(undefined1 (*) [28])*pauVar2;
    fVar326 = auVar201._0_4_;
    fStack_3fc = auVar201._4_4_;
    fStack_3f8 = auVar201._8_4_;
    fStack_3f4 = auVar201._12_4_;
    auVar295._0_4_ = fVar326 * fVar231 + fVar248 * fVar285 + fVar211 * fVar247 + fVar317 * fVar175;
    auVar295._4_4_ =
         fStack_3fc * fVar240 + fVar256 * fVar286 + fVar220 * fVar255 + fVar323 * fVar189;
    auVar295._8_4_ =
         fStack_3f8 * fVar241 + fVar259 * fVar227 + fVar222 * fVar258 + fVar324 * fVar191;
    auVar295._12_4_ =
         fStack_3f4 * fVar242 + fVar262 * fVar172 + fVar224 * fVar261 + fVar325 * fVar193;
    auVar295._16_4_ =
         fVar326 * fVar243 + fVar248 * fStack_470 + fVar211 * fVar264 + fVar317 * fVar195;
    auVar295._20_4_ =
         fStack_3fc * fVar244 + fVar256 * fStack_46c + fVar220 * fVar266 + fVar323 * fVar197;
    auVar295._24_4_ =
         fStack_3f8 * fVar245 + fVar259 * fStack_468 + fVar222 * fVar268 + fVar324 * fVar198;
    auVar295._28_4_ = fVar263 + *(float *)(catmullrom_basis0 + lVar131 + 0x924) + fVar224 + 0.0;
    auVar196 = vshufps_avx(auVar327,auVar327,0x55);
    register0x00001250 = auVar196;
    _local_420 = auVar196;
    fVar155 = auVar196._0_4_;
    fVar169 = auVar196._4_4_;
    fVar170 = auVar196._8_4_;
    fVar171 = auVar196._12_4_;
    auVar185._0_4_ = fVar155 * fVar231 + fVar333 * fVar285 + fVar249 * fVar247 + fVar176 * fVar175;
    auVar185._4_4_ = fVar169 * fVar240 + fVar338 * fVar286 + fVar257 * fVar255 + fVar190 * fVar189;
    auVar185._8_4_ = fVar170 * fVar241 + fVar340 * fVar227 + fVar260 * fVar258 + fVar192 * fVar191;
    auVar185._12_4_ = fVar171 * fVar242 + fVar342 * fVar172 + fVar263 * fVar261 + fVar194 * fVar193;
    auVar185._16_4_ =
         fVar155 * fVar243 + fVar333 * fStack_470 + fVar249 * fVar264 + fVar176 * fVar195;
    auVar185._20_4_ =
         fVar169 * fVar244 + fVar338 * fStack_46c + fVar257 * fVar266 + fVar190 * fVar197;
    auVar185._24_4_ =
         fVar170 * fVar245 + fVar340 * fStack_468 + fVar260 * fVar268 + fVar192 * fVar198;
    auVar185._28_4_ = fVar224 + 0.0 + 0.0 + 0.0;
    auVar196 = vpermilps_avx(_local_780,0xff);
    register0x00001490 = auVar196;
    _local_e0 = auVar196;
    _local_320 = *pauVar2;
    auVar20 = _local_320;
    fVar305 = auVar196._0_4_;
    fVar312 = auVar196._4_4_;
    fVar313 = auVar196._8_4_;
    fVar133 = fVar305 * fVar231 +
              fVar332 * fVar285 + (float)local_7a0._0_4_ * fVar247 + fVar265 * fVar175;
    fVar152 = fVar312 * fVar240 +
              fVar334 * fVar286 + (float)local_7a0._4_4_ * fVar255 + fVar267 * fVar189;
    fVar153 = fVar313 * fVar241 + fVar339 * fVar227 + fStack_798 * fVar258 + fVar269 * fVar191;
    fStack_794 = auVar196._12_4_ * fVar242 +
                 fVar341 * fVar172 + fStack_794 * fVar261 + fVar287 * fVar193;
    fStack_790 = fVar305 * fVar243 +
                 fVar332 * fStack_470 + (float)local_7a0._0_4_ * fVar264 + fVar265 * fVar195;
    fStack_78c = fVar312 * fVar244 +
                 fVar334 * fStack_46c + (float)local_7a0._4_4_ * fVar266 + fVar267 * fVar197;
    fStack_788 = fVar313 * fVar245 + fVar339 * fStack_468 + fStack_798 * fVar268 + fVar269 * fVar198
    ;
    local_7a0._4_4_ = fVar152;
    local_7a0._0_4_ = fVar133;
    fStack_798 = fVar153;
    fStack_784 = 0.0;
    fVar288 = *(float *)(catmullrom_basis1 + lVar131 + 0x908);
    fVar289 = *(float *)(catmullrom_basis1 + lVar131 + 0x90c);
    fVar228 = *(float *)(catmullrom_basis1 + lVar131 + 0x910);
    fVar173 = *(float *)(catmullrom_basis1 + lVar131 + 0x914);
    fVar290 = *(float *)(catmullrom_basis1 + lVar131 + 0x918);
    fVar291 = *(float *)(catmullrom_basis1 + lVar131 + 0x91c);
    fVar229 = *(float *)(catmullrom_basis1 + lVar131 + 0x920);
    fVar210 = *(float *)(catmullrom_basis1 + lVar131 + 0xd8c);
    fVar174 = *(float *)(catmullrom_basis1 + lVar131 + 0xd90);
    fVar304 = *(float *)(catmullrom_basis1 + lVar131 + 0xd94);
    fVar300 = *(float *)(catmullrom_basis1 + lVar131 + 0xd98);
    fVar301 = *(float *)(catmullrom_basis1 + lVar131 + 0xd9c);
    fVar302 = *(float *)(catmullrom_basis1 + lVar131 + 0xda0);
    fVar303 = *(float *)(catmullrom_basis1 + lVar131 + 0xda4);
    fStack_130 = local_140;
    fStack_12c = fStack_13c;
    fStack_128 = fStack_138;
    fStack_124 = fStack_134;
    fVar230 = *(float *)(catmullrom_basis1 + lVar131 + 0x484);
    fVar154 = *(float *)(catmullrom_basis1 + lVar131 + 0x488);
    fVar212 = *(float *)(catmullrom_basis1 + lVar131 + 0x48c);
    fVar221 = *(float *)(catmullrom_basis1 + lVar131 + 0x490);
    fVar223 = *(float *)(catmullrom_basis1 + lVar131 + 0x494);
    fVar225 = *(float *)(catmullrom_basis1 + lVar131 + 0x498);
    fVar226 = *(float *)(catmullrom_basis1 + lVar131 + 0x49c);
    fVar246 = fVar287 + 0.0 + 0.0;
    auVar21 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar131);
    auVar209 = ZEXT3264(auVar21);
    fVar175 = auVar21._0_4_;
    fVar191 = auVar21._4_4_;
    fVar195 = auVar21._8_4_;
    fVar198 = auVar21._12_4_;
    fVar240 = auVar21._16_4_;
    fVar242 = auVar21._20_4_;
    fVar244 = auVar21._24_4_;
    local_4c0._0_4_ = fVar326 * fVar175 + fVar230 * fVar248 + fVar288 * fVar211 + fVar317 * fVar210;
    local_4c0._4_4_ =
         fStack_3fc * fVar191 + fVar154 * fVar256 + fVar289 * fVar220 + fVar323 * fVar174;
    fStack_4b8 = fStack_3f8 * fVar195 + fVar212 * fVar259 + fVar228 * fVar222 + fVar324 * fVar304;
    fStack_4b4 = fStack_3f4 * fVar198 + fVar221 * fVar262 + fVar173 * fVar224 + fVar325 * fVar300;
    fStack_4b0 = fVar326 * fVar240 + fVar223 * fVar248 + fVar290 * fVar211 + fVar317 * fVar301;
    fStack_4ac = fStack_3fc * fVar242 + fVar225 * fVar256 + fVar291 * fVar220 + fVar323 * fVar302;
    fStack_4a8 = fStack_3f8 * fVar244 + fVar226 * fVar259 + fVar229 * fVar222 + fVar324 * fVar303;
    fStack_4a4 = fVar341 + fVar342 + 0.0;
    local_460._0_4_ = fVar155 * fVar175 + fVar333 * fVar230 + fVar288 * fVar249 + fVar210 * fVar176;
    local_460._4_4_ = fVar169 * fVar191 + fVar338 * fVar154 + fVar289 * fVar257 + fVar174 * fVar190;
    fStack_458 = fVar170 * fVar195 + fVar340 * fVar212 + fVar228 * fVar260 + fVar304 * fVar192;
    fStack_454 = fVar171 * fVar198 + fVar342 * fVar221 + fVar173 * fVar263 + fVar300 * fVar194;
    fStack_450 = fVar155 * fVar240 + fVar333 * fVar223 + fVar290 * fVar249 + fVar301 * fVar176;
    fStack_44c = fVar169 * fVar242 + fVar338 * fVar225 + fVar291 * fVar257 + fVar302 * fVar190;
    fStack_448 = fVar170 * fVar244 + fVar340 * fVar226 + fVar229 * fVar260 + fVar303 * fVar192;
    fStack_444 = fVar342 + 0.0 + 0.0;
    local_620._0_4_ =
         fVar305 * fVar175 + fVar332 * fVar230 + local_140 * fVar288 + fVar265 * fVar210;
    local_620._4_4_ =
         fVar312 * fVar191 + fVar334 * fVar154 + fStack_13c * fVar289 + fVar267 * fVar174;
    local_620._8_4_ =
         fVar313 * fVar195 + fVar339 * fVar212 + fStack_138 * fVar228 + fVar269 * fVar304;
    local_620._12_4_ =
         auVar196._12_4_ * fVar198 + fVar341 * fVar221 + fStack_134 * fVar173 + fVar287 * fVar300;
    local_620._16_4_ =
         fVar305 * fVar240 + fVar332 * fVar223 + local_140 * fVar290 + fVar265 * fVar301;
    local_620._20_4_ =
         fVar312 * fVar242 + fVar334 * fVar225 + fStack_13c * fVar291 + fVar267 * fVar302;
    local_620._24_4_ =
         fVar313 * fVar244 + fVar339 * fVar226 + fStack_138 * fVar229 + fVar269 * fVar303;
    local_620._28_4_ = fVar246 + 0.0;
    auVar24 = vsubps_avx(_local_4c0,auVar295);
    auVar25 = vsubps_avx(_local_460,auVar185);
    fVar265 = auVar24._0_4_;
    fVar267 = auVar24._4_4_;
    auVar28._4_4_ = fVar267 * auVar185._4_4_;
    auVar28._0_4_ = fVar265 * auVar185._0_4_;
    fVar269 = auVar24._8_4_;
    auVar28._8_4_ = fVar269 * auVar185._8_4_;
    fVar287 = auVar24._12_4_;
    auVar28._12_4_ = fVar287 * auVar185._12_4_;
    fVar305 = auVar24._16_4_;
    auVar28._16_4_ = fVar305 * auVar185._16_4_;
    fVar312 = auVar24._20_4_;
    auVar28._20_4_ = fVar312 * auVar185._20_4_;
    fVar313 = auVar24._24_4_;
    auVar28._24_4_ = fVar313 * auVar185._24_4_;
    auVar28._28_4_ = 0;
    fVar189 = auVar25._0_4_;
    fVar193 = auVar25._4_4_;
    auVar29._4_4_ = auVar295._4_4_ * fVar193;
    auVar29._0_4_ = auVar295._0_4_ * fVar189;
    fVar197 = auVar25._8_4_;
    auVar29._8_4_ = auVar295._8_4_ * fVar197;
    fVar231 = auVar25._12_4_;
    auVar29._12_4_ = auVar295._12_4_ * fVar231;
    fVar241 = auVar25._16_4_;
    auVar29._16_4_ = auVar295._16_4_ * fVar241;
    fVar243 = auVar25._20_4_;
    auVar29._20_4_ = auVar295._20_4_ * fVar243;
    fVar245 = auVar25._24_4_;
    auVar29._24_4_ = auVar295._24_4_ * fVar245;
    auVar29._28_4_ = fVar246;
    auVar23 = vsubps_avx(auVar28,auVar29);
    auVar22 = vmaxps_avx(_local_7a0,local_620);
    auVar30._4_4_ = auVar22._4_4_ * auVar22._4_4_ * (fVar267 * fVar267 + fVar193 * fVar193);
    auVar30._0_4_ = auVar22._0_4_ * auVar22._0_4_ * (fVar265 * fVar265 + fVar189 * fVar189);
    auVar30._8_4_ = auVar22._8_4_ * auVar22._8_4_ * (fVar269 * fVar269 + fVar197 * fVar197);
    auVar30._12_4_ = auVar22._12_4_ * auVar22._12_4_ * (fVar287 * fVar287 + fVar231 * fVar231);
    auVar30._16_4_ = auVar22._16_4_ * auVar22._16_4_ * (fVar305 * fVar305 + fVar241 * fVar241);
    auVar30._20_4_ = auVar22._20_4_ * auVar22._20_4_ * (fVar312 * fVar312 + fVar243 * fVar243);
    auVar30._24_4_ = auVar22._24_4_ * auVar22._24_4_ * (fVar313 * fVar313 + fVar245 * fVar245);
    auVar30._28_4_ = fStack_444 + fVar246;
    auVar31._4_4_ = auVar23._4_4_ * auVar23._4_4_;
    auVar31._0_4_ = auVar23._0_4_ * auVar23._0_4_;
    auVar31._8_4_ = auVar23._8_4_ * auVar23._8_4_;
    auVar31._12_4_ = auVar23._12_4_ * auVar23._12_4_;
    auVar31._16_4_ = auVar23._16_4_ * auVar23._16_4_;
    auVar31._20_4_ = auVar23._20_4_ * auVar23._20_4_;
    auVar31._24_4_ = auVar23._24_4_ * auVar23._24_4_;
    auVar31._28_4_ = auVar23._28_4_;
    auVar22 = vcmpps_avx(auVar31,auVar30,2);
    fVar189 = auVar350._0_4_ * 4.7683716e-07;
    auVar168 = ZEXT464((uint)fVar189);
    auVar234._0_4_ = (float)(int)uVar123;
    auVar234._4_12_ = auVar201._4_12_;
    local_400 = auVar234._0_4_;
    auVar350 = vshufps_avx(auVar234,auVar234,0);
    auVar237._16_16_ = auVar350;
    auVar237._0_16_ = auVar350;
    auVar23 = vcmpps_avx(_DAT_01f7b060,auVar237,1);
    auVar350 = vpermilps_avx(auVar327,0xaa);
    register0x00001490 = auVar350;
    _local_3c0 = auVar350;
    auVar201 = vpermilps_avx(auVar335,0xaa);
    register0x00001590 = auVar201;
    _local_300 = auVar201;
    auVar196 = vpermilps_avx(auVar292,0xaa);
    register0x000015d0 = auVar196;
    _local_2e0 = auVar196;
    auVar202 = vpermilps_avx(auVar178,0xaa);
    register0x00001290 = auVar202;
    _local_540 = auVar202;
    auVar26 = auVar23 & auVar22;
    auVar9 = vpermilps_avx((undefined1  [16])aVar8,0xff);
    _local_600 = ZEXT1632(auVar9);
    fVar193 = fVar176;
    fVar197 = fVar190;
    fVar231 = fVar192;
    fVar241 = fVar194;
    if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar26 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar26 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar26 >> 0x7f,0) == '\0') &&
          (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar26 >> 0xbf,0) == '\0') &&
        (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar26[0x1f]) {
      uVar126 = 0;
      auVar284 = ZEXT3264(auVar280);
      auVar299 = ZEXT3264(auVar294);
      auVar279 = ZEXT3264(local_580);
      _local_600 = auVar9;
    }
    else {
      local_6c0._16_16_ = auVar136._16_16_;
      local_6c0._0_16_ = ZEXT416((uint)fVar189);
      local_340 = vandps_avx(auVar22,auVar23);
      fVar287 = auVar350._0_4_;
      fVar305 = auVar350._4_4_;
      fVar312 = auVar350._8_4_;
      fVar313 = auVar350._12_4_;
      fVar334 = auVar201._0_4_;
      fVar339 = auVar201._4_4_;
      fVar341 = auVar201._8_4_;
      fVar343 = auVar201._12_4_;
      fVar344 = auVar196._0_4_;
      fVar347 = auVar196._4_4_;
      fVar348 = auVar196._8_4_;
      fVar349 = auVar196._12_4_;
      fVar246 = auVar202._0_4_;
      fVar265 = auVar202._4_4_;
      fVar267 = auVar202._8_4_;
      fVar269 = auVar202._12_4_;
      fVar243 = auVar22._28_4_ + auVar23._28_4_ + 0.0;
      local_360 = fVar287 * fVar175 + fVar334 * fVar230 + fVar344 * fVar288 + fVar246 * fVar210;
      fStack_35c = fVar305 * fVar191 + fVar339 * fVar154 + fVar347 * fVar289 + fVar265 * fVar174;
      fStack_358 = fVar312 * fVar195 + fVar341 * fVar212 + fVar348 * fVar228 + fVar267 * fVar304;
      fStack_354 = fVar313 * fVar198 + fVar343 * fVar221 + fVar349 * fVar173 + fVar269 * fVar300;
      fStack_350 = fVar287 * fVar240 + fVar334 * fVar223 + fVar344 * fVar290 + fVar246 * fVar301;
      fStack_34c = fVar305 * fVar242 + fVar339 * fVar225 + fVar347 * fVar291 + fVar265 * fVar302;
      fStack_348 = fVar312 * fVar244 + fVar341 * fVar226 + fVar348 * fVar229 + fVar267 * fVar303;
      fStack_344 = auVar21._28_4_ + fVar243;
      local_320._0_4_ = auVar120._0_4_;
      local_320._4_4_ = auVar120._4_4_;
      fStack_318 = auVar120._8_4_;
      fStack_314 = auVar120._12_4_;
      fStack_310 = auVar120._16_4_;
      fStack_30c = auVar120._20_4_;
      fStack_308 = auVar120._24_4_;
      local_560._0_4_ = auVar119._0_4_;
      local_560._4_4_ = auVar119._4_4_;
      fStack_558 = auVar119._8_4_;
      fStack_554 = auVar119._12_4_;
      fStack_550 = auVar119._16_4_;
      fStack_54c = auVar119._20_4_;
      fStack_548 = auVar119._24_4_;
      local_4e0 = fVar287 * (float)local_320._0_4_ +
                  fVar334 * fVar285 + fVar344 * fVar247 + fVar246 * (float)local_560._0_4_;
      fStack_4dc = fVar305 * (float)local_320._4_4_ +
                   fVar339 * fVar286 + fVar347 * fVar255 + fVar265 * (float)local_560._4_4_;
      fStack_4d8 = fVar312 * fStack_318 +
                   fVar341 * fVar227 + fVar348 * fVar258 + fVar267 * fStack_558;
      fStack_4d4 = fVar313 * fStack_314 +
                   fVar343 * fVar172 + fVar349 * fVar261 + fVar269 * fStack_554;
      fStack_4d0 = fVar287 * fStack_310 +
                   fVar334 * fStack_470 + fVar344 * fVar264 + fVar246 * fStack_550;
      fStack_4cc = fVar305 * fStack_30c +
                   fVar339 * fStack_46c + fVar347 * fVar266 + fVar265 * fStack_54c;
      fStack_4c8 = fVar312 * fStack_308 +
                   fVar341 * fStack_468 + fVar348 * fVar268 + fVar267 * fStack_548;
      fStack_4c4 = local_340._28_4_ + fStack_344 + auVar21._28_4_ + fVar243;
      fVar175 = *(float *)(catmullrom_basis0 + lVar131 + 0x1210);
      fVar191 = *(float *)(catmullrom_basis0 + lVar131 + 0x1214);
      fVar195 = *(float *)(catmullrom_basis0 + lVar131 + 0x1218);
      fVar198 = *(float *)(catmullrom_basis0 + lVar131 + 0x121c);
      fVar240 = *(float *)(catmullrom_basis0 + lVar131 + 0x1220);
      fVar242 = *(float *)(catmullrom_basis0 + lVar131 + 0x1224);
      fVar243 = *(float *)(catmullrom_basis0 + lVar131 + 0x1228);
      fVar244 = *(float *)(catmullrom_basis0 + lVar131 + 0x1694);
      fVar245 = *(float *)(catmullrom_basis0 + lVar131 + 0x1698);
      fVar247 = *(float *)(catmullrom_basis0 + lVar131 + 0x169c);
      fVar255 = *(float *)(catmullrom_basis0 + lVar131 + 0x16a0);
      fVar258 = *(float *)(catmullrom_basis0 + lVar131 + 0x16a4);
      fVar261 = *(float *)(catmullrom_basis0 + lVar131 + 0x16a8);
      fVar264 = *(float *)(catmullrom_basis0 + lVar131 + 0x16ac);
      fVar266 = *(float *)(catmullrom_basis0 + lVar131 + 0x1b18);
      fVar268 = *(float *)(catmullrom_basis0 + lVar131 + 0x1b1c);
      fVar285 = *(float *)(catmullrom_basis0 + lVar131 + 0x1b20);
      fVar286 = *(float *)(catmullrom_basis0 + lVar131 + 0x1b24);
      fVar227 = *(float *)(catmullrom_basis0 + lVar131 + 0x1b28);
      fVar172 = *(float *)(catmullrom_basis0 + lVar131 + 0x1b2c);
      fVar288 = *(float *)(catmullrom_basis0 + lVar131 + 0x1b30);
      fVar289 = *(float *)(catmullrom_basis0 + lVar131 + 0x1f9c);
      fVar228 = *(float *)(catmullrom_basis0 + lVar131 + 0x1fa0);
      fVar173 = *(float *)(catmullrom_basis0 + lVar131 + 0x1fa4);
      fVar290 = *(float *)(catmullrom_basis0 + lVar131 + 0x1fa8);
      fVar291 = *(float *)(catmullrom_basis0 + lVar131 + 0x1fac);
      fVar229 = *(float *)(catmullrom_basis0 + lVar131 + 0x1fb0);
      fVar210 = *(float *)(catmullrom_basis0 + lVar131 + 0x1fb4);
      fVar174 = *(float *)(catmullrom_basis0 + lVar131 + 0x1b34) +
                *(float *)(catmullrom_basis0 + lVar131 + 0x1fb8);
      fVar304 = *(float *)(catmullrom_basis0 + lVar131 + 0x16b0) + fVar174;
      local_480 = fVar175 * fVar326 + fVar248 * fVar244 + fVar211 * fVar266 + fVar317 * fVar289;
      fStack_47c = fVar191 * fStack_3fc + fVar256 * fVar245 + fVar220 * fVar268 + fVar323 * fVar228;
      fStack_478 = fVar195 * fStack_3f8 + fVar259 * fVar247 + fVar222 * fVar285 + fVar324 * fVar173;
      fStack_474 = fVar198 * fStack_3f4 + fVar262 * fVar255 + fVar224 * fVar286 + fVar325 * fVar290;
      fStack_470 = fVar240 * fVar326 + fVar248 * fVar258 + fVar211 * fVar227 + fVar317 * fVar291;
      fStack_46c = fVar242 * fStack_3fc + fVar256 * fVar261 + fVar220 * fVar172 + fVar323 * fVar229;
      fStack_468 = fVar243 * fStack_3f8 + fVar259 * fVar264 + fVar222 * fVar288 + fVar324 * fVar210;
      fStack_464 = *(float *)(catmullrom_basis0 + lVar131 + 0x16b0) +
                   *(float *)(catmullrom_basis0 + lVar131 + 0x1fb8) +
                   auVar295._28_4_ + *(float *)(catmullrom_basis1 + lVar131 + 0xda8);
      auVar164._0_4_ = fVar155 * fVar175 + fVar249 * fVar266 + fVar176 * fVar289 + fVar333 * fVar244
      ;
      auVar164._4_4_ = fVar169 * fVar191 + fVar257 * fVar268 + fVar190 * fVar228 + fVar338 * fVar245
      ;
      auVar164._8_4_ = fVar170 * fVar195 + fVar260 * fVar285 + fVar192 * fVar173 + fVar340 * fVar247
      ;
      auVar164._12_4_ =
           fVar171 * fVar198 + fVar263 * fVar286 + fVar194 * fVar290 + fVar342 * fVar255;
      auVar164._16_4_ =
           fVar155 * fVar240 + fVar249 * fVar227 + fVar176 * fVar291 + fVar333 * fVar258;
      auVar164._20_4_ =
           fVar169 * fVar242 + fVar257 * fVar172 + fVar190 * fVar229 + fVar338 * fVar261;
      auVar164._24_4_ =
           fVar170 * fVar243 + fVar260 * fVar288 + fVar192 * fVar210 + fVar340 * fVar264;
      auVar164._28_4_ =
           fVar174 + auVar295._28_4_ + auVar24._28_4_ +
                     auVar295._28_4_ + *(float *)(catmullrom_basis1 + lVar131 + 0xda8);
      auVar207._0_4_ = fVar334 * fVar244 + fVar344 * fVar266 + fVar246 * fVar289 + fVar287 * fVar175
      ;
      auVar207._4_4_ = fVar339 * fVar245 + fVar347 * fVar268 + fVar265 * fVar228 + fVar305 * fVar191
      ;
      auVar207._8_4_ = fVar341 * fVar247 + fVar348 * fVar285 + fVar267 * fVar173 + fVar312 * fVar195
      ;
      auVar207._12_4_ =
           fVar343 * fVar255 + fVar349 * fVar286 + fVar269 * fVar290 + fVar313 * fVar198;
      auVar207._16_4_ =
           fVar334 * fVar258 + fVar344 * fVar227 + fVar246 * fVar291 + fVar287 * fVar240;
      auVar207._20_4_ =
           fVar339 * fVar261 + fVar347 * fVar172 + fVar265 * fVar229 + fVar305 * fVar242;
      auVar207._24_4_ =
           fVar341 * fVar264 + fVar348 * fVar288 + fVar267 * fVar210 + fVar312 * fVar243;
      auVar207._28_4_ = fVar304 + *(float *)(catmullrom_basis0 + lVar131 + 0x122c);
      fVar175 = *(float *)(catmullrom_basis1 + lVar131 + 0x1b18);
      fVar191 = *(float *)(catmullrom_basis1 + lVar131 + 0x1b1c);
      fVar195 = *(float *)(catmullrom_basis1 + lVar131 + 0x1b20);
      fVar198 = *(float *)(catmullrom_basis1 + lVar131 + 0x1b24);
      fVar240 = *(float *)(catmullrom_basis1 + lVar131 + 0x1b28);
      fVar242 = *(float *)(catmullrom_basis1 + lVar131 + 0x1b2c);
      fVar243 = *(float *)(catmullrom_basis1 + lVar131 + 0x1b30);
      fVar244 = *(float *)(catmullrom_basis1 + lVar131 + 0x1f9c);
      fVar245 = *(float *)(catmullrom_basis1 + lVar131 + 0x1fa0);
      fVar247 = *(float *)(catmullrom_basis1 + lVar131 + 0x1fa4);
      fVar255 = *(float *)(catmullrom_basis1 + lVar131 + 0x1fa8);
      fVar258 = *(float *)(catmullrom_basis1 + lVar131 + 0x1fac);
      fVar261 = *(float *)(catmullrom_basis1 + lVar131 + 0x1fb0);
      fVar264 = *(float *)(catmullrom_basis1 + lVar131 + 0x1fb4);
      fVar332 = fVar304 + fVar325;
      fVar266 = *(float *)(catmullrom_basis1 + lVar131 + 0x1694);
      fVar268 = *(float *)(catmullrom_basis1 + lVar131 + 0x1698);
      fVar285 = *(float *)(catmullrom_basis1 + lVar131 + 0x169c);
      fVar286 = *(float *)(catmullrom_basis1 + lVar131 + 0x16a0);
      fVar227 = *(float *)(catmullrom_basis1 + lVar131 + 0x16a4);
      fVar172 = *(float *)(catmullrom_basis1 + lVar131 + 0x16a8);
      fVar288 = *(float *)(catmullrom_basis1 + lVar131 + 0x16ac);
      fVar289 = *(float *)(catmullrom_basis1 + lVar131 + 0x1210);
      fVar228 = *(float *)(catmullrom_basis1 + lVar131 + 0x1214);
      fVar173 = *(float *)(catmullrom_basis1 + lVar131 + 0x1218);
      fVar290 = *(float *)(catmullrom_basis1 + lVar131 + 0x121c);
      fVar291 = *(float *)(catmullrom_basis1 + lVar131 + 0x1220);
      fVar229 = *(float *)(catmullrom_basis1 + lVar131 + 0x1224);
      fVar210 = *(float *)(catmullrom_basis1 + lVar131 + 0x1228);
      auVar281._0_4_ = fVar326 * fVar289 + fVar248 * fVar266 + fVar211 * fVar175 + fVar317 * fVar244
      ;
      auVar281._4_4_ =
           fStack_3fc * fVar228 + fVar256 * fVar268 + fVar220 * fVar191 + fVar323 * fVar245;
      auVar281._8_4_ =
           fStack_3f8 * fVar173 + fVar259 * fVar285 + fVar222 * fVar195 + fVar324 * fVar247;
      auVar281._12_4_ =
           fStack_3f4 * fVar290 + fVar262 * fVar286 + fVar224 * fVar198 + fVar325 * fVar255;
      auVar281._16_4_ =
           fVar326 * fVar291 + fVar248 * fVar227 + fVar211 * fVar240 + fVar317 * fVar258;
      auVar281._20_4_ =
           fStack_3fc * fVar229 + fVar256 * fVar172 + fVar220 * fVar242 + fVar323 * fVar261;
      auVar281._24_4_ =
           fStack_3f8 * fVar210 + fVar259 * fVar288 + fVar222 * fVar243 + fVar324 * fVar264;
      auVar281._28_4_ = fVar313 + fVar313 + fVar332;
      auVar296._0_4_ = fVar155 * fVar289 + fVar333 * fVar266 + fVar249 * fVar175 + fVar176 * fVar244
      ;
      auVar296._4_4_ = fVar169 * fVar228 + fVar338 * fVar268 + fVar257 * fVar191 + fVar190 * fVar245
      ;
      auVar296._8_4_ = fVar170 * fVar173 + fVar340 * fVar285 + fVar260 * fVar195 + fVar192 * fVar247
      ;
      auVar296._12_4_ =
           fVar171 * fVar290 + fVar342 * fVar286 + fVar263 * fVar198 + fVar194 * fVar255;
      auVar296._16_4_ =
           fVar155 * fVar291 + fVar333 * fVar227 + fVar249 * fVar240 + fVar176 * fVar258;
      auVar296._20_4_ =
           fVar169 * fVar229 + fVar338 * fVar172 + fVar257 * fVar242 + fVar190 * fVar261;
      auVar296._24_4_ =
           fVar170 * fVar210 + fVar340 * fVar288 + fVar260 * fVar243 + fVar192 * fVar264;
      auVar296._28_4_ = fVar313 + fVar313 + fVar313 + fVar304;
      auVar215._0_4_ = fVar287 * fVar289 + fVar334 * fVar266 + fVar344 * fVar175 + fVar246 * fVar244
      ;
      auVar215._4_4_ = fVar305 * fVar228 + fVar339 * fVar268 + fVar347 * fVar191 + fVar265 * fVar245
      ;
      auVar215._8_4_ = fVar312 * fVar173 + fVar341 * fVar285 + fVar348 * fVar195 + fVar267 * fVar247
      ;
      auVar215._12_4_ =
           fVar313 * fVar290 + fVar343 * fVar286 + fVar349 * fVar198 + fVar269 * fVar255;
      auVar215._16_4_ =
           fVar287 * fVar291 + fVar334 * fVar227 + fVar344 * fVar240 + fVar246 * fVar258;
      auVar215._20_4_ =
           fVar305 * fVar229 + fVar339 * fVar172 + fVar347 * fVar242 + fVar265 * fVar261;
      auVar215._24_4_ =
           fVar312 * fVar210 + fVar341 * fVar288 + fVar348 * fVar243 + fVar267 * fVar264;
      auVar215._28_4_ =
           *(float *)(catmullrom_basis1 + lVar131 + 0x122c) +
           *(float *)(catmullrom_basis1 + lVar131 + 0x16b0) +
           *(float *)(catmullrom_basis1 + lVar131 + 0x1b34) +
           *(float *)(catmullrom_basis1 + lVar131 + 0x1fb8);
      auVar186._8_4_ = 0x7fffffff;
      auVar186._0_8_ = 0x7fffffff7fffffff;
      auVar186._12_4_ = 0x7fffffff;
      auVar186._16_4_ = 0x7fffffff;
      auVar186._20_4_ = 0x7fffffff;
      auVar186._24_4_ = 0x7fffffff;
      auVar186._28_4_ = 0x7fffffff;
      auVar115._4_4_ = fStack_47c;
      auVar115._0_4_ = local_480;
      auVar115._8_4_ = fStack_478;
      auVar115._12_4_ = fStack_474;
      auVar115._16_4_ = fStack_470;
      auVar115._20_4_ = fStack_46c;
      auVar115._24_4_ = fStack_468;
      auVar115._28_4_ = fStack_464;
      auVar136 = vandps_avx(auVar115,auVar186);
      auVar21 = vandps_avx(auVar164,auVar186);
      auVar21 = vmaxps_avx(auVar136,auVar21);
      auVar136 = vandps_avx(auVar207,auVar186);
      auVar136 = vmaxps_avx(auVar21,auVar136);
      auVar350 = vpermilps_avx(ZEXT416((uint)fVar189),0);
      auVar277._16_16_ = auVar350;
      auVar277._0_16_ = auVar350;
      auVar136 = vcmpps_avx(auVar136,auVar277,1);
      auVar22 = vblendvps_avx(auVar115,auVar24,auVar136);
      auVar23 = vblendvps_avx(auVar164,auVar25,auVar136);
      auVar136 = vandps_avx(auVar281,auVar186);
      auVar21 = vandps_avx(auVar296,auVar186);
      auVar26 = vmaxps_avx(auVar136,auVar21);
      auVar136 = vandps_avx(auVar215,auVar186);
      auVar136 = vmaxps_avx(auVar26,auVar136);
      auVar26 = vcmpps_avx(auVar136,auVar277,1);
      auVar136 = vblendvps_avx(auVar281,auVar24,auVar26);
      auVar24 = vblendvps_avx(auVar296,auVar25,auVar26);
      fVar304 = auVar22._0_4_;
      fVar300 = auVar22._4_4_;
      fVar301 = auVar22._8_4_;
      fVar302 = auVar22._12_4_;
      fVar303 = auVar22._16_4_;
      fVar230 = auVar22._20_4_;
      fVar154 = auVar22._24_4_;
      fVar212 = auVar136._0_4_;
      fVar221 = auVar136._4_4_;
      fVar223 = auVar136._8_4_;
      fVar225 = auVar136._12_4_;
      fVar226 = auVar136._16_4_;
      fVar155 = auVar136._20_4_;
      fVar169 = auVar136._24_4_;
      fVar175 = auVar23._0_4_;
      fVar198 = auVar23._4_4_;
      fVar244 = auVar23._8_4_;
      fVar258 = auVar23._12_4_;
      fVar268 = auVar23._16_4_;
      fVar172 = auVar23._20_4_;
      fVar173 = auVar23._24_4_;
      auVar140._0_4_ = fVar175 * fVar175 + fVar304 * fVar304;
      auVar140._4_4_ = fVar198 * fVar198 + fVar300 * fVar300;
      auVar140._8_4_ = fVar244 * fVar244 + fVar301 * fVar301;
      auVar140._12_4_ = fVar258 * fVar258 + fVar302 * fVar302;
      auVar140._16_4_ = fVar268 * fVar268 + fVar303 * fVar303;
      auVar140._20_4_ = fVar172 * fVar172 + fVar230 * fVar230;
      auVar140._24_4_ = fVar173 * fVar173 + fVar154 * fVar154;
      auVar140._28_4_ = auVar296._28_4_ + auVar22._28_4_;
      auVar22 = vrsqrtps_avx(auVar140);
      fVar189 = auVar22._0_4_;
      fVar191 = auVar22._4_4_;
      auVar32._4_4_ = fVar191 * 1.5;
      auVar32._0_4_ = fVar189 * 1.5;
      fVar195 = auVar22._8_4_;
      auVar32._8_4_ = fVar195 * 1.5;
      fVar240 = auVar22._12_4_;
      auVar32._12_4_ = fVar240 * 1.5;
      fVar242 = auVar22._16_4_;
      auVar32._16_4_ = fVar242 * 1.5;
      fVar243 = auVar22._20_4_;
      auVar32._20_4_ = fVar243 * 1.5;
      fVar245 = auVar22._24_4_;
      auVar32._24_4_ = fVar245 * 1.5;
      auVar32._28_4_ = auVar21._28_4_;
      auVar33._4_4_ = fVar191 * fVar191 * fVar191 * auVar140._4_4_ * 0.5;
      auVar33._0_4_ = fVar189 * fVar189 * fVar189 * auVar140._0_4_ * 0.5;
      auVar33._8_4_ = fVar195 * fVar195 * fVar195 * auVar140._8_4_ * 0.5;
      auVar33._12_4_ = fVar240 * fVar240 * fVar240 * auVar140._12_4_ * 0.5;
      auVar33._16_4_ = fVar242 * fVar242 * fVar242 * auVar140._16_4_ * 0.5;
      auVar33._20_4_ = fVar243 * fVar243 * fVar243 * auVar140._20_4_ * 0.5;
      auVar33._24_4_ = fVar245 * fVar245 * fVar245 * auVar140._24_4_ * 0.5;
      auVar33._28_4_ = auVar140._28_4_;
      auVar22 = vsubps_avx(auVar32,auVar33);
      fVar189 = auVar22._0_4_;
      fVar240 = auVar22._4_4_;
      fVar245 = auVar22._8_4_;
      fVar261 = auVar22._12_4_;
      fVar285 = auVar22._16_4_;
      fVar288 = auVar22._20_4_;
      fVar290 = auVar22._24_4_;
      fVar210 = auVar23._28_4_;
      fVar191 = auVar24._0_4_;
      fVar242 = auVar24._4_4_;
      fVar247 = auVar24._8_4_;
      fVar264 = auVar24._12_4_;
      fVar286 = auVar24._16_4_;
      fVar289 = auVar24._20_4_;
      fVar291 = auVar24._24_4_;
      auVar141._0_4_ = fVar191 * fVar191 + fVar212 * fVar212;
      auVar141._4_4_ = fVar242 * fVar242 + fVar221 * fVar221;
      auVar141._8_4_ = fVar247 * fVar247 + fVar223 * fVar223;
      auVar141._12_4_ = fVar264 * fVar264 + fVar225 * fVar225;
      auVar141._16_4_ = fVar286 * fVar286 + fVar226 * fVar226;
      auVar141._20_4_ = fVar289 * fVar289 + fVar155 * fVar155;
      auVar141._24_4_ = fVar291 * fVar291 + fVar169 * fVar169;
      auVar141._28_4_ = auVar136._28_4_ + auVar22._28_4_;
      auVar136 = vrsqrtps_avx(auVar141);
      fVar195 = auVar136._0_4_;
      fVar243 = auVar136._4_4_;
      auVar34._4_4_ = fVar243 * 1.5;
      auVar34._0_4_ = fVar195 * 1.5;
      fVar255 = auVar136._8_4_;
      auVar34._8_4_ = fVar255 * 1.5;
      fVar266 = auVar136._12_4_;
      auVar34._12_4_ = fVar266 * 1.5;
      fVar227 = auVar136._16_4_;
      auVar34._16_4_ = fVar227 * 1.5;
      fVar228 = auVar136._20_4_;
      auVar34._20_4_ = fVar228 * 1.5;
      fVar229 = auVar136._24_4_;
      auVar34._24_4_ = fVar229 * 1.5;
      auVar34._28_4_ = auVar21._28_4_;
      fVar174 = auVar136._28_4_;
      auVar35._4_4_ = fVar243 * fVar243 * fVar243 * auVar141._4_4_ * 0.5;
      auVar35._0_4_ = fVar195 * fVar195 * fVar195 * auVar141._0_4_ * 0.5;
      auVar35._8_4_ = fVar255 * fVar255 * fVar255 * auVar141._8_4_ * 0.5;
      auVar35._12_4_ = fVar266 * fVar266 * fVar266 * auVar141._12_4_ * 0.5;
      auVar35._16_4_ = fVar227 * fVar227 * fVar227 * auVar141._16_4_ * 0.5;
      auVar35._20_4_ = fVar228 * fVar228 * fVar228 * auVar141._20_4_ * 0.5;
      auVar35._24_4_ = fVar229 * fVar229 * fVar229 * auVar141._24_4_ * 0.5;
      auVar35._28_4_ = auVar141._28_4_;
      auVar136 = vsubps_avx(auVar34,auVar35);
      fVar195 = auVar136._0_4_;
      fVar243 = auVar136._4_4_;
      fVar255 = auVar136._8_4_;
      fVar266 = auVar136._12_4_;
      fVar227 = auVar136._16_4_;
      fVar228 = auVar136._20_4_;
      fVar229 = auVar136._24_4_;
      fVar175 = fVar133 * fVar175 * fVar189;
      fVar198 = fVar152 * fVar198 * fVar240;
      auVar36._4_4_ = fVar198;
      auVar36._0_4_ = fVar175;
      fVar244 = fVar153 * fVar244 * fVar245;
      auVar36._8_4_ = fVar244;
      fVar258 = fStack_794 * fVar258 * fVar261;
      auVar36._12_4_ = fVar258;
      fVar268 = fStack_790 * fVar268 * fVar285;
      auVar36._16_4_ = fVar268;
      fVar172 = fStack_78c * fVar172 * fVar288;
      auVar36._20_4_ = fVar172;
      fVar173 = fStack_788 * fVar173 * fVar290;
      auVar36._24_4_ = fVar173;
      auVar36._28_4_ = fVar210;
      local_560._4_4_ = auVar295._4_4_ + fVar198;
      local_560._0_4_ = auVar295._0_4_ + fVar175;
      fStack_558 = auVar295._8_4_ + fVar244;
      fStack_554 = auVar295._12_4_ + fVar258;
      fStack_550 = auVar295._16_4_ + fVar268;
      fStack_54c = auVar295._20_4_ + fVar172;
      fStack_548 = auVar295._24_4_ + fVar173;
      fStack_544 = auVar295._28_4_ + fVar210;
      fVar175 = fVar133 * fVar189 * -fVar304;
      fVar198 = fVar152 * fVar240 * -fVar300;
      auVar37._4_4_ = fVar198;
      auVar37._0_4_ = fVar175;
      fVar244 = fVar153 * fVar245 * -fVar301;
      auVar37._8_4_ = fVar244;
      fVar258 = fStack_794 * fVar261 * -fVar302;
      auVar37._12_4_ = fVar258;
      fVar268 = fStack_790 * fVar285 * -fVar303;
      auVar37._16_4_ = fVar268;
      fVar172 = fStack_78c * fVar288 * -fVar230;
      auVar37._20_4_ = fVar172;
      fVar173 = fStack_788 * fVar290 * -fVar154;
      auVar37._24_4_ = fVar173;
      auVar37._28_4_ = 0x3f000000;
      local_500._4_4_ = fVar198 + auVar185._4_4_;
      local_500._0_4_ = fVar175 + auVar185._0_4_;
      fStack_4f8 = fVar244 + auVar185._8_4_;
      fStack_4f4 = fVar258 + auVar185._12_4_;
      fStack_4f0 = fVar268 + auVar185._16_4_;
      fStack_4ec = fVar172 + auVar185._20_4_;
      fStack_4e8 = fVar173 + auVar185._24_4_;
      fStack_4e4 = auVar185._28_4_ + 0.5;
      fVar175 = fVar133 * fVar189 * 0.0;
      fVar189 = fVar152 * fVar240 * 0.0;
      auVar38._4_4_ = fVar189;
      auVar38._0_4_ = fVar175;
      fVar198 = fVar153 * fVar245 * 0.0;
      auVar38._8_4_ = fVar198;
      fVar240 = fStack_794 * fVar261 * 0.0;
      auVar38._12_4_ = fVar240;
      fVar244 = fStack_790 * fVar285 * 0.0;
      auVar38._16_4_ = fVar244;
      fVar245 = fStack_78c * fVar288 * 0.0;
      auVar38._20_4_ = fVar245;
      fVar258 = fStack_788 * fVar290 * 0.0;
      auVar38._24_4_ = fVar258;
      auVar38._28_4_ = fVar332;
      auVar112._4_4_ = fStack_4dc;
      auVar112._0_4_ = local_4e0;
      auVar112._8_4_ = fStack_4d8;
      auVar112._12_4_ = fStack_4d4;
      auVar112._16_4_ = fStack_4d0;
      auVar112._20_4_ = fStack_4cc;
      auVar112._24_4_ = fStack_4c8;
      auVar112._28_4_ = fStack_4c4;
      auVar282._0_4_ = fVar175 + local_4e0;
      auVar282._4_4_ = fVar189 + fStack_4dc;
      auVar282._8_4_ = fVar198 + fStack_4d8;
      auVar282._12_4_ = fVar240 + fStack_4d4;
      auVar282._16_4_ = fVar244 + fStack_4d0;
      auVar282._20_4_ = fVar245 + fStack_4cc;
      auVar282._24_4_ = fVar258 + fStack_4c8;
      auVar282._28_4_ = fVar332 + fStack_4c4;
      fVar175 = local_620._0_4_ * fVar191 * fVar195;
      fVar189 = local_620._4_4_ * fVar242 * fVar243;
      auVar39._4_4_ = fVar189;
      auVar39._0_4_ = fVar175;
      fVar191 = local_620._8_4_ * fVar247 * fVar255;
      auVar39._8_4_ = fVar191;
      fVar198 = local_620._12_4_ * fVar264 * fVar266;
      auVar39._12_4_ = fVar198;
      fVar240 = local_620._16_4_ * fVar286 * fVar227;
      auVar39._16_4_ = fVar240;
      fVar242 = local_620._20_4_ * fVar289 * fVar228;
      auVar39._20_4_ = fVar242;
      fVar244 = local_620._24_4_ * fVar291 * fVar229;
      auVar39._24_4_ = fVar244;
      auVar39._28_4_ = auVar24._28_4_;
      auVar25 = vsubps_avx(auVar295,auVar36);
      auVar308._0_4_ = (float)local_4c0._0_4_ + fVar175;
      auVar308._4_4_ = (float)local_4c0._4_4_ + fVar189;
      auVar308._8_4_ = fStack_4b8 + fVar191;
      auVar308._12_4_ = fStack_4b4 + fVar198;
      auVar308._16_4_ = fStack_4b0 + fVar240;
      auVar308._20_4_ = fStack_4ac + fVar242;
      auVar308._24_4_ = fStack_4a8 + fVar244;
      auVar308._28_4_ = fStack_4a4 + auVar24._28_4_;
      fVar175 = local_620._0_4_ * -fVar212 * fVar195;
      fVar189 = local_620._4_4_ * -fVar221 * fVar243;
      auVar40._4_4_ = fVar189;
      auVar40._0_4_ = fVar175;
      fVar191 = local_620._8_4_ * -fVar223 * fVar255;
      auVar40._8_4_ = fVar191;
      fVar198 = local_620._12_4_ * -fVar225 * fVar266;
      auVar40._12_4_ = fVar198;
      fVar240 = local_620._16_4_ * -fVar226 * fVar227;
      auVar40._16_4_ = fVar240;
      fVar242 = local_620._20_4_ * -fVar155 * fVar228;
      auVar40._20_4_ = fVar242;
      fVar244 = local_620._24_4_ * -fVar169 * fVar229;
      auVar40._24_4_ = fVar244;
      auVar40._28_4_ = fVar210;
      auVar137 = vsubps_avx(auVar185,auVar37);
      auVar337._0_4_ = (float)local_460._0_4_ + fVar175;
      auVar337._4_4_ = (float)local_460._4_4_ + fVar189;
      auVar337._8_4_ = fStack_458 + fVar191;
      auVar337._12_4_ = fStack_454 + fVar198;
      auVar337._16_4_ = fStack_450 + fVar240;
      auVar337._20_4_ = fStack_44c + fVar242;
      auVar337._24_4_ = fStack_448 + fVar244;
      auVar337._28_4_ = fStack_444 + fVar210;
      fVar175 = local_620._0_4_ * fVar195 * 0.0;
      fVar189 = local_620._4_4_ * fVar243 * 0.0;
      auVar41._4_4_ = fVar189;
      auVar41._0_4_ = fVar175;
      fVar191 = local_620._8_4_ * fVar255 * 0.0;
      auVar41._8_4_ = fVar191;
      fVar195 = local_620._12_4_ * fVar266 * 0.0;
      auVar41._12_4_ = fVar195;
      fVar198 = local_620._16_4_ * fVar227 * 0.0;
      auVar41._16_4_ = fVar198;
      fVar240 = local_620._20_4_ * fVar228 * 0.0;
      auVar41._20_4_ = fVar240;
      fVar242 = local_620._24_4_ * fVar229 * 0.0;
      auVar41._24_4_ = fVar242;
      auVar41._28_4_ = fVar174;
      auVar26 = vsubps_avx(auVar112,auVar38);
      auVar117._4_4_ = fStack_35c;
      auVar117._0_4_ = local_360;
      auVar117._8_4_ = fStack_358;
      auVar117._12_4_ = fStack_354;
      auVar117._16_4_ = fStack_350;
      auVar117._20_4_ = fStack_34c;
      auVar117._24_4_ = fStack_348;
      auVar117._28_4_ = fStack_344;
      auVar345._0_4_ = local_360 + fVar175;
      auVar345._4_4_ = fStack_35c + fVar189;
      auVar345._8_4_ = fStack_358 + fVar191;
      auVar345._12_4_ = fStack_354 + fVar195;
      auVar345._16_4_ = fStack_350 + fVar198;
      auVar345._20_4_ = fStack_34c + fVar240;
      auVar345._24_4_ = fStack_348 + fVar242;
      auVar345._28_4_ = fStack_344 + fVar174;
      auVar136 = vsubps_avx(_local_4c0,auVar39);
      auVar21 = vsubps_avx(_local_460,auVar40);
      auVar22 = vsubps_avx(auVar117,auVar41);
      auVar23 = vsubps_avx(auVar337,auVar137);
      auVar24 = vsubps_avx(auVar345,auVar26);
      auVar42._4_4_ = auVar26._4_4_ * auVar23._4_4_;
      auVar42._0_4_ = auVar26._0_4_ * auVar23._0_4_;
      auVar42._8_4_ = auVar26._8_4_ * auVar23._8_4_;
      auVar42._12_4_ = auVar26._12_4_ * auVar23._12_4_;
      auVar42._16_4_ = auVar26._16_4_ * auVar23._16_4_;
      auVar42._20_4_ = auVar26._20_4_ * auVar23._20_4_;
      auVar42._24_4_ = auVar26._24_4_ * auVar23._24_4_;
      auVar42._28_4_ = fVar174;
      auVar43._4_4_ = auVar137._4_4_ * auVar24._4_4_;
      auVar43._0_4_ = auVar137._0_4_ * auVar24._0_4_;
      auVar43._8_4_ = auVar137._8_4_ * auVar24._8_4_;
      auVar43._12_4_ = auVar137._12_4_ * auVar24._12_4_;
      auVar43._16_4_ = auVar137._16_4_ * auVar24._16_4_;
      auVar43._20_4_ = auVar137._20_4_ * auVar24._20_4_;
      auVar43._24_4_ = auVar137._24_4_ * auVar24._24_4_;
      auVar43._28_4_ = fStack_344;
      auVar27 = vsubps_avx(auVar43,auVar42);
      auVar44._4_4_ = auVar25._4_4_ * auVar24._4_4_;
      auVar44._0_4_ = auVar25._0_4_ * auVar24._0_4_;
      auVar44._8_4_ = auVar25._8_4_ * auVar24._8_4_;
      auVar44._12_4_ = auVar25._12_4_ * auVar24._12_4_;
      auVar44._16_4_ = auVar25._16_4_ * auVar24._16_4_;
      auVar44._20_4_ = auVar25._20_4_ * auVar24._20_4_;
      auVar44._24_4_ = auVar25._24_4_ * auVar24._24_4_;
      auVar44._28_4_ = auVar24._28_4_;
      auVar138 = vsubps_avx(auVar308,auVar25);
      auVar45._4_4_ = auVar26._4_4_ * auVar138._4_4_;
      auVar45._0_4_ = auVar26._0_4_ * auVar138._0_4_;
      auVar45._8_4_ = auVar26._8_4_ * auVar138._8_4_;
      auVar45._12_4_ = auVar26._12_4_ * auVar138._12_4_;
      auVar45._16_4_ = auVar26._16_4_ * auVar138._16_4_;
      auVar45._20_4_ = auVar26._20_4_ * auVar138._20_4_;
      auVar45._24_4_ = auVar26._24_4_ * auVar138._24_4_;
      auVar45._28_4_ = fStack_444;
      auVar139 = vsubps_avx(auVar45,auVar44);
      auVar46._4_4_ = auVar137._4_4_ * auVar138._4_4_;
      auVar46._0_4_ = auVar137._0_4_ * auVar138._0_4_;
      auVar46._8_4_ = auVar137._8_4_ * auVar138._8_4_;
      auVar46._12_4_ = auVar137._12_4_ * auVar138._12_4_;
      auVar46._16_4_ = auVar137._16_4_ * auVar138._16_4_;
      auVar46._20_4_ = auVar137._20_4_ * auVar138._20_4_;
      auVar46._24_4_ = auVar137._24_4_ * auVar138._24_4_;
      auVar46._28_4_ = auVar24._28_4_;
      auVar47._4_4_ = auVar25._4_4_ * auVar23._4_4_;
      auVar47._0_4_ = auVar25._0_4_ * auVar23._0_4_;
      auVar47._8_4_ = auVar25._8_4_ * auVar23._8_4_;
      auVar47._12_4_ = auVar25._12_4_ * auVar23._12_4_;
      auVar47._16_4_ = auVar25._16_4_ * auVar23._16_4_;
      auVar47._20_4_ = auVar25._20_4_ * auVar23._20_4_;
      auVar47._24_4_ = auVar25._24_4_ * auVar23._24_4_;
      auVar47._28_4_ = auVar23._28_4_;
      auVar23 = vsubps_avx(auVar47,auVar46);
      auVar142._0_4_ = auVar27._0_4_ * 0.0 + auVar23._0_4_ + auVar139._0_4_ * 0.0;
      auVar142._4_4_ = auVar27._4_4_ * 0.0 + auVar23._4_4_ + auVar139._4_4_ * 0.0;
      auVar142._8_4_ = auVar27._8_4_ * 0.0 + auVar23._8_4_ + auVar139._8_4_ * 0.0;
      auVar142._12_4_ = auVar27._12_4_ * 0.0 + auVar23._12_4_ + auVar139._12_4_ * 0.0;
      auVar142._16_4_ = auVar27._16_4_ * 0.0 + auVar23._16_4_ + auVar139._16_4_ * 0.0;
      auVar142._20_4_ = auVar27._20_4_ * 0.0 + auVar23._20_4_ + auVar139._20_4_ * 0.0;
      auVar142._24_4_ = auVar27._24_4_ * 0.0 + auVar23._24_4_ + auVar139._24_4_ * 0.0;
      auVar142._28_4_ = auVar23._28_4_ + auVar23._28_4_ + auVar139._28_4_;
      auVar27 = vcmpps_avx(auVar142,ZEXT832(0) << 0x20,2);
      auVar209 = ZEXT3264(auVar27);
      local_660 = vblendvps_avx(auVar136,_local_560,auVar27);
      local_440 = vblendvps_avx(auVar21,_local_500,auVar27);
      auVar136 = vblendvps_avx(auVar22,auVar282,auVar27);
      auVar21 = vblendvps_avx(auVar25,auVar308,auVar27);
      auVar22 = vblendvps_avx(auVar137,auVar337,auVar27);
      auVar23 = vblendvps_avx(auVar26,auVar345,auVar27);
      auVar24 = vblendvps_avx(auVar308,auVar25,auVar27);
      auVar25 = vblendvps_avx(auVar337,auVar137,auVar27);
      auVar350 = vpackssdw_avx(local_340._0_16_,local_340._16_16_);
      auVar26 = vblendvps_avx(auVar345,auVar26,auVar27);
      auVar24 = vsubps_avx(auVar24,local_660);
      auVar25 = vsubps_avx(auVar25,local_440);
      auVar26 = vsubps_avx(auVar26,auVar136);
      auVar138 = vsubps_avx(local_440,auVar22);
      fVar175 = auVar25._0_4_;
      fVar230 = auVar136._0_4_;
      fVar240 = auVar25._4_4_;
      fVar154 = auVar136._4_4_;
      auVar48._4_4_ = fVar154 * fVar240;
      auVar48._0_4_ = fVar230 * fVar175;
      fVar247 = auVar25._8_4_;
      fVar212 = auVar136._8_4_;
      auVar48._8_4_ = fVar212 * fVar247;
      fVar266 = auVar25._12_4_;
      fVar221 = auVar136._12_4_;
      auVar48._12_4_ = fVar221 * fVar266;
      fVar172 = auVar25._16_4_;
      fVar223 = auVar136._16_4_;
      auVar48._16_4_ = fVar223 * fVar172;
      fVar290 = auVar25._20_4_;
      fVar225 = auVar136._20_4_;
      auVar48._20_4_ = fVar225 * fVar290;
      fVar304 = auVar25._24_4_;
      fVar226 = auVar136._24_4_;
      auVar48._24_4_ = fVar226 * fVar304;
      auVar48._28_4_ = local_340._28_4_;
      fVar189 = local_440._0_4_;
      fVar224 = auVar26._0_4_;
      fVar242 = local_440._4_4_;
      fVar246 = auVar26._4_4_;
      auVar49._4_4_ = fVar246 * fVar242;
      auVar49._0_4_ = fVar224 * fVar189;
      fVar255 = local_440._8_4_;
      fVar248 = auVar26._8_4_;
      auVar49._8_4_ = fVar248 * fVar255;
      fVar268 = local_440._12_4_;
      fVar256 = auVar26._12_4_;
      auVar49._12_4_ = fVar256 * fVar268;
      fVar288 = local_440._16_4_;
      fVar259 = auVar26._16_4_;
      auVar49._16_4_ = fVar259 * fVar288;
      fVar291 = local_440._20_4_;
      fVar262 = auVar26._20_4_;
      auVar49._20_4_ = fVar262 * fVar291;
      fVar300 = local_440._24_4_;
      fVar249 = auVar26._24_4_;
      uVar130 = auVar137._28_4_;
      auVar49._24_4_ = fVar249 * fVar300;
      auVar49._28_4_ = uVar130;
      auVar137 = vsubps_avx(auVar49,auVar48);
      fVar191 = local_660._0_4_;
      fVar243 = local_660._4_4_;
      auVar50._4_4_ = fVar246 * fVar243;
      auVar50._0_4_ = fVar224 * fVar191;
      fVar258 = local_660._8_4_;
      auVar50._8_4_ = fVar248 * fVar258;
      fVar285 = local_660._12_4_;
      auVar50._12_4_ = fVar256 * fVar285;
      fVar289 = local_660._16_4_;
      auVar50._16_4_ = fVar259 * fVar289;
      fVar229 = local_660._20_4_;
      auVar50._20_4_ = fVar262 * fVar229;
      fVar301 = local_660._24_4_;
      auVar50._24_4_ = fVar249 * fVar301;
      auVar50._28_4_ = uVar130;
      fVar195 = auVar24._0_4_;
      fVar244 = auVar24._4_4_;
      auVar51._4_4_ = fVar154 * fVar244;
      auVar51._0_4_ = fVar230 * fVar195;
      fVar261 = auVar24._8_4_;
      auVar51._8_4_ = fVar212 * fVar261;
      fVar286 = auVar24._12_4_;
      auVar51._12_4_ = fVar221 * fVar286;
      fVar228 = auVar24._16_4_;
      auVar51._16_4_ = fVar223 * fVar228;
      fVar210 = auVar24._20_4_;
      auVar51._20_4_ = fVar225 * fVar210;
      fVar302 = auVar24._24_4_;
      auVar51._24_4_ = fVar226 * fVar302;
      auVar51._28_4_ = auVar337._28_4_;
      auVar139 = vsubps_avx(auVar51,auVar50);
      auVar52._4_4_ = fVar242 * fVar244;
      auVar52._0_4_ = fVar189 * fVar195;
      auVar52._8_4_ = fVar255 * fVar261;
      auVar52._12_4_ = fVar268 * fVar286;
      auVar52._16_4_ = fVar288 * fVar228;
      auVar52._20_4_ = fVar291 * fVar210;
      auVar52._24_4_ = fVar300 * fVar302;
      auVar52._28_4_ = uVar130;
      auVar53._4_4_ = fVar243 * fVar240;
      auVar53._0_4_ = fVar191 * fVar175;
      auVar53._8_4_ = fVar258 * fVar247;
      auVar53._12_4_ = fVar285 * fVar266;
      auVar53._16_4_ = fVar289 * fVar172;
      auVar53._20_4_ = fVar229 * fVar290;
      auVar53._24_4_ = fVar301 * fVar304;
      auVar53._28_4_ = auVar345._28_4_;
      auVar160 = vsubps_avx(auVar53,auVar52);
      auVar161 = vsubps_avx(auVar136,auVar23);
      fVar198 = auVar160._28_4_ + auVar139._28_4_;
      auVar216._0_4_ = auVar160._0_4_ + auVar139._0_4_ * 0.0 + auVar137._0_4_ * 0.0;
      auVar216._4_4_ = auVar160._4_4_ + auVar139._4_4_ * 0.0 + auVar137._4_4_ * 0.0;
      auVar216._8_4_ = auVar160._8_4_ + auVar139._8_4_ * 0.0 + auVar137._8_4_ * 0.0;
      auVar216._12_4_ = auVar160._12_4_ + auVar139._12_4_ * 0.0 + auVar137._12_4_ * 0.0;
      auVar216._16_4_ = auVar160._16_4_ + auVar139._16_4_ * 0.0 + auVar137._16_4_ * 0.0;
      auVar216._20_4_ = auVar160._20_4_ + auVar139._20_4_ * 0.0 + auVar137._20_4_ * 0.0;
      auVar216._24_4_ = auVar160._24_4_ + auVar139._24_4_ * 0.0 + auVar137._24_4_ * 0.0;
      auVar216._28_4_ = fVar198 + 0.0;
      fVar155 = auVar138._0_4_;
      fVar169 = auVar138._4_4_;
      auVar54._4_4_ = fVar169 * auVar23._4_4_;
      auVar54._0_4_ = fVar155 * auVar23._0_4_;
      fVar170 = auVar138._8_4_;
      auVar54._8_4_ = fVar170 * auVar23._8_4_;
      fVar171 = auVar138._12_4_;
      auVar54._12_4_ = fVar171 * auVar23._12_4_;
      fVar211 = auVar138._16_4_;
      auVar54._16_4_ = fVar211 * auVar23._16_4_;
      fVar220 = auVar138._20_4_;
      auVar54._20_4_ = fVar220 * auVar23._20_4_;
      fVar222 = auVar138._24_4_;
      auVar54._24_4_ = fVar222 * auVar23._24_4_;
      auVar54._28_4_ = fVar198;
      fVar198 = auVar161._0_4_;
      fVar245 = auVar161._4_4_;
      auVar55._4_4_ = auVar22._4_4_ * fVar245;
      auVar55._0_4_ = auVar22._0_4_ * fVar198;
      fVar264 = auVar161._8_4_;
      auVar55._8_4_ = auVar22._8_4_ * fVar264;
      fVar227 = auVar161._12_4_;
      auVar55._12_4_ = auVar22._12_4_ * fVar227;
      fVar173 = auVar161._16_4_;
      auVar55._16_4_ = auVar22._16_4_ * fVar173;
      fVar174 = auVar161._20_4_;
      auVar55._20_4_ = auVar22._20_4_ * fVar174;
      fVar303 = auVar161._24_4_;
      auVar55._24_4_ = auVar22._24_4_ * fVar303;
      auVar55._28_4_ = auVar160._28_4_;
      auVar136 = vsubps_avx(auVar55,auVar54);
      auVar137 = vsubps_avx(local_660,auVar21);
      fVar257 = auVar137._0_4_;
      fVar260 = auVar137._4_4_;
      auVar56._4_4_ = fVar260 * auVar23._4_4_;
      auVar56._0_4_ = fVar257 * auVar23._0_4_;
      fVar263 = auVar137._8_4_;
      auVar56._8_4_ = fVar263 * auVar23._8_4_;
      fVar265 = auVar137._12_4_;
      auVar56._12_4_ = fVar265 * auVar23._12_4_;
      fVar267 = auVar137._16_4_;
      auVar56._16_4_ = fVar267 * auVar23._16_4_;
      fVar269 = auVar137._20_4_;
      auVar56._20_4_ = fVar269 * auVar23._20_4_;
      fVar287 = auVar137._24_4_;
      auVar56._24_4_ = fVar287 * auVar23._24_4_;
      auVar56._28_4_ = auVar23._28_4_;
      auVar57._4_4_ = auVar21._4_4_ * fVar245;
      auVar57._0_4_ = auVar21._0_4_ * fVar198;
      auVar57._8_4_ = auVar21._8_4_ * fVar264;
      auVar57._12_4_ = auVar21._12_4_ * fVar227;
      auVar57._16_4_ = auVar21._16_4_ * fVar173;
      auVar57._20_4_ = auVar21._20_4_ * fVar174;
      auVar57._24_4_ = auVar21._24_4_ * fVar303;
      auVar57._28_4_ = 0;
      auVar137 = vsubps_avx(auVar56,auVar57);
      auVar58._4_4_ = auVar22._4_4_ * fVar260;
      auVar58._0_4_ = auVar22._0_4_ * fVar257;
      auVar58._8_4_ = auVar22._8_4_ * fVar263;
      auVar58._12_4_ = auVar22._12_4_ * fVar265;
      auVar58._16_4_ = auVar22._16_4_ * fVar267;
      auVar58._20_4_ = auVar22._20_4_ * fVar269;
      auVar58._24_4_ = auVar22._24_4_ * fVar287;
      auVar58._28_4_ = auVar23._28_4_;
      auVar59._4_4_ = auVar21._4_4_ * fVar169;
      auVar59._0_4_ = auVar21._0_4_ * fVar155;
      auVar59._8_4_ = auVar21._8_4_ * fVar170;
      auVar59._12_4_ = auVar21._12_4_ * fVar171;
      auVar59._16_4_ = auVar21._16_4_ * fVar211;
      auVar59._20_4_ = auVar21._20_4_ * fVar220;
      auVar59._24_4_ = auVar21._24_4_ * fVar222;
      auVar59._28_4_ = auVar21._28_4_;
      auVar21 = vsubps_avx(auVar59,auVar58);
      auVar187._0_4_ = auVar136._0_4_ * 0.0 + auVar21._0_4_ + auVar137._0_4_ * 0.0;
      auVar187._4_4_ = auVar136._4_4_ * 0.0 + auVar21._4_4_ + auVar137._4_4_ * 0.0;
      auVar187._8_4_ = auVar136._8_4_ * 0.0 + auVar21._8_4_ + auVar137._8_4_ * 0.0;
      auVar187._12_4_ = auVar136._12_4_ * 0.0 + auVar21._12_4_ + auVar137._12_4_ * 0.0;
      auVar187._16_4_ = auVar136._16_4_ * 0.0 + auVar21._16_4_ + auVar137._16_4_ * 0.0;
      auVar187._20_4_ = auVar136._20_4_ * 0.0 + auVar21._20_4_ + auVar137._20_4_ * 0.0;
      auVar187._24_4_ = auVar136._24_4_ * 0.0 + auVar21._24_4_ + auVar137._24_4_ * 0.0;
      auVar187._28_4_ = auVar21._28_4_ + auVar21._28_4_ + auVar137._28_4_;
      auVar136 = vmaxps_avx(auVar216,auVar187);
      auVar136 = vcmpps_avx(auVar136,ZEXT832(0) << 0x20,2);
      auVar201 = vpackssdw_avx(auVar136._0_16_,auVar136._16_16_);
      auVar350 = vpand_avx(auVar350,auVar201);
      auVar201 = vpmovsxwd_avx(auVar350);
      auVar196 = vpunpckhwd_avx(auVar350,auVar350);
      auVar143._16_16_ = auVar196;
      auVar143._0_16_ = auVar201;
      if ((((((((auVar143 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar143 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar143 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar143 >> 0x7f,0) == '\0') &&
            (auVar143 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB161(auVar196 >> 0x3f,0) == '\0') &&
          (auVar143 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar196[0xf]
         ) {
LAB_00a1405d:
        auVar299 = ZEXT3264(auVar294);
        auVar284 = ZEXT3264(auVar280);
        auVar168 = ZEXT3264(CONCAT824(uStack_488,
                                      CONCAT816(uStack_490,CONCAT88(uStack_498,local_4a0))));
      }
      else {
        auVar60._4_4_ = fVar245 * fVar240;
        auVar60._0_4_ = fVar198 * fVar175;
        auVar60._8_4_ = fVar264 * fVar247;
        auVar60._12_4_ = fVar227 * fVar266;
        auVar60._16_4_ = fVar173 * fVar172;
        auVar60._20_4_ = fVar174 * fVar290;
        auVar60._24_4_ = fVar303 * fVar304;
        auVar60._28_4_ = auVar196._12_4_;
        auVar319._0_4_ = fVar155 * fVar224;
        auVar319._4_4_ = fVar169 * fVar246;
        auVar319._8_4_ = fVar170 * fVar248;
        auVar319._12_4_ = fVar171 * fVar256;
        auVar319._16_4_ = fVar211 * fVar259;
        auVar319._20_4_ = fVar220 * fVar262;
        auVar319._24_4_ = fVar222 * fVar249;
        auVar319._28_4_ = 0;
        auVar21 = vsubps_avx(auVar319,auVar60);
        auVar61._4_4_ = fVar260 * fVar246;
        auVar61._0_4_ = fVar257 * fVar224;
        auVar61._8_4_ = fVar263 * fVar248;
        auVar61._12_4_ = fVar265 * fVar256;
        auVar61._16_4_ = fVar267 * fVar259;
        auVar61._20_4_ = fVar269 * fVar262;
        auVar61._24_4_ = fVar287 * fVar249;
        auVar61._28_4_ = auVar26._28_4_;
        auVar62._4_4_ = fVar245 * fVar244;
        auVar62._0_4_ = fVar198 * fVar195;
        auVar62._8_4_ = fVar264 * fVar261;
        auVar62._12_4_ = fVar227 * fVar286;
        auVar62._16_4_ = fVar173 * fVar228;
        auVar62._20_4_ = fVar174 * fVar210;
        auVar62._24_4_ = fVar303 * fVar302;
        auVar62._28_4_ = auVar161._28_4_;
        auVar22 = vsubps_avx(auVar62,auVar61);
        auVar63._4_4_ = fVar169 * fVar244;
        auVar63._0_4_ = fVar155 * fVar195;
        auVar63._8_4_ = fVar170 * fVar261;
        auVar63._12_4_ = fVar171 * fVar286;
        auVar63._16_4_ = fVar211 * fVar228;
        auVar63._20_4_ = fVar220 * fVar210;
        auVar63._24_4_ = fVar222 * fVar302;
        auVar63._28_4_ = auVar24._28_4_;
        auVar64._4_4_ = fVar260 * fVar240;
        auVar64._0_4_ = fVar257 * fVar175;
        auVar64._8_4_ = fVar263 * fVar247;
        auVar64._12_4_ = fVar265 * fVar266;
        auVar64._16_4_ = fVar267 * fVar172;
        auVar64._20_4_ = fVar269 * fVar290;
        auVar64._24_4_ = fVar287 * fVar304;
        auVar64._28_4_ = auVar25._28_4_;
        auVar23 = vsubps_avx(auVar64,auVar63);
        auVar278._0_4_ = auVar21._0_4_ * 0.0 + auVar23._0_4_ + auVar22._0_4_ * 0.0;
        auVar278._4_4_ = auVar21._4_4_ * 0.0 + auVar23._4_4_ + auVar22._4_4_ * 0.0;
        auVar278._8_4_ = auVar21._8_4_ * 0.0 + auVar23._8_4_ + auVar22._8_4_ * 0.0;
        auVar278._12_4_ = auVar21._12_4_ * 0.0 + auVar23._12_4_ + auVar22._12_4_ * 0.0;
        auVar278._16_4_ = auVar21._16_4_ * 0.0 + auVar23._16_4_ + auVar22._16_4_ * 0.0;
        auVar278._20_4_ = auVar21._20_4_ * 0.0 + auVar23._20_4_ + auVar22._20_4_ * 0.0;
        auVar278._24_4_ = auVar21._24_4_ * 0.0 + auVar23._24_4_ + auVar22._24_4_ * 0.0;
        auVar278._28_4_ = auVar25._28_4_ + auVar23._28_4_ + auVar24._28_4_;
        auVar136 = vrcpps_avx(auVar278);
        fVar195 = auVar136._0_4_;
        fVar198 = auVar136._4_4_;
        auVar65._4_4_ = auVar278._4_4_ * fVar198;
        auVar65._0_4_ = auVar278._0_4_ * fVar195;
        fVar240 = auVar136._8_4_;
        auVar65._8_4_ = auVar278._8_4_ * fVar240;
        fVar244 = auVar136._12_4_;
        auVar65._12_4_ = auVar278._12_4_ * fVar244;
        fVar245 = auVar136._16_4_;
        auVar65._16_4_ = auVar278._16_4_ * fVar245;
        fVar247 = auVar136._20_4_;
        auVar65._20_4_ = auVar278._20_4_ * fVar247;
        fVar261 = auVar136._24_4_;
        auVar65._24_4_ = auVar278._24_4_ * fVar261;
        auVar65._28_4_ = auVar161._28_4_;
        auVar320._8_4_ = 0x3f800000;
        auVar320._0_8_ = 0x3f8000003f800000;
        auVar320._12_4_ = 0x3f800000;
        auVar320._16_4_ = 0x3f800000;
        auVar320._20_4_ = 0x3f800000;
        auVar320._24_4_ = 0x3f800000;
        auVar320._28_4_ = 0x3f800000;
        auVar136 = vsubps_avx(auVar320,auVar65);
        fVar195 = auVar136._0_4_ * fVar195 + fVar195;
        fVar198 = auVar136._4_4_ * fVar198 + fVar198;
        fVar240 = auVar136._8_4_ * fVar240 + fVar240;
        fVar244 = auVar136._12_4_ * fVar244 + fVar244;
        fVar245 = auVar136._16_4_ * fVar245 + fVar245;
        fVar247 = auVar136._20_4_ * fVar247 + fVar247;
        fVar261 = auVar136._24_4_ * fVar261 + fVar261;
        auVar165._0_4_ =
             (auVar21._0_4_ * fVar191 + auVar22._0_4_ * fVar189 + auVar23._0_4_ * fVar230) * fVar195
        ;
        auVar165._4_4_ =
             (auVar21._4_4_ * fVar243 + auVar22._4_4_ * fVar242 + auVar23._4_4_ * fVar154) * fVar198
        ;
        auVar165._8_4_ =
             (auVar21._8_4_ * fVar258 + auVar22._8_4_ * fVar255 + auVar23._8_4_ * fVar212) * fVar240
        ;
        auVar165._12_4_ =
             (auVar21._12_4_ * fVar285 + auVar22._12_4_ * fVar268 + auVar23._12_4_ * fVar221) *
             fVar244;
        auVar165._16_4_ =
             (auVar21._16_4_ * fVar289 + auVar22._16_4_ * fVar288 + auVar23._16_4_ * fVar223) *
             fVar245;
        auVar165._20_4_ =
             (auVar21._20_4_ * fVar229 + auVar22._20_4_ * fVar291 + auVar23._20_4_ * fVar225) *
             fVar247;
        auVar165._24_4_ =
             (auVar21._24_4_ * fVar301 + auVar22._24_4_ * fVar300 + auVar23._24_4_ * fVar226) *
             fVar261;
        auVar165._28_4_ = 0;
        auVar144._16_16_ = auVar9;
        auVar144._0_16_ = auVar9;
        auVar136 = vcmpps_avx(auVar144,auVar165,2);
        fVar175 = ray->tfar;
        auVar217._4_4_ = fVar175;
        auVar217._0_4_ = fVar175;
        auVar217._8_4_ = fVar175;
        auVar217._12_4_ = fVar175;
        auVar217._16_4_ = fVar175;
        auVar217._20_4_ = fVar175;
        auVar217._24_4_ = fVar175;
        auVar217._28_4_ = fVar175;
        auVar21 = vcmpps_avx(auVar165,auVar217,2);
        auVar136 = vandps_avx(auVar21,auVar136);
        auVar201 = vpackssdw_avx(auVar136._0_16_,auVar136._16_16_);
        auVar350 = vpand_avx(auVar350,auVar201);
        auVar201 = vpmovsxwd_avx(auVar350);
        auVar196 = vpshufd_avx(auVar350,0xee);
        auVar196 = vpmovsxwd_avx(auVar196);
        auVar145._16_16_ = auVar196;
        auVar145._0_16_ = auVar201;
        if ((((((((auVar145 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar145 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar145 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar145 >> 0x7f,0) == '\0') &&
              (auVar145 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar196 >> 0x3f,0) == '\0') &&
            (auVar145 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar196[0xf]) goto LAB_00a1405d;
        auVar136 = vcmpps_avx(ZEXT832(0) << 0x20,auVar278,4);
        auVar201 = vpackssdw_avx(auVar136._0_16_,auVar136._16_16_);
        auVar350 = vpand_avx(auVar350,auVar201);
        auVar201 = vpmovsxwd_avx(auVar350);
        auVar350 = vpunpckhwd_avx(auVar350,auVar350);
        auVar238._16_16_ = auVar350;
        auVar238._0_16_ = auVar201;
        auVar168 = ZEXT3264(CONCAT824(uStack_488,
                                      CONCAT816(uStack_490,CONCAT88(uStack_498,local_4a0))));
        auVar284 = ZEXT3264(auVar280);
        auVar299 = ZEXT3264(auVar294);
        if ((((((((auVar238 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar238 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar238 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar238 >> 0x7f,0) != '\0') ||
              (auVar238 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB161(auVar350 >> 0x3f,0) != '\0') ||
            (auVar238 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar350[0xf] < '\0') {
          auVar146._0_4_ = auVar216._0_4_ * fVar195;
          auVar146._4_4_ = auVar216._4_4_ * fVar198;
          auVar146._8_4_ = auVar216._8_4_ * fVar240;
          auVar146._12_4_ = auVar216._12_4_ * fVar244;
          auVar146._16_4_ = auVar216._16_4_ * fVar245;
          auVar146._20_4_ = auVar216._20_4_ * fVar247;
          auVar146._24_4_ = auVar216._24_4_ * fVar261;
          auVar146._28_4_ = 0;
          auVar66._4_4_ = auVar187._4_4_ * fVar198;
          auVar66._0_4_ = auVar187._0_4_ * fVar195;
          auVar66._8_4_ = auVar187._8_4_ * fVar240;
          auVar66._12_4_ = auVar187._12_4_ * fVar244;
          auVar66._16_4_ = auVar187._16_4_ * fVar245;
          auVar66._20_4_ = auVar187._20_4_ * fVar247;
          auVar66._24_4_ = auVar187._24_4_ * fVar261;
          auVar66._28_4_ = auVar187._28_4_;
          auVar252._8_4_ = 0x3f800000;
          auVar252._0_8_ = 0x3f8000003f800000;
          auVar252._12_4_ = 0x3f800000;
          auVar252._16_4_ = 0x3f800000;
          auVar252._20_4_ = 0x3f800000;
          auVar252._24_4_ = 0x3f800000;
          auVar252._28_4_ = 0x3f800000;
          auVar136 = vsubps_avx(auVar252,auVar146);
          auVar136 = vblendvps_avx(auVar136,auVar146,auVar27);
          auVar284 = ZEXT3264(auVar136);
          auVar136 = vsubps_avx(auVar252,auVar66);
          _local_380 = vblendvps_avx(auVar136,auVar66,auVar27);
          auVar168 = ZEXT3264(auVar238);
          auVar299 = ZEXT3264(auVar165);
        }
      }
      auVar331 = ZEXT3264(_local_6e0);
      auVar279 = ZEXT3264(local_580);
      auVar136 = auVar168._0_32_;
      if ((((((((auVar136 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar136 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar136 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar136 >> 0x7f,0) == '\0') &&
            (auVar168 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
           SUB321(auVar136 >> 0xbf,0) == '\0') &&
          (auVar168 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
          -1 < auVar168[0x1f]) {
        uVar126 = 0;
      }
      else {
        auVar280 = vsubps_avx(local_620,_local_7a0);
        fVar133 = fVar133 + auVar284._0_4_ * auVar280._0_4_;
        fVar152 = fVar152 + auVar284._4_4_ * auVar280._4_4_;
        fVar153 = fVar153 + auVar284._8_4_ * auVar280._8_4_;
        fVar189 = fStack_794 + auVar284._12_4_ * auVar280._12_4_;
        fVar191 = fStack_790 + auVar284._16_4_ * auVar280._16_4_;
        fVar195 = fStack_78c + auVar284._20_4_ * auVar280._20_4_;
        fVar198 = fStack_788 + auVar284._24_4_ * auVar280._24_4_;
        fVar240 = auVar280._28_4_ + 0.0;
        fVar175 = local_728->depth_scale;
        auVar67._4_4_ = (fVar152 + fVar152) * fVar175;
        auVar67._0_4_ = (fVar133 + fVar133) * fVar175;
        auVar67._8_4_ = (fVar153 + fVar153) * fVar175;
        auVar67._12_4_ = (fVar189 + fVar189) * fVar175;
        auVar67._16_4_ = (fVar191 + fVar191) * fVar175;
        auVar67._20_4_ = (fVar195 + fVar195) * fVar175;
        auVar67._24_4_ = (fVar198 + fVar198) * fVar175;
        auVar67._28_4_ = fVar240 + fVar240;
        local_280 = auVar299._0_32_;
        auVar280 = vcmpps_avx(local_280,auVar67,6);
        auVar294 = auVar136 & auVar280;
        if ((((((((auVar294 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar294 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar294 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar294 >> 0x7f,0) == '\0') &&
              (auVar294 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar294 >> 0xbf,0) == '\0') &&
            (auVar294 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar294[0x1f]) {
LAB_00a12da9:
          _local_600 = auVar9;
          _local_5e0 = auVar10;
          _local_770 = auVar13;
          _local_780 = auVar12;
          uVar126 = 0;
          auVar12 = _local_780;
          auVar13 = _local_770;
          auVar10 = _local_5e0;
          auVar9 = _local_600;
        }
        else {
          auVar209 = ZEXT3264(_local_540);
          local_200 = vandps_avx(auVar280,auVar136);
          local_2a0._0_4_ = (float)local_380._0_4_ + (float)local_380._0_4_ + -1.0;
          local_2a0._4_4_ = (float)local_380._4_4_ + (float)local_380._4_4_ + -1.0;
          fStack_298 = (float)uStack_378 + (float)uStack_378 + -1.0;
          fStack_294 = uStack_378._4_4_ + uStack_378._4_4_ + -1.0;
          fStack_290 = (float)uStack_370 + (float)uStack_370 + -1.0;
          fStack_28c = uStack_370._4_4_ + uStack_370._4_4_ + -1.0;
          fStack_288 = (float)uStack_368 + (float)uStack_368 + -1.0;
          fStack_284 = uStack_368._4_4_ + uStack_368._4_4_ + -1.0;
          local_2c0 = auVar284._0_32_;
          local_260 = 0;
          local_25c = uVar123;
          local_250 = local_780;
          uStack_248 = local_780._8_8_;
          local_240 = local_5e0;
          uStack_238 = local_5e0._8_8_;
          local_230 = local_770;
          uStack_228 = local_770._8_8_;
          local_380._4_4_ = local_2a0._4_4_;
          local_380._0_4_ = local_2a0._0_4_;
          uStack_378._0_4_ = fStack_298;
          uStack_378._4_4_ = fStack_294;
          uStack_370._0_4_ = fStack_290;
          uStack_370._4_4_ = fStack_28c;
          auVar159 = _local_380;
          uStack_368._0_4_ = fStack_288;
          uStack_368._4_4_ = fStack_284;
          auVar136 = _local_380;
          if ((pGVar18->mask & ray->mask) == 0) {
            uVar126 = 0;
          }
          else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                  (uVar126 = CONCAT71((int7)(uVar126 >> 8),1),
                  pGVar18->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
            auVar179._0_4_ = 1.0 / auVar234._0_4_;
            auVar179._4_12_ = SUB6012((undefined1  [60])0x0,0);
            auVar350 = vshufps_avx(auVar179,auVar179,0);
            local_1e0[0] = auVar350._0_4_ * (auVar284._0_4_ + 0.0);
            local_1e0[1] = auVar350._4_4_ * (auVar284._4_4_ + 1.0);
            local_1e0[2] = auVar350._8_4_ * (auVar284._8_4_ + 2.0);
            local_1e0[3] = auVar350._12_4_ * (auVar284._12_4_ + 3.0);
            fStack_1d0 = auVar350._0_4_ * (auVar284._16_4_ + 4.0);
            fStack_1cc = auVar350._4_4_ * (auVar284._20_4_ + 5.0);
            fStack_1c8 = auVar350._8_4_ * (auVar284._24_4_ + 6.0);
            fStack_1c4 = auVar284._28_4_ + 7.0;
            uStack_370 = auVar159._16_8_;
            uStack_368 = auVar136._24_8_;
            local_1c0 = local_380;
            uStack_1b8 = uStack_378;
            uStack_1b0 = uStack_370;
            uStack_1a8 = uStack_368;
            local_1a0 = local_280;
            uVar130 = vmovmskps_avx(local_200);
            uVar129 = CONCAT44((int)((ulong)context->args >> 0x20),uVar130);
            lVar128 = 0;
            if (uVar129 != 0) {
              for (; (uVar129 >> lVar128 & 1) == 0; lVar128 = lVar128 + 1) {
              }
            }
            local_700 = auVar284._0_32_;
            local_720 = local_280;
            fVar175 = (float)local_770._0_4_;
            fVar189 = (float)local_770._4_4_;
            fVar191 = (float)uStack_768;
            fVar195 = uStack_768._4_4_;
            fVar198 = (float)local_780._0_4_;
            fVar240 = (float)local_780._4_4_;
            fVar242 = (float)uStack_778;
            fVar243 = uStack_778._4_4_;
            fVar244 = (float)local_5e0._0_4_;
            fVar245 = (float)local_5e0._4_4_;
            fVar247 = (float)uStack_5d8;
            fVar255 = uStack_5d8._4_4_;
            _local_780 = auVar12;
            _local_770 = auVar13;
            _local_5e0 = auVar10;
            _local_380 = auVar136;
            _local_320 = auVar20;
            while (auVar12 = _local_780, auVar13 = _local_770, auVar10 = _local_5e0,
                  auVar9 = _local_600, uVar129 != 0) {
              local_7a0 = (undefined1  [8])uVar129;
              local_5b4 = local_1e0[lVar128];
              local_5b0 = *(undefined4 *)((long)&local_1c0 + lVar128 * 4);
              local_660._0_4_ = ray->tfar;
              local_620._0_8_ = lVar128;
              ray->tfar = *(float *)(local_1a0 + lVar128 * 4);
              fVar197 = 1.0 - local_5b4;
              fVar193 = local_5b4 * 3.0;
              auVar350 = ZEXT416((uint)((fVar197 * -2.0 * local_5b4 + local_5b4 * local_5b4) * 0.5))
              ;
              auVar350 = vshufps_avx(auVar350,auVar350,0);
              auVar201 = ZEXT416((uint)(((fVar197 + fVar197) * (fVar193 + 2.0) +
                                        fVar197 * fVar197 * -3.0) * 0.5));
              auVar201 = vshufps_avx(auVar201,auVar201,0);
              auVar196 = ZEXT416((uint)(((local_5b4 + local_5b4) * (fVar193 + -5.0) +
                                        local_5b4 * fVar193) * 0.5));
              auVar196 = vshufps_avx(auVar196,auVar196,0);
              auVar202 = ZEXT416((uint)((local_5b4 * (fVar197 + fVar197) - fVar197 * fVar197) * 0.5)
                                );
              auVar202 = vshufps_avx(auVar202,auVar202,0);
              auVar200._0_4_ = fVar198 * auVar202._0_4_;
              auVar200._4_4_ = fVar240 * auVar202._4_4_;
              auVar200._8_4_ = fVar242 * auVar202._8_4_;
              auVar200._12_4_ = fVar243 * auVar202._12_4_;
              auVar209 = ZEXT1664(auVar200);
              auVar180._0_4_ =
                   auVar200._0_4_ +
                   fVar244 * auVar196._0_4_ + auVar350._0_4_ * local_5d0 + fVar175 * auVar201._0_4_;
              auVar180._4_4_ =
                   auVar200._4_4_ +
                   fVar245 * auVar196._4_4_ + auVar350._4_4_ * fStack_5cc + fVar189 * auVar201._4_4_
              ;
              auVar180._8_4_ =
                   auVar200._8_4_ +
                   fVar247 * auVar196._8_4_ + auVar350._8_4_ * fStack_5c8 + fVar191 * auVar201._8_4_
              ;
              auVar180._12_4_ =
                   auVar200._12_4_ +
                   fVar255 * auVar196._12_4_ +
                   auVar350._12_4_ * fStack_5c4 + fVar195 * auVar201._12_4_;
              local_690.context = context->user;
              local_5c0 = vmovlps_avx(auVar180);
              local_5b8 = vextractps_avx(auVar180,2);
              local_5ac = (int)local_588;
              local_5a8 = (int)local_730;
              local_5a4 = (local_690.context)->instID[0];
              local_5a0 = (local_690.context)->instPrimID[0];
              local_7b4 = -1;
              local_690.valid = &local_7b4;
              local_690.geometryUserPtr = pGVar18->userPtr;
              local_690.ray = (RTCRayN *)ray;
              local_690.hit = (RTCHitN *)&local_5c0;
              local_690.N = 1;
              if (pGVar18->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00a130ad:
                p_Var19 = context->args->filter;
                if ((p_Var19 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar18->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  auVar209 = ZEXT1664(auVar209._0_16_);
                  (*p_Var19)(&local_690);
                  if (*local_690.valid == 0) goto LAB_00a130f0;
                }
                uVar126 = CONCAT71((int7)(uVar126 >> 8),1);
                auVar284 = ZEXT3264(local_700);
                auVar299 = ZEXT3264(local_720);
                auVar279 = ZEXT3264(local_580);
                auVar331 = ZEXT3264(_local_6e0);
                fVar176 = (float)local_760._0_4_;
                fVar190 = (float)local_760._4_4_;
                fVar192 = fStack_758;
                fVar194 = fStack_754;
                fVar193 = fStack_750;
                fVar197 = fStack_74c;
                fVar231 = fStack_748;
                fVar241 = fStack_744;
                auVar12 = _local_780;
                auVar13 = _local_770;
                auVar10 = _local_5e0;
                auVar9 = _local_600;
                goto LAB_00a13190;
              }
              auVar209 = ZEXT1664(auVar200);
              (*pGVar18->occlusionFilterN)(&local_690);
              if (*local_690.valid != 0) goto LAB_00a130ad;
LAB_00a130f0:
              ray->tfar = (float)local_660._0_4_;
              uVar129 = (ulong)local_7a0 ^ 1L << (local_620._0_8_ & 0x3f);
              lVar128 = 0;
              if (uVar129 != 0) {
                for (; (uVar129 >> lVar128 & 1) == 0; lVar128 = lVar128 + 1) {
                }
              }
              auVar284 = ZEXT3264(local_700);
              auVar299 = ZEXT3264(local_720);
              auVar279 = ZEXT3264(local_580);
              auVar331 = ZEXT3264(_local_6e0);
              fVar176 = (float)local_760._0_4_;
              fVar190 = (float)local_760._4_4_;
              fVar192 = fStack_758;
              fVar194 = fStack_754;
              fVar193 = fStack_750;
              fVar197 = fStack_74c;
              fVar231 = fStack_748;
              fVar241 = fStack_744;
              fVar175 = (float)local_770._0_4_;
              fVar189 = (float)local_770._4_4_;
              fVar191 = (float)uStack_768;
              fVar195 = uStack_768._4_4_;
              fVar198 = (float)local_780._0_4_;
              fVar240 = (float)local_780._4_4_;
              fVar242 = (float)uStack_778;
              fVar243 = uStack_778._4_4_;
              fVar244 = (float)local_5e0._0_4_;
              fVar245 = (float)local_5e0._4_4_;
              fVar247 = (float)uStack_5d8;
              fVar255 = uStack_5d8._4_4_;
            }
            goto LAB_00a12da9;
          }
        }
      }
LAB_00a13190:
      _local_600 = auVar9;
      _local_5e0 = auVar10;
      _local_770 = auVar13;
      _local_780 = auVar12;
      auVar168 = ZEXT1664(local_6c0._0_16_);
    }
    auVar311 = ZEXT3264(local_640);
    auVar316 = ZEXT3264(local_520);
    if (8 < (int)uVar123) {
      auVar350 = vpshufd_avx(ZEXT416(uVar123),0);
      local_480 = auVar350._0_4_;
      fStack_47c = auVar350._4_4_;
      fStack_478 = auVar350._8_4_;
      fStack_474 = auVar350._12_4_;
      auVar350 = vshufps_avx(auVar168._0_16_,auVar168._0_16_,0);
      local_340._16_16_ = auVar350;
      local_340._0_16_ = auVar350;
      local_360 = local_600._0_4_;
      fStack_35c = local_600._4_4_;
      fStack_358 = local_600._8_4_;
      fStack_354 = local_600._12_4_;
      auVar135._0_4_ = 1.0 / local_400;
      auVar135._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar350 = vshufps_avx(auVar135,auVar135,0);
      register0x00001210 = auVar350;
      _local_100 = auVar350;
      auVar151 = ZEXT3264(_local_100);
      local_700 = auVar284._0_32_;
      local_720 = auVar299._0_32_;
      local_580 = auVar279._0_32_;
      _local_6e0 = auVar331._0_32_;
      fStack_350 = local_360;
      fStack_34c = fStack_35c;
      fStack_348 = fStack_358;
      fStack_344 = fStack_354;
      for (lVar128 = 8; lVar128 < local_7b0; lVar128 = lVar128 + 8) {
        pauVar3 = (undefined1 (*) [28])(catmullrom_basis0 + lVar128 * 4 + lVar131);
        fVar175 = *(float *)*pauVar3;
        fVar189 = *(float *)(*pauVar3 + 4);
        fVar191 = *(float *)(*pauVar3 + 8);
        fVar195 = *(float *)(*pauVar3 + 0xc);
        fVar198 = *(float *)(*pauVar3 + 0x10);
        fVar240 = *(float *)(*pauVar3 + 0x14);
        fVar242 = *(float *)(*pauVar3 + 0x18);
        auVar121 = *pauVar3;
        pauVar3 = (undefined1 (*) [28])(lVar131 + 0x22047f0 + lVar128 * 4);
        fVar243 = *(float *)*pauVar3;
        fVar244 = *(float *)(*pauVar3 + 4);
        fVar245 = *(float *)(*pauVar3 + 8);
        fVar247 = *(float *)(*pauVar3 + 0xc);
        fVar255 = *(float *)(*pauVar3 + 0x10);
        fVar258 = *(float *)(*pauVar3 + 0x14);
        fVar261 = *(float *)(*pauVar3 + 0x18);
        auVar120 = *pauVar3;
        pfVar4 = (float *)(lVar131 + 0x2204c74 + lVar128 * 4);
        fVar285 = *pfVar4;
        fVar286 = pfVar4[1];
        fVar227 = pfVar4[2];
        fVar172 = pfVar4[3];
        fVar288 = pfVar4[4];
        fVar289 = pfVar4[5];
        fVar228 = pfVar4[6];
        pauVar3 = (undefined1 (*) [28])(lVar131 + 0x22050f8 + lVar128 * 4);
        fVar264 = *(float *)*pauVar3;
        fVar266 = *(float *)(*pauVar3 + 4);
        fVar268 = *(float *)(*pauVar3 + 8);
        fVar173 = *(float *)(*pauVar3 + 0xc);
        fVar290 = *(float *)(*pauVar3 + 0x10);
        fVar291 = *(float *)(*pauVar3 + 0x14);
        fVar229 = *(float *)(*pauVar3 + 0x18);
        auVar119 = *pauVar3;
        fVar153 = auVar311._0_4_;
        fVar155 = auVar311._4_4_;
        fVar169 = auVar311._8_4_;
        fVar170 = auVar311._12_4_;
        fVar171 = auVar311._16_4_;
        fVar211 = auVar311._20_4_;
        fVar220 = auVar311._24_4_;
        fVar210 = auVar209._28_4_;
        fVar222 = auVar316._0_4_;
        fVar224 = auVar316._4_4_;
        fVar246 = auVar316._8_4_;
        fVar248 = auVar316._12_4_;
        fVar256 = auVar316._16_4_;
        fVar259 = auVar316._20_4_;
        fVar262 = auVar316._24_4_;
        fStack_5e4 = fVar210 + *(float *)pauVar3[1];
        fVar154 = auVar279._0_4_;
        fVar212 = auVar279._4_4_;
        fVar221 = auVar279._8_4_;
        fVar223 = auVar279._12_4_;
        fVar225 = auVar279._16_4_;
        fVar226 = auVar279._20_4_;
        fVar133 = auVar279._24_4_;
        fVar230 = fVar210 + fStack_5e4;
        local_600._0_4_ =
             auVar331._0_4_ * fVar175 +
             (float)local_120._0_4_ * fVar243 + fVar153 * fVar285 + (float)local_3e0._0_4_ * fVar264
        ;
        local_600._4_4_ =
             auVar331._4_4_ * fVar189 +
             (float)local_120._4_4_ * fVar244 + fVar155 * fVar286 + (float)local_3e0._4_4_ * fVar266
        ;
        fStack_5f8 = auVar331._8_4_ * fVar191 +
                     fStack_118 * fVar245 + fVar169 * fVar227 + fStack_3d8 * fVar268;
        fStack_5f4 = auVar331._12_4_ * fVar195 +
                     fStack_114 * fVar247 + fVar170 * fVar172 + fStack_3d4 * fVar173;
        fStack_5f0 = auVar331._16_4_ * fVar198 +
                     fStack_110 * fVar255 + fVar171 * fVar288 + fStack_3d0 * fVar290;
        fStack_5ec = auVar331._20_4_ * fVar240 +
                     fStack_10c * fVar258 + fVar211 * fVar289 + fStack_3cc * fVar291;
        fStack_5e8 = auVar331._24_4_ * fVar242 +
                     fStack_108 * fVar261 + fVar220 * fVar228 + fStack_3c8 * fVar229;
        fStack_5e4 = fStack_5e4 + fVar210 + fVar210 + auVar151._28_4_;
        auVar208._0_4_ =
             fVar175 * (float)local_420._0_4_ +
             fVar154 * fVar243 + fVar222 * fVar285 + fVar176 * fVar264;
        auVar208._4_4_ =
             fVar189 * (float)local_420._4_4_ +
             fVar212 * fVar244 + fVar224 * fVar286 + fVar190 * fVar266;
        auVar208._8_4_ =
             fVar191 * fStack_418 + fVar221 * fVar245 + fVar246 * fVar227 + fVar192 * fVar268;
        auVar208._12_4_ =
             fVar195 * fStack_414 + fVar223 * fVar247 + fVar248 * fVar172 + fVar194 * fVar173;
        auVar208._16_4_ =
             fVar198 * fStack_410 + fVar225 * fVar255 + fVar256 * fVar288 + fVar193 * fVar290;
        auVar208._20_4_ =
             fVar240 * fStack_40c + fVar226 * fVar258 + fVar259 * fVar289 + fVar197 * fVar291;
        auVar208._24_4_ =
             fVar242 * fStack_408 + fVar133 * fVar261 + fVar262 * fVar228 + fVar231 * fVar229;
        auVar208._28_4_ = fStack_5e4 + fVar210 + fVar210 + auVar168._28_4_;
        local_7a0._0_4_ =
             fVar175 * (float)local_e0._0_4_ +
             (float)local_c0._0_4_ * fVar243 + fVar285 * local_140 + (float)local_a0._0_4_ * fVar264
        ;
        local_7a0._4_4_ =
             fVar189 * (float)local_e0._4_4_ +
             (float)local_c0._4_4_ * fVar244 +
             fVar286 * fStack_13c + (float)local_a0._4_4_ * fVar266;
        fStack_798 = fVar191 * fStack_d8 +
                     fStack_b8 * fVar245 + fVar227 * fStack_138 + fStack_98 * fVar268;
        fStack_794 = fVar195 * fStack_d4 +
                     fStack_b4 * fVar247 + fVar172 * fStack_134 + fStack_94 * fVar173;
        fStack_790 = fVar198 * fStack_d0 +
                     fStack_b0 * fVar255 + fVar288 * fStack_130 + fStack_90 * fVar290;
        fStack_78c = fVar240 * fStack_cc +
                     fStack_ac * fVar258 + fVar289 * fStack_12c + fStack_8c * fVar291;
        fStack_788 = fVar242 * fStack_c8 +
                     fStack_a8 * fVar261 + fVar228 * fStack_128 + fStack_88 * fVar229;
        fStack_784 = fStack_5e4 + fVar230;
        pfVar4 = (float *)(catmullrom_basis1 + lVar128 * 4 + lVar131);
        fVar173 = *pfVar4;
        fVar290 = pfVar4[1];
        fVar291 = pfVar4[2];
        fVar229 = pfVar4[3];
        fVar210 = pfVar4[4];
        fVar174 = pfVar4[5];
        fVar304 = pfVar4[6];
        pauVar3 = (undefined1 (*) [28])(lVar131 + 0x2206c10 + lVar128 * 4);
        fVar191 = *(float *)*pauVar3;
        fVar261 = *(float *)(*pauVar3 + 4);
        fVar268 = *(float *)(*pauVar3 + 8);
        fVar300 = *(float *)(*pauVar3 + 0xc);
        fVar301 = *(float *)(*pauVar3 + 0x10);
        fVar302 = *(float *)(*pauVar3 + 0x14);
        fVar303 = *(float *)(*pauVar3 + 0x18);
        auVar122 = *pauVar3;
        auVar136 = *(undefined1 (*) [32])(lVar131 + 0x2207094 + lVar128 * 4);
        auVar151 = ZEXT3264(auVar136);
        auVar280 = *(undefined1 (*) [32])(lVar131 + 0x2207518 + lVar128 * 4);
        auVar168 = ZEXT3264(auVar280);
        fVar175 = auVar280._0_4_;
        fVar195 = auVar280._4_4_;
        fVar240 = auVar280._8_4_;
        fVar243 = auVar280._12_4_;
        fVar245 = auVar280._16_4_;
        fVar255 = auVar280._20_4_;
        fVar264 = auVar280._24_4_;
        fVar189 = auVar136._0_4_;
        fVar198 = auVar136._4_4_;
        fVar242 = auVar136._8_4_;
        fVar244 = auVar136._12_4_;
        fVar247 = auVar136._16_4_;
        fVar258 = auVar136._20_4_;
        fVar266 = auVar136._24_4_;
        fVar152 = auVar279._28_4_;
        fVar230 = fVar152 + fVar152 + fVar230;
        auVar253._0_4_ =
             auVar331._0_4_ * fVar173 +
             (float)local_120._0_4_ * fVar191 + fVar153 * fVar189 + (float)local_3e0._0_4_ * fVar175
        ;
        auVar253._4_4_ =
             auVar331._4_4_ * fVar290 +
             (float)local_120._4_4_ * fVar261 + fVar155 * fVar198 + (float)local_3e0._4_4_ * fVar195
        ;
        auVar253._8_4_ =
             auVar331._8_4_ * fVar291 +
             fStack_118 * fVar268 + fVar169 * fVar242 + fStack_3d8 * fVar240;
        auVar253._12_4_ =
             auVar331._12_4_ * fVar229 +
             fStack_114 * fVar300 + fVar170 * fVar244 + fStack_3d4 * fVar243;
        auVar253._16_4_ =
             auVar331._16_4_ * fVar210 +
             fStack_110 * fVar301 + fVar171 * fVar247 + fStack_3d0 * fVar245;
        auVar253._20_4_ =
             auVar331._20_4_ * fVar174 +
             fStack_10c * fVar302 + fVar211 * fVar258 + fStack_3cc * fVar255;
        auVar253._24_4_ =
             auVar331._24_4_ * fVar304 +
             fStack_108 * fVar303 + fVar220 * fVar266 + fStack_3c8 * fVar264;
        auVar253._28_4_ = fVar152 + fStack_84 + fVar230;
        local_440._0_4_ =
             (float)local_420._0_4_ * fVar173 +
             fVar154 * fVar191 + fVar222 * fVar189 + fVar176 * fVar175;
        local_440._4_4_ =
             (float)local_420._4_4_ * fVar290 +
             fVar212 * fVar261 + fVar224 * fVar198 + fVar190 * fVar195;
        local_440._8_4_ =
             fStack_418 * fVar291 + fVar221 * fVar268 + fVar246 * fVar242 + fVar192 * fVar240;
        local_440._12_4_ =
             fStack_414 * fVar229 + fVar223 * fVar300 + fVar248 * fVar244 + fVar194 * fVar243;
        local_440._16_4_ =
             fStack_410 * fVar210 + fVar225 * fVar301 + fVar256 * fVar247 + fVar193 * fVar245;
        local_440._20_4_ =
             fStack_40c * fVar174 + fVar226 * fVar302 + fVar259 * fVar258 + fVar197 * fVar255;
        local_440._24_4_ =
             fStack_408 * fVar304 + fVar133 * fVar303 + fVar262 * fVar266 + fVar231 * fVar264;
        local_440._28_4_ = fVar230 + fVar152 + fVar152 + fVar241;
        local_6c0._0_4_ =
             (float)local_c0._0_4_ * fVar191 + fVar189 * local_140 + (float)local_a0._0_4_ * fVar175
             + fVar173 * (float)local_e0._0_4_;
        local_6c0._4_4_ =
             (float)local_c0._4_4_ * fVar261 +
             fVar198 * fStack_13c + (float)local_a0._4_4_ * fVar195 +
             fVar290 * (float)local_e0._4_4_;
        local_6c0._8_4_ =
             fStack_b8 * fVar268 + fVar242 * fStack_138 + fStack_98 * fVar240 + fVar291 * fStack_d8;
        local_6c0._12_4_ =
             fStack_b4 * fVar300 + fVar244 * fStack_134 + fStack_94 * fVar243 + fVar229 * fStack_d4;
        local_6c0._16_4_ =
             fStack_b0 * fVar301 + fVar247 * fStack_130 + fStack_90 * fVar245 + fVar210 * fStack_d0;
        local_6c0._20_4_ =
             fStack_ac * fVar302 + fVar258 * fStack_12c + fStack_8c * fVar255 + fVar174 * fStack_cc;
        local_6c0._24_4_ =
             fStack_a8 * fVar303 + fVar266 * fStack_128 + fStack_88 * fVar264 + fVar304 * fStack_c8;
        local_6c0._28_4_ = fVar152 + fVar152 + fStack_84 + fVar230;
        auVar21 = vsubps_avx(auVar253,_local_600);
        auVar22 = vsubps_avx(local_440,auVar208);
        fVar300 = auVar21._0_4_;
        fVar301 = auVar21._4_4_;
        auVar68._4_4_ = fVar301 * auVar208._4_4_;
        auVar68._0_4_ = fVar300 * auVar208._0_4_;
        fVar302 = auVar21._8_4_;
        auVar68._8_4_ = fVar302 * auVar208._8_4_;
        fVar303 = auVar21._12_4_;
        auVar68._12_4_ = fVar303 * auVar208._12_4_;
        fVar176 = auVar21._16_4_;
        auVar68._16_4_ = fVar176 * auVar208._16_4_;
        fVar190 = auVar21._20_4_;
        auVar68._20_4_ = fVar190 * auVar208._20_4_;
        fVar192 = auVar21._24_4_;
        auVar68._24_4_ = fVar192 * auVar208._24_4_;
        auVar68._28_4_ = fVar230;
        fVar191 = auVar22._0_4_;
        fVar193 = auVar22._4_4_;
        auVar69._4_4_ = (float)local_600._4_4_ * fVar193;
        auVar69._0_4_ = (float)local_600._0_4_ * fVar191;
        fVar197 = auVar22._8_4_;
        auVar69._8_4_ = fStack_5f8 * fVar197;
        fVar231 = auVar22._12_4_;
        auVar69._12_4_ = fStack_5f4 * fVar231;
        fVar241 = auVar22._16_4_;
        auVar69._16_4_ = fStack_5f0 * fVar241;
        fVar261 = auVar22._20_4_;
        auVar69._20_4_ = fStack_5ec * fVar261;
        fVar268 = auVar22._24_4_;
        auVar69._24_4_ = fStack_5e8 * fVar268;
        auVar69._28_4_ = local_440._28_4_;
        auVar23 = vsubps_avx(auVar68,auVar69);
        auVar209 = ZEXT3264(_local_7a0);
        auVar294 = vmaxps_avx(_local_7a0,local_6c0);
        auVar70._4_4_ = auVar294._4_4_ * auVar294._4_4_ * (fVar301 * fVar301 + fVar193 * fVar193);
        auVar70._0_4_ = auVar294._0_4_ * auVar294._0_4_ * (fVar300 * fVar300 + fVar191 * fVar191);
        auVar70._8_4_ = auVar294._8_4_ * auVar294._8_4_ * (fVar302 * fVar302 + fVar197 * fVar197);
        auVar70._12_4_ = auVar294._12_4_ * auVar294._12_4_ * (fVar303 * fVar303 + fVar231 * fVar231)
        ;
        auVar70._16_4_ = auVar294._16_4_ * auVar294._16_4_ * (fVar176 * fVar176 + fVar241 * fVar241)
        ;
        auVar70._20_4_ = auVar294._20_4_ * auVar294._20_4_ * (fVar190 * fVar190 + fVar261 * fVar261)
        ;
        auVar70._24_4_ = auVar294._24_4_ * auVar294._24_4_ * (fVar192 * fVar192 + fVar268 * fVar268)
        ;
        auVar70._28_4_ = auVar253._28_4_ + local_440._28_4_;
        auVar71._4_4_ = auVar23._4_4_ * auVar23._4_4_;
        auVar71._0_4_ = auVar23._0_4_ * auVar23._0_4_;
        auVar71._8_4_ = auVar23._8_4_ * auVar23._8_4_;
        auVar71._12_4_ = auVar23._12_4_ * auVar23._12_4_;
        auVar71._16_4_ = auVar23._16_4_ * auVar23._16_4_;
        auVar71._20_4_ = auVar23._20_4_ * auVar23._20_4_;
        auVar71._24_4_ = auVar23._24_4_ * auVar23._24_4_;
        auVar71._28_4_ = auVar23._28_4_;
        _local_320 = vcmpps_avx(auVar71,auVar70,2);
        local_260 = (uint)lVar128;
        auVar201 = vpshufd_avx(ZEXT416(local_260),0);
        auVar350 = vpor_avx(auVar201,_DAT_01f4ad30);
        auVar201 = vpor_avx(auVar201,_DAT_01f7afa0);
        auVar114._4_4_ = fStack_47c;
        auVar114._0_4_ = local_480;
        auVar114._8_4_ = fStack_478;
        auVar114._12_4_ = fStack_474;
        auVar350 = vpcmpgtd_avx(auVar114,auVar350);
        auVar201 = vpcmpgtd_avx(auVar114,auVar201);
        auVar188._16_16_ = auVar201;
        auVar188._0_16_ = auVar350;
        auVar294 = auVar188 & _local_320;
        fVar176 = (float)local_760._0_4_;
        fVar190 = (float)local_760._4_4_;
        fVar192 = fStack_758;
        fVar194 = fStack_754;
        fVar193 = fStack_750;
        fVar197 = fStack_74c;
        fVar231 = fStack_748;
        fVar241 = fStack_744;
        if ((((((((auVar294 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar294 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar294 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar294 >> 0x7f,0) == '\0') &&
              (auVar294 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar294 >> 0xbf,0) == '\0') &&
            (auVar294 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar294[0x1f]) {
          auVar284 = ZEXT3264(local_700);
          auVar299 = ZEXT3264(local_720);
          auVar311 = ZEXT3264(auVar311._0_32_);
          auVar316 = ZEXT3264(auVar316._0_32_);
          auVar279 = ZEXT3264(auVar279._0_32_);
          auVar331 = ZEXT3264(_local_6e0);
        }
        else {
          local_500._0_4_ = auVar122._0_4_;
          local_500._4_4_ = auVar122._4_4_;
          fStack_4f8 = auVar122._8_4_;
          fStack_4f4 = auVar122._12_4_;
          fStack_4f0 = auVar122._16_4_;
          fStack_4ec = auVar122._20_4_;
          fStack_4e8 = auVar122._24_4_;
          fVar191 = (float)local_300._0_4_ * (float)local_500._0_4_;
          fVar261 = (float)local_300._4_4_ * (float)local_500._4_4_;
          fVar268 = fStack_2f8 * fStack_4f8;
          fVar300 = fStack_2f4 * fStack_4f4;
          fVar301 = fStack_2f0 * fStack_4f0;
          fVar302 = fStack_2ec * fStack_4ec;
          fVar303 = fStack_2e8 * fStack_4e8;
          _local_500 = auVar188;
          local_400 = fVar173 * (float)local_3c0._0_4_ +
                      fVar191 + (float)local_2e0._0_4_ * fVar189 + (float)local_540._0_4_ * fVar175;
          fStack_3fc = fVar290 * (float)local_3c0._4_4_ +
                       fVar261 + (float)local_2e0._4_4_ * fVar198 + (float)local_540._4_4_ * fVar195
          ;
          fStack_3f8 = fVar291 * fStack_3b8 + fVar268 + fStack_2d8 * fVar242 + fStack_538 * fVar240;
          fStack_3f4 = fVar229 * fStack_3b4 + fVar300 + fStack_2d4 * fVar244 + fStack_534 * fVar243;
          fStack_3f0 = fVar210 * fStack_3b0 + fVar301 + fStack_2d0 * fVar247 + fStack_530 * fVar245;
          fStack_3ec = fVar174 * fStack_3ac + fVar302 + fStack_2cc * fVar258 + fStack_52c * fVar255;
          fStack_3e8 = fVar304 * fStack_3a8 + fVar303 + fStack_2c8 * fVar266 + fStack_528 * fVar264;
          fStack_3e4 = pfVar4[7] + auVar136._28_4_ + auVar280._28_4_ + 0.0;
          local_4c0._0_4_ = auVar120._0_4_;
          local_4c0._4_4_ = auVar120._4_4_;
          fStack_4b8 = auVar120._8_4_;
          fStack_4b4 = auVar120._12_4_;
          fStack_4b0 = auVar120._16_4_;
          fStack_4ac = auVar120._20_4_;
          fStack_4a8 = auVar120._24_4_;
          local_560._0_4_ = auVar119._0_4_;
          local_560._4_4_ = auVar119._4_4_;
          fStack_558 = auVar119._8_4_;
          fStack_554 = auVar119._12_4_;
          fStack_550 = auVar119._16_4_;
          fStack_54c = auVar119._20_4_;
          fStack_548 = auVar119._24_4_;
          fVar249 = (float)local_540._0_4_ * (float)local_560._0_4_;
          fVar257 = (float)local_540._4_4_ * (float)local_560._4_4_;
          fVar260 = fStack_538 * fStack_558;
          fVar263 = fStack_534 * fStack_554;
          fVar265 = fStack_530 * fStack_550;
          fVar267 = fStack_52c * fStack_54c;
          fVar269 = fStack_528 * fStack_548;
          pfVar4 = (float *)(lVar131 + 0x2205e84 + lVar128 * 4);
          fVar175 = *pfVar4;
          fVar189 = pfVar4[1];
          fVar191 = pfVar4[2];
          fVar195 = pfVar4[3];
          fVar198 = pfVar4[4];
          fVar240 = pfVar4[5];
          fVar242 = pfVar4[6];
          pfVar5 = (float *)(lVar131 + 0x2206308 + lVar128 * 4);
          fVar243 = *pfVar5;
          fVar244 = pfVar5[1];
          fVar245 = pfVar5[2];
          fVar247 = pfVar5[3];
          fVar255 = pfVar5[4];
          fVar258 = pfVar5[5];
          fVar261 = pfVar5[6];
          pfVar6 = (float *)(lVar131 + 0x2205a00 + lVar128 * 4);
          fVar264 = *pfVar6;
          fVar266 = pfVar6[1];
          fVar268 = pfVar6[2];
          fVar173 = pfVar6[3];
          fVar290 = pfVar6[4];
          fVar291 = pfVar6[5];
          fVar229 = pfVar6[6];
          fVar230 = pfVar4[7] + pfVar5[7];
          fStack_544 = pfVar5[7] + fVar152 + 0.0;
          fVar152 = fVar152 + fStack_5e4 + fVar152 + 0.0;
          pfVar4 = (float *)(lVar131 + 0x220557c + lVar128 * 4);
          fVar210 = *pfVar4;
          fVar174 = pfVar4[1];
          fVar304 = pfVar4[2];
          fVar300 = pfVar4[3];
          fVar301 = pfVar4[4];
          fVar302 = pfVar4[5];
          fVar303 = pfVar4[6];
          local_4e0 = fVar210 * (float)local_6e0._0_4_ +
                      (float)local_120._0_4_ * fVar264 +
                      fVar153 * fVar175 + (float)local_3e0._0_4_ * fVar243;
          fStack_4dc = fVar174 * (float)local_6e0._4_4_ +
                       (float)local_120._4_4_ * fVar266 +
                       fVar155 * fVar189 + (float)local_3e0._4_4_ * fVar244;
          fStack_4d8 = fVar304 * fStack_6d8 +
                       fStack_118 * fVar268 + fVar169 * fVar191 + fStack_3d8 * fVar245;
          fStack_4d4 = fVar300 * fStack_6d4 +
                       fStack_114 * fVar173 + fVar170 * fVar195 + fStack_3d4 * fVar247;
          fStack_4d0 = fVar301 * fStack_6d0 +
                       fStack_110 * fVar290 + fVar171 * fVar198 + fStack_3d0 * fVar255;
          fStack_4cc = fVar302 * fStack_6cc +
                       fStack_10c * fVar291 + fVar211 * fVar240 + fStack_3cc * fVar258;
          fStack_4c8 = fVar303 * fStack_6c8 +
                       fStack_108 * fVar229 + fVar220 * fVar242 + fStack_3c8 * fVar261;
          fStack_4c4 = fVar230 + fStack_544;
          fStack_544 = fStack_544 + fVar152;
          local_560._4_4_ =
               fVar174 * (float)local_420._4_4_ +
               fVar224 * fVar189 + (float)local_760._4_4_ * fVar244 + fVar266 * fVar212;
          local_560._0_4_ =
               fVar210 * (float)local_420._0_4_ +
               fVar222 * fVar175 + (float)local_760._0_4_ * fVar243 + fVar264 * fVar154;
          fStack_558 = fVar304 * fStack_418 +
                       fVar246 * fVar191 + fStack_758 * fVar245 + fVar268 * fVar221;
          fStack_554 = fVar300 * fStack_414 +
                       fVar248 * fVar195 + fStack_754 * fVar247 + fVar173 * fVar223;
          fStack_550 = fVar301 * fStack_410 +
                       fVar256 * fVar198 + fStack_750 * fVar255 + fVar290 * fVar225;
          fStack_54c = fVar302 * fStack_40c +
                       fVar259 * fVar240 + fStack_74c * fVar258 + fVar291 * fVar226;
          fStack_548 = fVar303 * fStack_408 +
                       fVar262 * fVar242 + fStack_748 * fVar261 + fVar229 * fVar133;
          auVar329._0_4_ =
               fVar264 * (float)local_300._0_4_ +
               (float)local_2e0._0_4_ * fVar175 + (float)local_540._0_4_ * fVar243 +
               fVar210 * (float)local_3c0._0_4_;
          auVar329._4_4_ =
               fVar266 * (float)local_300._4_4_ +
               (float)local_2e0._4_4_ * fVar189 + (float)local_540._4_4_ * fVar244 +
               fVar174 * (float)local_3c0._4_4_;
          auVar329._8_4_ =
               fVar268 * fStack_2f8 + fStack_2d8 * fVar191 + fStack_538 * fVar245 +
               fVar304 * fStack_3b8;
          auVar329._12_4_ =
               fVar173 * fStack_2f4 + fStack_2d4 * fVar195 + fStack_534 * fVar247 +
               fVar300 * fStack_3b4;
          auVar329._16_4_ =
               fVar290 * fStack_2f0 + fStack_2d0 * fVar198 + fStack_530 * fVar255 +
               fVar301 * fStack_3b0;
          auVar329._20_4_ =
               fVar291 * fStack_2ec + fStack_2cc * fVar240 + fStack_52c * fVar258 +
               fVar302 * fStack_3ac;
          auVar329._24_4_ =
               fVar229 * fStack_2e8 + fStack_2c8 * fVar242 + fStack_528 * fVar261 +
               fVar303 * fStack_3a8;
          auVar329._28_4_ = pfVar6[7] + fVar230 + fVar152;
          pfVar4 = (float *)(lVar131 + 0x22082a4 + lVar128 * 4);
          fVar175 = *pfVar4;
          fVar189 = pfVar4[1];
          fVar191 = pfVar4[2];
          fVar195 = pfVar4[3];
          fVar198 = pfVar4[4];
          fVar240 = pfVar4[5];
          fVar242 = pfVar4[6];
          pfVar5 = (float *)(lVar131 + 0x2208728 + lVar128 * 4);
          fVar243 = *pfVar5;
          fVar244 = pfVar5[1];
          fVar245 = pfVar5[2];
          fVar247 = pfVar5[3];
          fVar255 = pfVar5[4];
          fVar258 = pfVar5[5];
          fVar261 = pfVar5[6];
          pfVar6 = (float *)(lVar131 + 0x2207e20 + lVar128 * 4);
          fVar264 = *pfVar6;
          fVar266 = pfVar6[1];
          fVar268 = pfVar6[2];
          fVar173 = pfVar6[3];
          fVar290 = pfVar6[4];
          fVar291 = pfVar6[5];
          fVar229 = pfVar6[6];
          pfVar7 = (float *)(lVar131 + 0x220799c + lVar128 * 4);
          fVar210 = *pfVar7;
          fVar174 = pfVar7[1];
          fVar304 = pfVar7[2];
          fVar300 = pfVar7[3];
          fVar301 = pfVar7[4];
          fVar302 = pfVar7[5];
          fVar303 = pfVar7[6];
          auVar297._0_4_ =
               fVar210 * (float)local_6e0._0_4_ +
               (float)local_120._0_4_ * fVar264 +
               fVar153 * fVar175 + (float)local_3e0._0_4_ * fVar243;
          auVar297._4_4_ =
               fVar174 * (float)local_6e0._4_4_ +
               (float)local_120._4_4_ * fVar266 +
               fVar155 * fVar189 + (float)local_3e0._4_4_ * fVar244;
          auVar297._8_4_ =
               fVar304 * fStack_6d8 +
               fStack_118 * fVar268 + fVar169 * fVar191 + fStack_3d8 * fVar245;
          auVar297._12_4_ =
               fVar300 * fStack_6d4 +
               fStack_114 * fVar173 + fVar170 * fVar195 + fStack_3d4 * fVar247;
          auVar297._16_4_ =
               fVar301 * fStack_6d0 +
               fStack_110 * fVar290 + fVar171 * fVar198 + fStack_3d0 * fVar255;
          auVar297._20_4_ =
               fVar302 * fStack_6cc +
               fStack_10c * fVar291 + fVar211 * fVar240 + fStack_3cc * fVar258;
          auVar297._24_4_ =
               fVar303 * fStack_6c8 +
               fStack_108 * fVar229 + fVar220 * fVar242 + fStack_3c8 * fVar261;
          auVar297._28_4_ = fStack_744 + fStack_744 + fStack_3c4 + fStack_544;
          auVar321._0_4_ =
               fVar210 * (float)local_420._0_4_ +
               fVar264 * fVar154 + fVar222 * fVar175 + (float)local_760._0_4_ * fVar243;
          auVar321._4_4_ =
               fVar174 * (float)local_420._4_4_ +
               fVar266 * fVar212 + fVar224 * fVar189 + (float)local_760._4_4_ * fVar244;
          auVar321._8_4_ =
               fVar304 * fStack_418 + fVar268 * fVar221 + fVar246 * fVar191 + fStack_758 * fVar245;
          auVar321._12_4_ =
               fVar300 * fStack_414 + fVar173 * fVar223 + fVar248 * fVar195 + fStack_754 * fVar247;
          auVar321._16_4_ =
               fVar301 * fStack_410 + fVar290 * fVar225 + fVar256 * fVar198 + fStack_750 * fVar255;
          auVar321._20_4_ =
               fVar302 * fStack_40c + fVar291 * fVar226 + fVar259 * fVar240 + fStack_74c * fVar258;
          auVar321._24_4_ =
               fVar303 * fStack_408 + fVar229 * fVar133 + fVar262 * fVar242 + fStack_748 * fVar261;
          auVar321._28_4_ = fStack_744 + fStack_744 + auVar311._28_4_ + fStack_744;
          auVar239._8_4_ = 0x7fffffff;
          auVar239._0_8_ = 0x7fffffff7fffffff;
          auVar239._12_4_ = 0x7fffffff;
          auVar239._16_4_ = 0x7fffffff;
          auVar239._20_4_ = 0x7fffffff;
          auVar239._24_4_ = 0x7fffffff;
          auVar239._28_4_ = 0x7fffffff;
          auVar113._4_4_ = fStack_4dc;
          auVar113._0_4_ = local_4e0;
          auVar113._8_4_ = fStack_4d8;
          auVar113._12_4_ = fStack_4d4;
          auVar113._16_4_ = fStack_4d0;
          auVar113._20_4_ = fStack_4cc;
          auVar113._24_4_ = fStack_4c8;
          auVar113._28_4_ = fStack_4c4;
          auVar136 = vandps_avx(auVar113,auVar239);
          auVar294 = vandps_avx(_local_560,auVar239);
          auVar294 = vmaxps_avx(auVar136,auVar294);
          auVar136 = vandps_avx(auVar329,auVar239);
          auVar294 = vmaxps_avx(auVar294,auVar136);
          auVar294 = vcmpps_avx(auVar294,local_340,1);
          auVar23 = vblendvps_avx(auVar113,auVar21,auVar294);
          auVar148._0_4_ =
               fVar210 * (float)local_3c0._0_4_ +
               fVar264 * (float)local_300._0_4_ +
               fVar243 * (float)local_540._0_4_ + (float)local_2e0._0_4_ * fVar175;
          auVar148._4_4_ =
               fVar174 * (float)local_3c0._4_4_ +
               fVar266 * (float)local_300._4_4_ +
               fVar244 * (float)local_540._4_4_ + (float)local_2e0._4_4_ * fVar189;
          auVar148._8_4_ =
               fVar304 * fStack_3b8 +
               fVar268 * fStack_2f8 + fVar245 * fStack_538 + fStack_2d8 * fVar191;
          auVar148._12_4_ =
               fVar300 * fStack_3b4 +
               fVar173 * fStack_2f4 + fVar247 * fStack_534 + fStack_2d4 * fVar195;
          auVar148._16_4_ =
               fVar301 * fStack_3b0 +
               fVar290 * fStack_2f0 + fVar255 * fStack_530 + fStack_2d0 * fVar198;
          auVar148._20_4_ =
               fVar302 * fStack_3ac +
               fVar291 * fStack_2ec + fVar258 * fStack_52c + fStack_2cc * fVar240;
          auVar148._24_4_ =
               fVar303 * fStack_3a8 +
               fVar229 * fStack_2e8 + fVar261 * fStack_528 + fStack_2c8 * fVar242;
          auVar148._28_4_ = auVar136._28_4_ + pfVar6[7] + pfVar5[7] + pfVar4[7];
          auVar24 = vblendvps_avx(_local_560,auVar22,auVar294);
          auVar136 = vandps_avx(auVar297,auVar239);
          auVar294 = vandps_avx(auVar321,auVar239);
          auVar25 = vmaxps_avx(auVar136,auVar294);
          auVar136 = vandps_avx(auVar148,auVar239);
          auVar136 = vmaxps_avx(auVar25,auVar136);
          local_460._0_4_ = auVar121._0_4_;
          local_460._4_4_ = auVar121._4_4_;
          fStack_458 = auVar121._8_4_;
          fStack_454 = auVar121._12_4_;
          fStack_450 = auVar121._16_4_;
          fStack_44c = auVar121._20_4_;
          fStack_448 = auVar121._24_4_;
          auVar294 = vcmpps_avx(auVar136,local_340,1);
          auVar136 = vblendvps_avx(auVar297,auVar21,auVar294);
          auVar149._0_4_ =
               (float)local_3c0._0_4_ * (float)local_460._0_4_ +
               (float)local_300._0_4_ * (float)local_4c0._0_4_ +
               (float)local_2e0._0_4_ * fVar285 + fVar249;
          auVar149._4_4_ =
               (float)local_3c0._4_4_ * (float)local_460._4_4_ +
               (float)local_300._4_4_ * (float)local_4c0._4_4_ +
               (float)local_2e0._4_4_ * fVar286 + fVar257;
          auVar149._8_4_ =
               fStack_3b8 * fStack_458 + fStack_2f8 * fStack_4b8 + fStack_2d8 * fVar227 + fVar260;
          auVar149._12_4_ =
               fStack_3b4 * fStack_454 + fStack_2f4 * fStack_4b4 + fStack_2d4 * fVar172 + fVar263;
          auVar149._16_4_ =
               fStack_3b0 * fStack_450 + fStack_2f0 * fStack_4b0 + fStack_2d0 * fVar288 + fVar265;
          auVar149._20_4_ =
               fStack_3ac * fStack_44c + fStack_2ec * fStack_4ac + fStack_2cc * fVar289 + fVar267;
          auVar149._24_4_ =
               fStack_3a8 * fStack_448 + fStack_2e8 * fStack_4a8 + fStack_2c8 * fVar228 + fVar269;
          auVar149._28_4_ = auVar25._28_4_ + fStack_3e4 + auVar280._28_4_ + 0.0;
          auVar280 = vblendvps_avx(auVar321,auVar22,auVar294);
          fVar230 = auVar23._0_4_;
          fVar154 = auVar23._4_4_;
          fVar212 = auVar23._8_4_;
          fVar221 = auVar23._12_4_;
          fVar223 = auVar23._16_4_;
          fVar225 = auVar23._20_4_;
          fVar226 = auVar23._24_4_;
          fVar133 = auVar23._28_4_;
          fVar264 = auVar136._0_4_;
          fVar268 = auVar136._4_4_;
          fVar286 = auVar136._8_4_;
          fVar172 = auVar136._12_4_;
          fVar289 = auVar136._16_4_;
          fVar173 = auVar136._20_4_;
          fVar291 = auVar136._24_4_;
          fVar175 = auVar24._0_4_;
          fVar191 = auVar24._4_4_;
          fVar198 = auVar24._8_4_;
          fVar242 = auVar24._12_4_;
          fVar244 = auVar24._16_4_;
          fVar247 = auVar24._20_4_;
          fVar258 = auVar24._24_4_;
          auVar309._0_4_ = fVar175 * fVar175 + fVar230 * fVar230;
          auVar309._4_4_ = fVar191 * fVar191 + fVar154 * fVar154;
          auVar309._8_4_ = fVar198 * fVar198 + fVar212 * fVar212;
          auVar309._12_4_ = fVar242 * fVar242 + fVar221 * fVar221;
          auVar309._16_4_ = fVar244 * fVar244 + fVar223 * fVar223;
          auVar309._20_4_ = fVar247 * fVar247 + fVar225 * fVar225;
          auVar309._24_4_ = fVar258 * fVar258 + fVar226 * fVar226;
          auVar309._28_4_ = auVar21._28_4_ + auVar22._28_4_;
          auVar294 = vrsqrtps_avx(auVar309);
          fVar189 = auVar294._0_4_;
          fVar195 = auVar294._4_4_;
          auVar72._4_4_ = fVar195 * 1.5;
          auVar72._0_4_ = fVar189 * 1.5;
          fVar240 = auVar294._8_4_;
          auVar72._8_4_ = fVar240 * 1.5;
          fVar243 = auVar294._12_4_;
          auVar72._12_4_ = fVar243 * 1.5;
          fVar245 = auVar294._16_4_;
          auVar72._16_4_ = fVar245 * 1.5;
          fVar255 = auVar294._20_4_;
          auVar72._20_4_ = fVar255 * 1.5;
          fVar261 = auVar294._24_4_;
          auVar72._24_4_ = fVar261 * 1.5;
          auVar72._28_4_ = auVar321._28_4_;
          auVar73._4_4_ = fVar195 * fVar195 * fVar195 * auVar309._4_4_ * 0.5;
          auVar73._0_4_ = fVar189 * fVar189 * fVar189 * auVar309._0_4_ * 0.5;
          auVar73._8_4_ = fVar240 * fVar240 * fVar240 * auVar309._8_4_ * 0.5;
          auVar73._12_4_ = fVar243 * fVar243 * fVar243 * auVar309._12_4_ * 0.5;
          auVar73._16_4_ = fVar245 * fVar245 * fVar245 * auVar309._16_4_ * 0.5;
          auVar73._20_4_ = fVar255 * fVar255 * fVar255 * auVar309._20_4_ * 0.5;
          auVar73._24_4_ = fVar261 * fVar261 * fVar261 * auVar309._24_4_ * 0.5;
          auVar73._28_4_ = auVar309._28_4_;
          auVar21 = vsubps_avx(auVar72,auVar73);
          fVar210 = auVar21._0_4_;
          fVar174 = auVar21._4_4_;
          fVar304 = auVar21._8_4_;
          fVar300 = auVar21._12_4_;
          fVar301 = auVar21._16_4_;
          fVar302 = auVar21._20_4_;
          fVar303 = auVar21._24_4_;
          fVar189 = auVar280._0_4_;
          fVar195 = auVar280._4_4_;
          fVar240 = auVar280._8_4_;
          fVar243 = auVar280._12_4_;
          fVar245 = auVar280._16_4_;
          fVar255 = auVar280._20_4_;
          fVar261 = auVar280._24_4_;
          auVar283._0_4_ = fVar189 * fVar189 + fVar264 * fVar264;
          auVar283._4_4_ = fVar195 * fVar195 + fVar268 * fVar268;
          auVar283._8_4_ = fVar240 * fVar240 + fVar286 * fVar286;
          auVar283._12_4_ = fVar243 * fVar243 + fVar172 * fVar172;
          auVar283._16_4_ = fVar245 * fVar245 + fVar289 * fVar289;
          auVar283._20_4_ = fVar255 * fVar255 + fVar173 * fVar173;
          auVar283._24_4_ = fVar261 * fVar261 + fVar291 * fVar291;
          auVar283._28_4_ = auVar294._28_4_ + auVar136._28_4_;
          auVar136 = vrsqrtps_avx(auVar283);
          fVar266 = auVar136._0_4_;
          fVar285 = auVar136._4_4_;
          auVar74._4_4_ = fVar285 * 1.5;
          auVar74._0_4_ = fVar266 * 1.5;
          fVar227 = auVar136._8_4_;
          auVar74._8_4_ = fVar227 * 1.5;
          fVar288 = auVar136._12_4_;
          auVar74._12_4_ = fVar288 * 1.5;
          fVar228 = auVar136._16_4_;
          auVar74._16_4_ = fVar228 * 1.5;
          fVar290 = auVar136._20_4_;
          auVar74._20_4_ = fVar290 * 1.5;
          fVar229 = auVar136._24_4_;
          auVar74._24_4_ = fVar229 * 1.5;
          auVar74._28_4_ = auVar321._28_4_;
          auVar75._4_4_ = fVar285 * fVar285 * fVar285 * auVar283._4_4_ * 0.5;
          auVar75._0_4_ = fVar266 * fVar266 * fVar266 * auVar283._0_4_ * 0.5;
          auVar75._8_4_ = fVar227 * fVar227 * fVar227 * auVar283._8_4_ * 0.5;
          auVar75._12_4_ = fVar288 * fVar288 * fVar288 * auVar283._12_4_ * 0.5;
          auVar75._16_4_ = fVar228 * fVar228 * fVar228 * auVar283._16_4_ * 0.5;
          auVar75._20_4_ = fVar290 * fVar290 * fVar290 * auVar283._20_4_ * 0.5;
          auVar75._24_4_ = fVar229 * fVar229 * fVar229 * auVar283._24_4_ * 0.5;
          auVar75._28_4_ = auVar283._28_4_;
          auVar280 = vsubps_avx(auVar74,auVar75);
          fVar266 = auVar280._0_4_;
          fVar285 = auVar280._4_4_;
          fVar227 = auVar280._8_4_;
          fVar288 = auVar280._12_4_;
          fVar228 = auVar280._16_4_;
          fVar290 = auVar280._20_4_;
          fVar229 = auVar280._24_4_;
          fVar175 = (float)local_7a0._0_4_ * fVar210 * fVar175;
          fVar191 = (float)local_7a0._4_4_ * fVar174 * fVar191;
          auVar76._4_4_ = fVar191;
          auVar76._0_4_ = fVar175;
          fVar198 = fStack_798 * fVar304 * fVar198;
          auVar76._8_4_ = fVar198;
          fVar242 = fStack_794 * fVar300 * fVar242;
          auVar76._12_4_ = fVar242;
          fVar244 = fStack_790 * fVar301 * fVar244;
          auVar76._16_4_ = fVar244;
          fVar247 = fStack_78c * fVar302 * fVar247;
          auVar76._20_4_ = fVar247;
          fVar258 = fStack_788 * fVar303 * fVar258;
          auVar76._24_4_ = fVar258;
          auVar76._28_4_ = auVar136._28_4_;
          local_460._4_4_ = fVar191 + (float)local_600._4_4_;
          local_460._0_4_ = fVar175 + (float)local_600._0_4_;
          fStack_458 = fVar198 + fStack_5f8;
          fStack_454 = fVar242 + fStack_5f4;
          fStack_450 = fVar244 + fStack_5f0;
          fStack_44c = fVar247 + fStack_5ec;
          fStack_448 = fVar258 + fStack_5e8;
          fStack_444 = auVar136._28_4_ + fStack_5e4;
          fVar175 = (float)local_7a0._0_4_ * fVar210 * -fVar230;
          fVar191 = (float)local_7a0._4_4_ * fVar174 * -fVar154;
          auVar77._4_4_ = fVar191;
          auVar77._0_4_ = fVar175;
          fVar198 = fStack_798 * fVar304 * -fVar212;
          auVar77._8_4_ = fVar198;
          fVar242 = fStack_794 * fVar300 * -fVar221;
          auVar77._12_4_ = fVar242;
          fVar244 = fStack_790 * fVar301 * -fVar223;
          auVar77._16_4_ = fVar244;
          fVar247 = fStack_78c * fVar302 * -fVar225;
          auVar77._20_4_ = fVar247;
          fVar258 = fStack_788 * fVar303 * -fVar226;
          auVar77._24_4_ = fVar258;
          auVar77._28_4_ = -fVar133;
          local_4c0._4_4_ = auVar208._4_4_ + fVar191;
          local_4c0._0_4_ = auVar208._0_4_ + fVar175;
          fStack_4b8 = auVar208._8_4_ + fVar198;
          fStack_4b4 = auVar208._12_4_ + fVar242;
          fStack_4b0 = auVar208._16_4_ + fVar244;
          fStack_4ac = auVar208._20_4_ + fVar247;
          fStack_4a8 = auVar208._24_4_ + fVar258;
          fStack_4a4 = auVar208._28_4_ + -fVar133;
          fVar175 = fVar210 * 0.0 * (float)local_7a0._0_4_;
          fVar191 = fVar174 * 0.0 * (float)local_7a0._4_4_;
          auVar78._4_4_ = fVar191;
          auVar78._0_4_ = fVar175;
          fVar198 = fVar304 * 0.0 * fStack_798;
          auVar78._8_4_ = fVar198;
          fVar242 = fVar300 * 0.0 * fStack_794;
          auVar78._12_4_ = fVar242;
          fVar244 = fVar301 * 0.0 * fStack_790;
          auVar78._16_4_ = fVar244;
          fVar247 = fVar302 * 0.0 * fStack_78c;
          auVar78._20_4_ = fVar247;
          fVar258 = fVar303 * 0.0 * fStack_788;
          auVar78._24_4_ = fVar258;
          auVar78._28_4_ = fVar133;
          auVar24 = vsubps_avx(_local_600,auVar76);
          auVar346._0_4_ = fVar175 + auVar149._0_4_;
          auVar346._4_4_ = fVar191 + auVar149._4_4_;
          auVar346._8_4_ = fVar198 + auVar149._8_4_;
          auVar346._12_4_ = fVar242 + auVar149._12_4_;
          auVar346._16_4_ = fVar244 + auVar149._16_4_;
          auVar346._20_4_ = fVar247 + auVar149._20_4_;
          auVar346._24_4_ = fVar258 + auVar149._24_4_;
          auVar346._28_4_ = fVar133 + auVar149._28_4_;
          fVar175 = (float)local_6c0._0_4_ * fVar266 * fVar189;
          fVar189 = local_6c0._4_4_ * fVar285 * fVar195;
          auVar79._4_4_ = fVar189;
          auVar79._0_4_ = fVar175;
          fVar191 = local_6c0._8_4_ * fVar227 * fVar240;
          auVar79._8_4_ = fVar191;
          fVar195 = local_6c0._12_4_ * fVar288 * fVar243;
          auVar79._12_4_ = fVar195;
          fVar198 = local_6c0._16_4_ * fVar228 * fVar245;
          auVar79._16_4_ = fVar198;
          fVar240 = local_6c0._20_4_ * fVar290 * fVar255;
          auVar79._20_4_ = fVar240;
          fVar242 = local_6c0._24_4_ * fVar229 * fVar261;
          auVar79._24_4_ = fVar242;
          auVar79._28_4_ = fStack_5e4;
          auVar27 = vsubps_avx(auVar208,auVar77);
          auVar330._0_4_ = auVar253._0_4_ + fVar175;
          auVar330._4_4_ = auVar253._4_4_ + fVar189;
          auVar330._8_4_ = auVar253._8_4_ + fVar191;
          auVar330._12_4_ = auVar253._12_4_ + fVar195;
          auVar330._16_4_ = auVar253._16_4_ + fVar198;
          auVar330._20_4_ = auVar253._20_4_ + fVar240;
          auVar330._24_4_ = auVar253._24_4_ + fVar242;
          auVar330._28_4_ = auVar253._28_4_ + fStack_5e4;
          fVar175 = fVar266 * -fVar264 * (float)local_6c0._0_4_;
          fVar189 = fVar285 * -fVar268 * local_6c0._4_4_;
          auVar80._4_4_ = fVar189;
          auVar80._0_4_ = fVar175;
          fVar191 = fVar227 * -fVar286 * local_6c0._8_4_;
          auVar80._8_4_ = fVar191;
          fVar195 = fVar288 * -fVar172 * local_6c0._12_4_;
          auVar80._12_4_ = fVar195;
          fVar198 = fVar228 * -fVar289 * local_6c0._16_4_;
          auVar80._16_4_ = fVar198;
          fVar240 = fVar290 * -fVar173 * local_6c0._20_4_;
          auVar80._20_4_ = fVar240;
          fVar242 = fVar229 * -fVar291 * local_6c0._24_4_;
          auVar80._24_4_ = fVar242;
          auVar80._28_4_ = fStack_784;
          auVar137 = vsubps_avx(auVar149,auVar78);
          auVar218._0_4_ = local_440._0_4_ + fVar175;
          auVar218._4_4_ = local_440._4_4_ + fVar189;
          auVar218._8_4_ = local_440._8_4_ + fVar191;
          auVar218._12_4_ = local_440._12_4_ + fVar195;
          auVar218._16_4_ = local_440._16_4_ + fVar198;
          auVar218._20_4_ = local_440._20_4_ + fVar240;
          auVar218._24_4_ = local_440._24_4_ + fVar242;
          auVar218._28_4_ = local_440._28_4_ + fStack_784;
          fVar175 = fVar266 * 0.0 * (float)local_6c0._0_4_;
          fVar189 = fVar285 * 0.0 * local_6c0._4_4_;
          auVar81._4_4_ = fVar189;
          auVar81._0_4_ = fVar175;
          fVar191 = fVar227 * 0.0 * local_6c0._8_4_;
          auVar81._8_4_ = fVar191;
          fVar195 = fVar288 * 0.0 * local_6c0._12_4_;
          auVar81._12_4_ = fVar195;
          fVar198 = fVar228 * 0.0 * local_6c0._16_4_;
          auVar81._16_4_ = fVar198;
          fVar240 = fVar290 * 0.0 * local_6c0._20_4_;
          auVar81._20_4_ = fVar240;
          fVar242 = fVar229 * 0.0 * local_6c0._24_4_;
          auVar81._24_4_ = fVar242;
          auVar81._28_4_ = auVar149._28_4_;
          auVar136 = vsubps_avx(auVar253,auVar79);
          auVar116._4_4_ = fStack_3fc;
          auVar116._0_4_ = local_400;
          auVar116._8_4_ = fStack_3f8;
          auVar116._12_4_ = fStack_3f4;
          auVar116._16_4_ = fStack_3f0;
          auVar116._20_4_ = fStack_3ec;
          auVar116._24_4_ = fStack_3e8;
          auVar116._28_4_ = fStack_3e4;
          auVar298._0_4_ = local_400 + fVar175;
          auVar298._4_4_ = fStack_3fc + fVar189;
          auVar298._8_4_ = fStack_3f8 + fVar191;
          auVar298._12_4_ = fStack_3f4 + fVar195;
          auVar298._16_4_ = fStack_3f0 + fVar198;
          auVar298._20_4_ = fStack_3ec + fVar240;
          auVar298._24_4_ = fStack_3e8 + fVar242;
          auVar298._28_4_ = fStack_3e4 + auVar149._28_4_;
          auVar294 = vsubps_avx(local_440,auVar80);
          auVar21 = vsubps_avx(auVar116,auVar81);
          auVar22 = vsubps_avx(auVar218,auVar27);
          auVar23 = vsubps_avx(auVar298,auVar137);
          auVar82._4_4_ = auVar137._4_4_ * auVar22._4_4_;
          auVar82._0_4_ = auVar137._0_4_ * auVar22._0_4_;
          auVar82._8_4_ = auVar137._8_4_ * auVar22._8_4_;
          auVar82._12_4_ = auVar137._12_4_ * auVar22._12_4_;
          auVar82._16_4_ = auVar137._16_4_ * auVar22._16_4_;
          auVar82._20_4_ = auVar137._20_4_ * auVar22._20_4_;
          auVar82._24_4_ = auVar137._24_4_ * auVar22._24_4_;
          auVar82._28_4_ = auVar321._28_4_;
          auVar83._4_4_ = auVar27._4_4_ * auVar23._4_4_;
          auVar83._0_4_ = auVar27._0_4_ * auVar23._0_4_;
          auVar83._8_4_ = auVar27._8_4_ * auVar23._8_4_;
          auVar83._12_4_ = auVar27._12_4_ * auVar23._12_4_;
          auVar83._16_4_ = auVar27._16_4_ * auVar23._16_4_;
          auVar83._20_4_ = auVar27._20_4_ * auVar23._20_4_;
          auVar83._24_4_ = auVar27._24_4_ * auVar23._24_4_;
          auVar83._28_4_ = fStack_3e4;
          auVar25 = vsubps_avx(auVar83,auVar82);
          auVar84._4_4_ = auVar24._4_4_ * auVar23._4_4_;
          auVar84._0_4_ = auVar24._0_4_ * auVar23._0_4_;
          auVar84._8_4_ = auVar24._8_4_ * auVar23._8_4_;
          auVar84._12_4_ = auVar24._12_4_ * auVar23._12_4_;
          auVar84._16_4_ = auVar24._16_4_ * auVar23._16_4_;
          auVar84._20_4_ = auVar24._20_4_ * auVar23._20_4_;
          auVar84._24_4_ = auVar24._24_4_ * auVar23._24_4_;
          auVar84._28_4_ = auVar23._28_4_;
          auVar23 = vsubps_avx(auVar330,auVar24);
          auVar85._4_4_ = auVar137._4_4_ * auVar23._4_4_;
          auVar85._0_4_ = auVar137._0_4_ * auVar23._0_4_;
          auVar85._8_4_ = auVar137._8_4_ * auVar23._8_4_;
          auVar85._12_4_ = auVar137._12_4_ * auVar23._12_4_;
          auVar85._16_4_ = auVar137._16_4_ * auVar23._16_4_;
          auVar85._20_4_ = auVar137._20_4_ * auVar23._20_4_;
          auVar85._24_4_ = auVar137._24_4_ * auVar23._24_4_;
          auVar85._28_4_ = auVar280._28_4_;
          auVar26 = vsubps_avx(auVar85,auVar84);
          auVar86._4_4_ = auVar27._4_4_ * auVar23._4_4_;
          auVar86._0_4_ = auVar27._0_4_ * auVar23._0_4_;
          auVar86._8_4_ = auVar27._8_4_ * auVar23._8_4_;
          auVar86._12_4_ = auVar27._12_4_ * auVar23._12_4_;
          auVar86._16_4_ = auVar27._16_4_ * auVar23._16_4_;
          auVar86._20_4_ = auVar27._20_4_ * auVar23._20_4_;
          auVar86._24_4_ = auVar27._24_4_ * auVar23._24_4_;
          auVar86._28_4_ = auVar280._28_4_;
          auVar87._4_4_ = auVar24._4_4_ * auVar22._4_4_;
          auVar87._0_4_ = auVar24._0_4_ * auVar22._0_4_;
          auVar87._8_4_ = auVar24._8_4_ * auVar22._8_4_;
          auVar87._12_4_ = auVar24._12_4_ * auVar22._12_4_;
          auVar87._16_4_ = auVar24._16_4_ * auVar22._16_4_;
          auVar87._20_4_ = auVar24._20_4_ * auVar22._20_4_;
          auVar87._24_4_ = auVar24._24_4_ * auVar22._24_4_;
          auVar87._28_4_ = auVar22._28_4_;
          auVar280 = vsubps_avx(auVar87,auVar86);
          auVar166._0_4_ = auVar25._0_4_ * 0.0 + auVar280._0_4_ + auVar26._0_4_ * 0.0;
          auVar166._4_4_ = auVar25._4_4_ * 0.0 + auVar280._4_4_ + auVar26._4_4_ * 0.0;
          auVar166._8_4_ = auVar25._8_4_ * 0.0 + auVar280._8_4_ + auVar26._8_4_ * 0.0;
          auVar166._12_4_ = auVar25._12_4_ * 0.0 + auVar280._12_4_ + auVar26._12_4_ * 0.0;
          auVar166._16_4_ = auVar25._16_4_ * 0.0 + auVar280._16_4_ + auVar26._16_4_ * 0.0;
          auVar166._20_4_ = auVar25._20_4_ * 0.0 + auVar280._20_4_ + auVar26._20_4_ * 0.0;
          auVar166._24_4_ = auVar25._24_4_ * 0.0 + auVar280._24_4_ + auVar26._24_4_ * 0.0;
          auVar166._28_4_ = auVar25._28_4_ + auVar280._28_4_ + auVar26._28_4_;
          auVar20 = vcmpps_avx(auVar166,ZEXT832(0) << 0x20,2);
          auVar136 = vblendvps_avx(auVar136,_local_460,auVar20);
          auVar209 = ZEXT3264(auVar136);
          auVar280 = vblendvps_avx(auVar294,_local_4c0,auVar20);
          auVar294 = vblendvps_avx(auVar21,auVar346,auVar20);
          auVar21 = vblendvps_avx(auVar24,auVar330,auVar20);
          auVar22 = vblendvps_avx(auVar27,auVar218,auVar20);
          auVar23 = vblendvps_avx(auVar137,auVar298,auVar20);
          auVar24 = vblendvps_avx(auVar330,auVar24,auVar20);
          auVar25 = vblendvps_avx(auVar218,auVar27,auVar20);
          auVar26 = vblendvps_avx(auVar298,auVar137,auVar20);
          _local_600 = vandps_avx(_local_320,auVar188);
          auVar24 = vsubps_avx(auVar24,auVar136);
          auVar138 = vsubps_avx(auVar25,auVar280);
          auVar26 = vsubps_avx(auVar26,auVar294);
          auVar139 = vsubps_avx(auVar280,auVar22);
          fVar175 = auVar138._0_4_;
          fVar211 = auVar294._0_4_;
          fVar243 = auVar138._4_4_;
          fVar220 = auVar294._4_4_;
          auVar88._4_4_ = fVar220 * fVar243;
          auVar88._0_4_ = fVar211 * fVar175;
          fVar264 = auVar138._8_4_;
          fVar222 = auVar294._8_4_;
          auVar88._8_4_ = fVar222 * fVar264;
          fVar288 = auVar138._12_4_;
          fVar224 = auVar294._12_4_;
          auVar88._12_4_ = fVar224 * fVar288;
          fVar210 = auVar138._16_4_;
          fVar246 = auVar294._16_4_;
          auVar88._16_4_ = fVar246 * fVar210;
          fVar230 = auVar138._20_4_;
          fVar248 = auVar294._20_4_;
          auVar88._20_4_ = fVar248 * fVar230;
          fVar133 = auVar138._24_4_;
          fVar256 = auVar294._24_4_;
          auVar88._24_4_ = fVar256 * fVar133;
          auVar88._28_4_ = auVar25._28_4_;
          fVar189 = auVar280._0_4_;
          fVar259 = auVar26._0_4_;
          fVar244 = auVar280._4_4_;
          fVar262 = auVar26._4_4_;
          auVar89._4_4_ = fVar262 * fVar244;
          auVar89._0_4_ = fVar259 * fVar189;
          fVar266 = auVar280._8_4_;
          fVar249 = auVar26._8_4_;
          auVar89._8_4_ = fVar249 * fVar266;
          fVar289 = auVar280._12_4_;
          fVar257 = auVar26._12_4_;
          auVar89._12_4_ = fVar257 * fVar289;
          fVar174 = auVar280._16_4_;
          fVar260 = auVar26._16_4_;
          auVar89._16_4_ = fVar260 * fVar174;
          fVar154 = auVar280._20_4_;
          fVar263 = auVar26._20_4_;
          auVar89._20_4_ = fVar263 * fVar154;
          fVar152 = auVar280._24_4_;
          fVar265 = auVar26._24_4_;
          uVar130 = auVar27._28_4_;
          auVar89._24_4_ = fVar265 * fVar152;
          auVar89._28_4_ = uVar130;
          auVar25 = vsubps_avx(auVar89,auVar88);
          fVar191 = auVar136._0_4_;
          fVar245 = auVar136._4_4_;
          auVar90._4_4_ = fVar262 * fVar245;
          auVar90._0_4_ = fVar259 * fVar191;
          fVar268 = auVar136._8_4_;
          auVar90._8_4_ = fVar249 * fVar268;
          fVar228 = auVar136._12_4_;
          auVar90._12_4_ = fVar257 * fVar228;
          fVar304 = auVar136._16_4_;
          auVar90._16_4_ = fVar260 * fVar304;
          fVar212 = auVar136._20_4_;
          auVar90._20_4_ = fVar263 * fVar212;
          fVar153 = auVar136._24_4_;
          auVar90._24_4_ = fVar265 * fVar153;
          auVar90._28_4_ = uVar130;
          fVar195 = auVar24._0_4_;
          fVar247 = auVar24._4_4_;
          auVar91._4_4_ = fVar220 * fVar247;
          auVar91._0_4_ = fVar211 * fVar195;
          fVar285 = auVar24._8_4_;
          auVar91._8_4_ = fVar222 * fVar285;
          fVar173 = auVar24._12_4_;
          auVar91._12_4_ = fVar224 * fVar173;
          fVar300 = auVar24._16_4_;
          auVar91._16_4_ = fVar246 * fVar300;
          fVar221 = auVar24._20_4_;
          auVar91._20_4_ = fVar248 * fVar221;
          fVar155 = auVar24._24_4_;
          auVar91._24_4_ = fVar256 * fVar155;
          auVar91._28_4_ = auVar330._28_4_;
          auVar27 = vsubps_avx(auVar91,auVar90);
          auVar92._4_4_ = fVar244 * fVar247;
          auVar92._0_4_ = fVar189 * fVar195;
          auVar92._8_4_ = fVar266 * fVar285;
          auVar92._12_4_ = fVar289 * fVar173;
          auVar92._16_4_ = fVar174 * fVar300;
          auVar92._20_4_ = fVar154 * fVar221;
          auVar92._24_4_ = fVar152 * fVar155;
          auVar92._28_4_ = uVar130;
          auVar93._4_4_ = fVar245 * fVar243;
          auVar93._0_4_ = fVar191 * fVar175;
          auVar93._8_4_ = fVar268 * fVar264;
          auVar93._12_4_ = fVar228 * fVar288;
          auVar93._16_4_ = fVar304 * fVar210;
          auVar93._20_4_ = fVar212 * fVar230;
          auVar93._24_4_ = fVar153 * fVar133;
          auVar93._28_4_ = auVar137._28_4_;
          auVar137 = vsubps_avx(auVar93,auVar92);
          auVar160 = vsubps_avx(auVar294,auVar23);
          fVar240 = auVar137._28_4_ + auVar27._28_4_;
          auVar310._0_4_ = auVar137._0_4_ + auVar27._0_4_ * 0.0 + auVar25._0_4_ * 0.0;
          auVar310._4_4_ = auVar137._4_4_ + auVar27._4_4_ * 0.0 + auVar25._4_4_ * 0.0;
          auVar310._8_4_ = auVar137._8_4_ + auVar27._8_4_ * 0.0 + auVar25._8_4_ * 0.0;
          auVar310._12_4_ = auVar137._12_4_ + auVar27._12_4_ * 0.0 + auVar25._12_4_ * 0.0;
          auVar310._16_4_ = auVar137._16_4_ + auVar27._16_4_ * 0.0 + auVar25._16_4_ * 0.0;
          auVar310._20_4_ = auVar137._20_4_ + auVar27._20_4_ * 0.0 + auVar25._20_4_ * 0.0;
          auVar310._24_4_ = auVar137._24_4_ + auVar27._24_4_ * 0.0 + auVar25._24_4_ * 0.0;
          auVar310._28_4_ = fVar240 + auVar25._28_4_;
          fVar198 = auVar139._0_4_;
          fVar255 = auVar139._4_4_;
          auVar94._4_4_ = auVar23._4_4_ * fVar255;
          auVar94._0_4_ = auVar23._0_4_ * fVar198;
          fVar286 = auVar139._8_4_;
          auVar94._8_4_ = auVar23._8_4_ * fVar286;
          fVar290 = auVar139._12_4_;
          auVar94._12_4_ = auVar23._12_4_ * fVar290;
          fVar301 = auVar139._16_4_;
          auVar94._16_4_ = auVar23._16_4_ * fVar301;
          fVar223 = auVar139._20_4_;
          auVar94._20_4_ = auVar23._20_4_ * fVar223;
          fVar169 = auVar139._24_4_;
          auVar94._24_4_ = auVar23._24_4_ * fVar169;
          auVar94._28_4_ = fVar240;
          fVar240 = auVar160._0_4_;
          fVar258 = auVar160._4_4_;
          auVar95._4_4_ = auVar22._4_4_ * fVar258;
          auVar95._0_4_ = auVar22._0_4_ * fVar240;
          fVar227 = auVar160._8_4_;
          auVar95._8_4_ = auVar22._8_4_ * fVar227;
          fVar291 = auVar160._12_4_;
          auVar95._12_4_ = auVar22._12_4_ * fVar291;
          fVar302 = auVar160._16_4_;
          auVar95._16_4_ = auVar22._16_4_ * fVar302;
          fVar225 = auVar160._20_4_;
          auVar95._20_4_ = auVar22._20_4_ * fVar225;
          fVar170 = auVar160._24_4_;
          auVar95._24_4_ = auVar22._24_4_ * fVar170;
          auVar95._28_4_ = auVar137._28_4_;
          auVar27 = vsubps_avx(auVar95,auVar94);
          auVar137 = vsubps_avx(auVar136,auVar21);
          fVar242 = auVar137._0_4_;
          fVar261 = auVar137._4_4_;
          auVar96._4_4_ = auVar23._4_4_ * fVar261;
          auVar96._0_4_ = auVar23._0_4_ * fVar242;
          fVar172 = auVar137._8_4_;
          auVar96._8_4_ = auVar23._8_4_ * fVar172;
          fVar229 = auVar137._12_4_;
          auVar96._12_4_ = auVar23._12_4_ * fVar229;
          fVar303 = auVar137._16_4_;
          auVar96._16_4_ = auVar23._16_4_ * fVar303;
          fVar226 = auVar137._20_4_;
          auVar96._20_4_ = auVar23._20_4_ * fVar226;
          fVar171 = auVar137._24_4_;
          auVar96._24_4_ = auVar23._24_4_ * fVar171;
          auVar96._28_4_ = auVar23._28_4_;
          auVar97._4_4_ = fVar258 * auVar21._4_4_;
          auVar97._0_4_ = fVar240 * auVar21._0_4_;
          auVar97._8_4_ = fVar227 * auVar21._8_4_;
          auVar97._12_4_ = fVar291 * auVar21._12_4_;
          auVar97._16_4_ = fVar302 * auVar21._16_4_;
          auVar97._20_4_ = fVar225 * auVar21._20_4_;
          auVar97._24_4_ = fVar170 * auVar21._24_4_;
          auVar97._28_4_ = auVar25._28_4_;
          auVar23 = vsubps_avx(auVar96,auVar97);
          auVar98._4_4_ = auVar22._4_4_ * fVar261;
          auVar98._0_4_ = auVar22._0_4_ * fVar242;
          auVar98._8_4_ = auVar22._8_4_ * fVar172;
          auVar98._12_4_ = auVar22._12_4_ * fVar229;
          auVar98._16_4_ = auVar22._16_4_ * fVar303;
          auVar98._20_4_ = auVar22._20_4_ * fVar226;
          auVar98._24_4_ = auVar22._24_4_ * fVar171;
          auVar98._28_4_ = auVar22._28_4_;
          auVar99._4_4_ = fVar255 * auVar21._4_4_;
          auVar99._0_4_ = fVar198 * auVar21._0_4_;
          auVar99._8_4_ = fVar286 * auVar21._8_4_;
          auVar99._12_4_ = fVar290 * auVar21._12_4_;
          auVar99._16_4_ = fVar301 * auVar21._16_4_;
          auVar99._20_4_ = fVar223 * auVar21._20_4_;
          auVar99._24_4_ = fVar169 * auVar21._24_4_;
          auVar99._28_4_ = auVar21._28_4_;
          auVar21 = vsubps_avx(auVar99,auVar98);
          auVar150._0_4_ = auVar27._0_4_ * 0.0 + auVar21._0_4_ + auVar23._0_4_ * 0.0;
          auVar150._4_4_ = auVar27._4_4_ * 0.0 + auVar21._4_4_ + auVar23._4_4_ * 0.0;
          auVar150._8_4_ = auVar27._8_4_ * 0.0 + auVar21._8_4_ + auVar23._8_4_ * 0.0;
          auVar150._12_4_ = auVar27._12_4_ * 0.0 + auVar21._12_4_ + auVar23._12_4_ * 0.0;
          auVar150._16_4_ = auVar27._16_4_ * 0.0 + auVar21._16_4_ + auVar23._16_4_ * 0.0;
          auVar150._20_4_ = auVar27._20_4_ * 0.0 + auVar21._20_4_ + auVar23._20_4_ * 0.0;
          auVar150._24_4_ = auVar27._24_4_ * 0.0 + auVar21._24_4_ + auVar23._24_4_ * 0.0;
          auVar150._28_4_ = auVar23._28_4_ + auVar21._28_4_ + auVar23._28_4_;
          auVar151 = ZEXT3264(auVar150);
          auVar21 = vmaxps_avx(auVar310,auVar150);
          auVar21 = vcmpps_avx(auVar21,ZEXT1232(ZEXT812(0)) << 0x20,2);
          auVar22 = _local_600 & auVar21;
          if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar22 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar22 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar22 >> 0x7f,0) == '\0') &&
                (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar22 >> 0xbf,0) == '\0') &&
              (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar22[0x1f]) {
LAB_00a13f61:
            auVar168 = ZEXT3264(CONCAT824(uStack_488,
                                          CONCAT816(uStack_490,CONCAT88(uStack_498,local_4a0))));
          }
          else {
            auVar22 = vandps_avx(auVar21,_local_600);
            auVar100._4_4_ = fVar258 * fVar243;
            auVar100._0_4_ = fVar240 * fVar175;
            auVar100._8_4_ = fVar227 * fVar264;
            auVar100._12_4_ = fVar291 * fVar288;
            auVar100._16_4_ = fVar302 * fVar210;
            auVar100._20_4_ = fVar225 * fVar230;
            auVar100._24_4_ = fVar170 * fVar133;
            auVar100._28_4_ = local_600._28_4_;
            auVar101._4_4_ = fVar255 * fVar262;
            auVar101._0_4_ = fVar198 * fVar259;
            auVar101._8_4_ = fVar286 * fVar249;
            auVar101._12_4_ = fVar290 * fVar257;
            auVar101._16_4_ = fVar301 * fVar260;
            auVar101._20_4_ = fVar223 * fVar263;
            auVar101._24_4_ = fVar169 * fVar265;
            auVar101._28_4_ = auVar21._28_4_;
            auVar23 = vsubps_avx(auVar101,auVar100);
            auVar102._4_4_ = fVar261 * fVar262;
            auVar102._0_4_ = fVar242 * fVar259;
            auVar102._8_4_ = fVar172 * fVar249;
            auVar102._12_4_ = fVar229 * fVar257;
            auVar102._16_4_ = fVar303 * fVar260;
            auVar102._20_4_ = fVar226 * fVar263;
            auVar102._24_4_ = fVar171 * fVar265;
            auVar102._28_4_ = auVar26._28_4_;
            auVar103._4_4_ = fVar258 * fVar247;
            auVar103._0_4_ = fVar240 * fVar195;
            auVar103._8_4_ = fVar227 * fVar285;
            auVar103._12_4_ = fVar291 * fVar173;
            auVar103._16_4_ = fVar302 * fVar300;
            auVar103._20_4_ = fVar225 * fVar221;
            auVar103._24_4_ = fVar170 * fVar155;
            auVar103._28_4_ = auVar160._28_4_;
            auVar25 = vsubps_avx(auVar103,auVar102);
            auVar104._4_4_ = fVar255 * fVar247;
            auVar104._0_4_ = fVar198 * fVar195;
            auVar104._8_4_ = fVar286 * fVar285;
            auVar104._12_4_ = fVar290 * fVar173;
            auVar104._16_4_ = fVar301 * fVar300;
            auVar104._20_4_ = fVar223 * fVar221;
            auVar104._24_4_ = fVar169 * fVar155;
            auVar104._28_4_ = auVar24._28_4_;
            auVar105._4_4_ = fVar261 * fVar243;
            auVar105._0_4_ = fVar242 * fVar175;
            auVar105._8_4_ = fVar172 * fVar264;
            auVar105._12_4_ = fVar229 * fVar288;
            auVar105._16_4_ = fVar303 * fVar210;
            auVar105._20_4_ = fVar226 * fVar230;
            auVar105._24_4_ = fVar171 * fVar133;
            auVar105._28_4_ = auVar138._28_4_;
            auVar26 = vsubps_avx(auVar105,auVar104);
            auVar167._0_4_ = auVar23._0_4_ * 0.0 + auVar26._0_4_ + auVar25._0_4_ * 0.0;
            auVar167._4_4_ = auVar23._4_4_ * 0.0 + auVar26._4_4_ + auVar25._4_4_ * 0.0;
            auVar167._8_4_ = auVar23._8_4_ * 0.0 + auVar26._8_4_ + auVar25._8_4_ * 0.0;
            auVar167._12_4_ = auVar23._12_4_ * 0.0 + auVar26._12_4_ + auVar25._12_4_ * 0.0;
            auVar167._16_4_ = auVar23._16_4_ * 0.0 + auVar26._16_4_ + auVar25._16_4_ * 0.0;
            auVar167._20_4_ = auVar23._20_4_ * 0.0 + auVar26._20_4_ + auVar25._20_4_ * 0.0;
            auVar167._24_4_ = auVar23._24_4_ * 0.0 + auVar26._24_4_ + auVar25._24_4_ * 0.0;
            auVar167._28_4_ = auVar138._28_4_ + auVar26._28_4_ + auVar24._28_4_;
            auVar21 = vrcpps_avx(auVar167);
            fVar195 = auVar21._0_4_;
            fVar198 = auVar21._4_4_;
            auVar106._4_4_ = auVar167._4_4_ * fVar198;
            auVar106._0_4_ = auVar167._0_4_ * fVar195;
            fVar240 = auVar21._8_4_;
            auVar106._8_4_ = auVar167._8_4_ * fVar240;
            fVar242 = auVar21._12_4_;
            auVar106._12_4_ = auVar167._12_4_ * fVar242;
            fVar243 = auVar21._16_4_;
            auVar106._16_4_ = auVar167._16_4_ * fVar243;
            fVar247 = auVar21._20_4_;
            auVar106._20_4_ = auVar167._20_4_ * fVar247;
            fVar255 = auVar21._24_4_;
            auVar106._24_4_ = auVar167._24_4_ * fVar255;
            auVar106._28_4_ = auVar160._28_4_;
            auVar322._8_4_ = 0x3f800000;
            auVar322._0_8_ = 0x3f8000003f800000;
            auVar322._12_4_ = 0x3f800000;
            auVar322._16_4_ = 0x3f800000;
            auVar322._20_4_ = 0x3f800000;
            auVar322._24_4_ = 0x3f800000;
            auVar322._28_4_ = 0x3f800000;
            auVar21 = vsubps_avx(auVar322,auVar106);
            fVar195 = auVar21._0_4_ * fVar195 + fVar195;
            fVar198 = auVar21._4_4_ * fVar198 + fVar198;
            fVar240 = auVar21._8_4_ * fVar240 + fVar240;
            fVar242 = auVar21._12_4_ * fVar242 + fVar242;
            fVar243 = auVar21._16_4_ * fVar243 + fVar243;
            fVar247 = auVar21._20_4_ * fVar247 + fVar247;
            fVar255 = auVar21._24_4_ * fVar255 + fVar255;
            auVar107._4_4_ =
                 (fVar245 * auVar23._4_4_ + auVar25._4_4_ * fVar244 + auVar26._4_4_ * fVar220) *
                 fVar198;
            auVar107._0_4_ =
                 (fVar191 * auVar23._0_4_ + auVar25._0_4_ * fVar189 + auVar26._0_4_ * fVar211) *
                 fVar195;
            auVar107._8_4_ =
                 (fVar268 * auVar23._8_4_ + auVar25._8_4_ * fVar266 + auVar26._8_4_ * fVar222) *
                 fVar240;
            auVar107._12_4_ =
                 (fVar228 * auVar23._12_4_ + auVar25._12_4_ * fVar289 + auVar26._12_4_ * fVar224) *
                 fVar242;
            auVar107._16_4_ =
                 (fVar304 * auVar23._16_4_ + auVar25._16_4_ * fVar174 + auVar26._16_4_ * fVar246) *
                 fVar243;
            auVar107._20_4_ =
                 (fVar212 * auVar23._20_4_ + auVar25._20_4_ * fVar154 + auVar26._20_4_ * fVar248) *
                 fVar247;
            auVar107._24_4_ =
                 (fVar153 * auVar23._24_4_ + auVar25._24_4_ * fVar152 + auVar26._24_4_ * fVar256) *
                 fVar255;
            auVar107._28_4_ = auVar136._28_4_ + auVar280._28_4_ + auVar294._28_4_;
            auVar209 = ZEXT3264(auVar107);
            fVar175 = ray->tfar;
            auVar219._4_4_ = fVar175;
            auVar219._0_4_ = fVar175;
            auVar219._8_4_ = fVar175;
            auVar219._12_4_ = fVar175;
            auVar219._16_4_ = fVar175;
            auVar219._20_4_ = fVar175;
            auVar219._24_4_ = fVar175;
            auVar219._28_4_ = fVar175;
            auVar118._4_4_ = fStack_35c;
            auVar118._0_4_ = local_360;
            auVar118._8_4_ = fStack_358;
            auVar118._12_4_ = fStack_354;
            auVar118._16_4_ = fStack_350;
            auVar118._20_4_ = fStack_34c;
            auVar118._24_4_ = fStack_348;
            auVar118._28_4_ = fStack_344;
            auVar136 = vcmpps_avx(auVar118,auVar107,2);
            auVar280 = vcmpps_avx(auVar107,auVar219,2);
            auVar136 = vandps_avx(auVar136,auVar280);
            auVar294 = auVar22 & auVar136;
            if ((((((((auVar294 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar294 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar294 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar294 >> 0x7f,0) == '\0') &&
                  (auVar294 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar294 >> 0xbf,0) == '\0') &&
                (auVar294 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar294[0x1f]) goto LAB_00a13f61;
            auVar136 = vandps_avx(auVar22,auVar136);
            auVar294 = vcmpps_avx(ZEXT1232(ZEXT812(0)) << 0x20,auVar167,4);
            auVar21 = auVar136 & auVar294;
            auVar168 = ZEXT3264(CONCAT824(uStack_488,
                                          CONCAT816(uStack_490,CONCAT88(uStack_498,local_4a0))));
            if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar21 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar21 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar21 >> 0x7f,0) != '\0') ||
                  (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar21 >> 0xbf,0) != '\0') ||
                (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar21[0x1f] < '\0') {
              auVar136 = vandps_avx(auVar294,auVar136);
              auVar168 = ZEXT3264(auVar136);
              auVar108._4_4_ = fVar198 * auVar310._4_4_;
              auVar108._0_4_ = fVar195 * auVar310._0_4_;
              auVar108._8_4_ = fVar240 * auVar310._8_4_;
              auVar108._12_4_ = fVar242 * auVar310._12_4_;
              auVar108._16_4_ = fVar243 * auVar310._16_4_;
              auVar108._20_4_ = fVar247 * auVar310._20_4_;
              auVar108._24_4_ = fVar255 * auVar310._24_4_;
              auVar108._28_4_ = auVar280._28_4_;
              auVar109._4_4_ = auVar150._4_4_ * fVar198;
              auVar109._0_4_ = auVar150._0_4_ * fVar195;
              auVar109._8_4_ = auVar150._8_4_ * fVar240;
              auVar109._12_4_ = auVar150._12_4_ * fVar242;
              auVar109._16_4_ = auVar150._16_4_ * fVar243;
              auVar109._20_4_ = auVar150._20_4_ * fVar247;
              auVar109._24_4_ = auVar150._24_4_ * fVar255;
              auVar109._28_4_ = auVar150._28_4_;
              auVar254._8_4_ = 0x3f800000;
              auVar254._0_8_ = 0x3f8000003f800000;
              auVar254._12_4_ = 0x3f800000;
              auVar254._16_4_ = 0x3f800000;
              auVar254._20_4_ = 0x3f800000;
              auVar254._24_4_ = 0x3f800000;
              auVar254._28_4_ = 0x3f800000;
              auVar136 = vsubps_avx(auVar254,auVar108);
              local_160 = vblendvps_avx(auVar136,auVar108,auVar20);
              auVar136 = vsubps_avx(auVar254,auVar109);
              _local_3a0 = vblendvps_avx(auVar136,auVar109,auVar20);
              auVar151 = ZEXT3264(_local_3a0);
              local_180 = auVar107;
            }
          }
          auVar299 = ZEXT3264(local_720);
          auVar284 = ZEXT3264(local_700);
          auVar136 = auVar168._0_32_;
          auVar279 = ZEXT3264(local_580);
          auVar331 = ZEXT3264(_local_6e0);
          if ((((((((auVar136 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar136 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar136 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar136 >> 0x7f,0) != '\0') ||
                (auVar168 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
               SUB321(auVar136 >> 0xbf,0) != '\0') ||
              (auVar168 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
              auVar168[0x1f] < '\0') {
            auVar280 = vsubps_avx(local_6c0,_local_7a0);
            auVar209 = ZEXT3264(local_160);
            fVar189 = (float)local_7a0._0_4_ + auVar280._0_4_ * local_160._0_4_;
            fVar191 = (float)local_7a0._4_4_ + auVar280._4_4_ * local_160._4_4_;
            fVar195 = fStack_798 + auVar280._8_4_ * local_160._8_4_;
            fVar198 = fStack_794 + auVar280._12_4_ * local_160._12_4_;
            fVar240 = fStack_790 + auVar280._16_4_ * local_160._16_4_;
            fVar242 = fStack_78c + auVar280._20_4_ * local_160._20_4_;
            fVar243 = fStack_788 + auVar280._24_4_ * local_160._24_4_;
            fVar244 = fStack_784 + auVar280._28_4_;
            fVar175 = local_728->depth_scale;
            auVar110._4_4_ = (fVar191 + fVar191) * fVar175;
            auVar110._0_4_ = (fVar189 + fVar189) * fVar175;
            auVar110._8_4_ = (fVar195 + fVar195) * fVar175;
            auVar110._12_4_ = (fVar198 + fVar198) * fVar175;
            auVar110._16_4_ = (fVar240 + fVar240) * fVar175;
            auVar110._20_4_ = (fVar242 + fVar242) * fVar175;
            auVar110._24_4_ = (fVar243 + fVar243) * fVar175;
            auVar110._28_4_ = fVar244 + fVar244;
            auVar280 = vcmpps_avx(local_180,auVar110,6);
            auVar151 = ZEXT3264(auVar280);
            auVar294 = auVar136 & auVar280;
            if ((((((((auVar294 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar294 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar294 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar294 >> 0x7f,0) != '\0') ||
                  (auVar294 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar294 >> 0xbf,0) != '\0') ||
                (auVar294 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar294[0x1f] < '\0') {
              local_200 = vandps_avx(auVar280,auVar136);
              auVar151 = ZEXT3264(local_200);
              auVar158._0_8_ =
                   CONCAT44((float)local_3a0._4_4_ + (float)local_3a0._4_4_ + -1.0,
                            (float)local_3a0._0_4_ + (float)local_3a0._0_4_ + -1.0);
              auVar158._8_4_ = (float)uStack_398 + (float)uStack_398 + -1.0;
              auVar158._12_4_ = uStack_398._4_4_ + uStack_398._4_4_ + -1.0;
              auVar159._16_4_ = (float)uStack_390 + (float)uStack_390 + -1.0;
              auVar159._0_16_ = auVar158;
              auVar159._20_4_ = uStack_390._4_4_ + uStack_390._4_4_ + -1.0;
              fStack_288 = (float)uStack_388 + (float)uStack_388 + -1.0;
              _local_2a0 = auVar159;
              fStack_284 = uStack_388._4_4_ + uStack_388._4_4_ + -1.0;
              auVar168 = ZEXT3264(_local_2a0);
              local_2c0 = local_160;
              local_280 = local_180;
              local_25c = uVar123;
              local_250 = local_780;
              uStack_248 = uStack_778;
              local_240 = local_5e0;
              uStack_238 = uStack_5d8;
              local_230 = local_770;
              uStack_228 = uStack_768;
              local_220 = CONCAT44(fStack_5cc,local_5d0);
              uStack_218 = CONCAT44(fStack_5c4,fStack_5c8);
              local_620._0_8_ = (context->scene->geometries).items[local_730].ptr;
              _local_3a0 = _local_2a0;
              auVar136 = _local_3a0;
              if ((((Geometry *)local_620._0_8_)->mask & ray->mask) == 0) {
                pRVar125 = (RTCIntersectArguments *)0x0;
                auVar311 = ZEXT3264(local_640);
                auVar316 = ZEXT3264(local_520);
              }
              else {
                pRVar125 = context->args;
                auVar311 = ZEXT3264(local_640);
                auVar316 = ZEXT3264(local_520);
                if ((pRVar125->filter != (RTCFilterFunctionN)0x0) ||
                   (pRVar125 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar125 >> 8),1),
                   ((Geometry *)local_620._0_8_)->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_620._8_24_ = auVar310._8_24_;
                  local_660._4_28_ = auVar253._4_28_;
                  local_660._0_4_ = (int)uVar126;
                  auVar350 = vshufps_avx(ZEXT416((uint)(float)(int)local_260),
                                         ZEXT416((uint)(float)(int)local_260),0);
                  local_1e0[0] = (auVar350._0_4_ + local_160._0_4_ + 0.0) * (float)local_100._0_4_;
                  local_1e0[1] = (auVar350._4_4_ + local_160._4_4_ + 1.0) * (float)local_100._4_4_;
                  local_1e0[2] = (auVar350._8_4_ + local_160._8_4_ + 2.0) * fStack_f8;
                  local_1e0[3] = (auVar350._12_4_ + local_160._12_4_ + 3.0) * fStack_f4;
                  fStack_1d0 = (auVar350._0_4_ + local_160._16_4_ + 4.0) * fStack_f0;
                  fStack_1cc = (auVar350._4_4_ + local_160._20_4_ + 5.0) * fStack_ec;
                  fStack_1c8 = (auVar350._8_4_ + local_160._24_4_ + 6.0) * fStack_e8;
                  fStack_1c4 = auVar350._12_4_ + (float)local_160._28_4_ + 7.0;
                  uStack_398 = auVar158._8_8_;
                  uStack_390 = auVar159._16_8_;
                  uStack_388 = local_2a0._24_8_;
                  local_1c0 = auVar158._0_8_;
                  uStack_1b8 = uStack_398;
                  uStack_1b0 = uStack_390;
                  uStack_1a8 = uStack_388;
                  auVar168 = ZEXT3264(local_180);
                  local_1a0 = local_180;
                  uVar130 = vmovmskps_avx(local_200);
                  uVar126 = CONCAT44((int)((ulong)pRVar125 >> 0x20),uVar130);
                  lVar127 = 0;
                  _local_3a0 = auVar136;
                  if (uVar126 != 0) {
                    for (; (uVar126 >> lVar127 & 1) == 0; lVar127 = lVar127 + 1) {
                    }
                  }
                  while( true ) {
                    local_7a0 = (undefined1  [8])lVar127;
                    local_600 = (undefined1  [8])uVar126;
                    if (uVar126 == 0) break;
                    local_5b4 = local_1e0[lVar127];
                    auVar151 = ZEXT464((uint)local_5b4);
                    local_5b0 = *(uint *)((long)&local_1c0 + lVar127 * 4);
                    auVar168 = ZEXT464(local_5b0);
                    local_6c0._0_4_ = ray->tfar;
                    ray->tfar = *(float *)(local_1a0 + lVar127 * 4);
                    fVar189 = 1.0 - local_5b4;
                    fVar175 = local_5b4 * 3.0;
                    auVar350 = ZEXT416((uint)((fVar189 * -2.0 * local_5b4 + local_5b4 * local_5b4) *
                                             0.5));
                    auVar350 = vshufps_avx(auVar350,auVar350,0);
                    auVar201 = ZEXT416((uint)(((fVar189 + fVar189) * (fVar175 + 2.0) +
                                              fVar189 * fVar189 * -3.0) * 0.5));
                    auVar201 = vshufps_avx(auVar201,auVar201,0);
                    auVar196 = ZEXT416((uint)(((local_5b4 + local_5b4) * (fVar175 + -5.0) +
                                              local_5b4 * fVar175) * 0.5));
                    auVar196 = vshufps_avx(auVar196,auVar196,0);
                    auVar202 = ZEXT416((uint)((local_5b4 * (fVar189 + fVar189) - fVar189 * fVar189)
                                             * 0.5));
                    auVar202 = vshufps_avx(auVar202,auVar202,0);
                    auVar203._0_4_ = auVar202._0_4_ * (float)local_780._0_4_;
                    auVar203._4_4_ = auVar202._4_4_ * (float)local_780._4_4_;
                    auVar203._8_4_ = auVar202._8_4_ * (float)uStack_778;
                    auVar203._12_4_ = auVar202._12_4_ * uStack_778._4_4_;
                    auVar209 = ZEXT1664(auVar203);
                    auVar181._0_4_ =
                         auVar203._0_4_ +
                         auVar196._0_4_ * (float)local_5e0._0_4_ +
                         auVar350._0_4_ * local_5d0 + auVar201._0_4_ * (float)local_770._0_4_;
                    auVar181._4_4_ =
                         auVar203._4_4_ +
                         auVar196._4_4_ * (float)local_5e0._4_4_ +
                         auVar350._4_4_ * fStack_5cc + auVar201._4_4_ * (float)local_770._4_4_;
                    auVar181._8_4_ =
                         auVar203._8_4_ +
                         auVar196._8_4_ * (float)uStack_5d8 +
                         auVar350._8_4_ * fStack_5c8 + auVar201._8_4_ * (float)uStack_768;
                    auVar181._12_4_ =
                         auVar203._12_4_ +
                         auVar196._12_4_ * uStack_5d8._4_4_ +
                         auVar350._12_4_ * fStack_5c4 + auVar201._12_4_ * uStack_768._4_4_;
                    local_690.context = context->user;
                    local_5c0 = vmovlps_avx(auVar181);
                    local_5b8 = vextractps_avx(auVar181,2);
                    local_5ac = (int)local_588;
                    local_5a8 = (int)local_730;
                    local_5a4 = (local_690.context)->instID[0];
                    local_5a0 = (local_690.context)->instPrimID[0];
                    local_7b4 = -1;
                    local_690.valid = &local_7b4;
                    local_690.geometryUserPtr = *(void **)(local_620._0_8_ + 0x18);
                    local_690.ray = (RTCRayN *)ray;
                    local_690.hit = (RTCHitN *)&local_5c0;
                    local_690.N = 1;
                    if (*(code **)(local_620._0_8_ + 0x48) == (code *)0x0) {
LAB_00a13ec4:
                      p_Var19 = context->args->filter;
                      if ((p_Var19 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          ((*(byte *)(local_620._0_8_ + 0x3e) & 0x40) != 0)))) {
                        auVar209 = ZEXT1664(auVar209._0_16_);
                        auVar350 = (*p_Var19)(&local_690);
                        auVar168._0_8_ = auVar350._8_8_;
                        auVar151._0_8_ = auVar350._0_8_;
                        auVar168._8_56_ = extraout_var_02;
                        auVar151._8_56_ = extraout_var_00;
                        if (*local_690.valid == 0) goto LAB_00a13f0f;
                      }
                      pRVar125 = (RTCIntersectArguments *)0x1;
                      goto LAB_00a13fa2;
                    }
                    auVar209 = ZEXT1664(auVar203);
                    auVar350 = (**(code **)(local_620._0_8_ + 0x48))(&local_690);
                    auVar168._0_8_ = auVar350._8_8_;
                    auVar151._0_8_ = auVar350._0_8_;
                    auVar168._8_56_ = extraout_var_01;
                    auVar151._8_56_ = extraout_var;
                    if (*local_690.valid != 0) goto LAB_00a13ec4;
LAB_00a13f0f:
                    auVar151 = ZEXT464((uint)local_6c0._0_4_);
                    ray->tfar = (float)local_6c0._0_4_;
                    uVar126 = (ulong)local_600 ^ 1L << ((ulong)local_7a0 & 0x3f);
                    lVar127 = 0;
                    if (uVar126 != 0) {
                      for (; (uVar126 >> lVar127 & 1) == 0; lVar127 = lVar127 + 1) {
                      }
                    }
                  }
                  pRVar125 = (RTCIntersectArguments *)0x0;
LAB_00a13fa2:
                  auVar284 = ZEXT3264(local_700);
                  auVar299 = ZEXT3264(local_720);
                  auVar311 = ZEXT3264(local_640);
                  auVar316 = ZEXT3264(local_520);
                  auVar279 = ZEXT3264(local_580);
                  auVar331 = ZEXT3264(_local_6e0);
                  uVar126 = (ulong)(uint)local_660._0_4_;
                  fVar176 = (float)local_760._0_4_;
                  fVar190 = (float)local_760._4_4_;
                  fVar192 = fStack_758;
                  fVar194 = fStack_754;
                  fVar193 = fStack_750;
                  fVar197 = fStack_74c;
                  fVar231 = fStack_748;
                  fVar241 = fStack_744;
                }
              }
              uVar126 = CONCAT71((int7)(uVar126 >> 8),(byte)uVar126 | (byte)pRVar125);
              goto LAB_00a13b6c;
            }
          }
          auVar311 = ZEXT3264(local_640);
          auVar316 = ZEXT3264(local_520);
        }
LAB_00a13b6c:
      }
    }
    if ((uVar126 & 1) != 0) break;
    fVar175 = ray->tfar;
    auVar147._4_4_ = fVar175;
    auVar147._0_4_ = fVar175;
    auVar147._8_4_ = fVar175;
    auVar147._12_4_ = fVar175;
    auVar147._16_4_ = fVar175;
    auVar147._20_4_ = fVar175;
    auVar147._24_4_ = fVar175;
    auVar147._28_4_ = fVar175;
    auVar136 = vcmpps_avx(local_80,auVar147,2);
    uVar123 = vmovmskps_avx(auVar136);
    uVar124 = (ulong)((uint)uVar132 & uVar123);
  }
  return uVar124 != 0;
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));
         
          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }